

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O3

bool embree::avx::CurveNiMBIntersectorK<4,4>::
     occluded_t<embree::avx::SweepCurve1IntersectorK<embree::CatmullRomCurveT,4>,embree::avx::Occluded1KEpilog1<4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  undefined4 uVar8;
  undefined8 uVar9;
  Primitive PVar10;
  Geometry *pGVar11;
  __int_type_conflict _Var12;
  long lVar13;
  long lVar14;
  RTCFilterFunctionN p_Var15;
  long lVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [12];
  ulong uVar76;
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  uint uVar84;
  uint uVar85;
  undefined1 (*pauVar86) [32];
  ulong uVar87;
  uint uVar88;
  uint uVar89;
  int iVar90;
  ulong uVar91;
  long lVar92;
  bool bVar93;
  bool bVar94;
  byte bVar95;
  float fVar96;
  float fVar121;
  float fVar122;
  vint4 bi_1;
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  float fVar123;
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar100 [16];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  float fVar124;
  float fVar148;
  float fVar150;
  vint4 bi;
  float fVar152;
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar134 [16];
  float fVar125;
  float fVar126;
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  float fVar149;
  float fVar151;
  float fVar153;
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar133 [16];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar147 [32];
  float fVar154;
  float fVar178;
  float fVar179;
  vint4 bi_2;
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  float fVar180;
  float fVar181;
  float fVar182;
  float fVar183;
  float fVar184;
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar162 [16];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  float fVar185;
  float fVar206;
  float fVar207;
  vint4 ai_1;
  undefined1 auVar186 [16];
  float fVar208;
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [28];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  float fVar209;
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  float fVar210;
  float fVar224;
  float fVar225;
  vint4 ai_2;
  undefined1 auVar211 [16];
  float fVar227;
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  float fVar226;
  float fVar228;
  float fVar231;
  undefined1 auVar218 [28];
  float fVar229;
  float fVar230;
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  undefined1 auVar217 [16];
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  float fVar232;
  float fVar241;
  float fVar243;
  undefined1 auVar234 [16];
  float fVar245;
  undefined1 auVar235 [16];
  float fVar233;
  float fVar242;
  float fVar244;
  float fVar246;
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  float fVar247;
  float fVar248;
  float fVar249;
  undefined1 auVar239 [32];
  undefined1 auVar240 [32];
  float fVar250;
  float fVar263;
  float fVar265;
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  float fVar269;
  float fVar270;
  float fVar272;
  undefined1 auVar257 [32];
  float fVar267;
  undefined1 auVar258 [32];
  undefined1 auVar259 [32];
  undefined1 auVar260 [32];
  float fVar264;
  float fVar266;
  float fVar268;
  float fVar271;
  float fVar273;
  undefined1 auVar261 [32];
  undefined1 auVar262 [32];
  float fVar274;
  float fVar275;
  float fVar289;
  float fVar291;
  vint4 ai;
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  float fVar290;
  float fVar292;
  float fVar294;
  float fVar295;
  float fVar297;
  float fVar298;
  float fVar300;
  float fVar301;
  float fVar303;
  float fVar304;
  float fVar306;
  undefined1 auVar283 [32];
  float fVar293;
  float fVar296;
  float fVar299;
  float fVar302;
  float fVar305;
  undefined1 auVar284 [32];
  undefined1 auVar285 [32];
  undefined1 auVar286 [32];
  undefined1 auVar287 [32];
  undefined1 auVar288 [32];
  float fVar307;
  float fVar308;
  float fVar314;
  float fVar315;
  float fVar316;
  float fVar317;
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  float fVar318;
  float fVar319;
  float fVar320;
  float fVar321;
  float fVar322;
  float fVar323;
  float fVar324;
  float fVar325;
  float fVar326;
  undefined1 auVar312 [64];
  undefined1 auVar313 [64];
  float s;
  float fVar327;
  float fVar328;
  float fVar330;
  float fVar331;
  float fVar332;
  float fVar333;
  undefined1 auVar329 [16];
  float fVar334;
  float fVar335;
  float fVar336;
  float fVar337;
  float fVar338;
  float fVar339;
  float fVar340;
  float fVar341;
  float fVar342;
  float fVar343;
  undefined1 auVar344 [16];
  undefined1 auVar345 [16];
  undefined1 auVar346 [16];
  undefined1 auVar347 [32];
  undefined1 auVar348 [32];
  undefined1 auVar349 [32];
  undefined1 auVar350 [32];
  float fVar351;
  float fVar352;
  float fVar353;
  float fVar358;
  float fVar360;
  undefined1 auVar354 [16];
  float fVar364;
  float fVar366;
  float fVar368;
  undefined1 auVar355 [32];
  float fVar359;
  float fVar361;
  float fVar362;
  float fVar363;
  float fVar365;
  float fVar367;
  float fVar369;
  float fVar370;
  undefined1 auVar356 [32];
  undefined1 auVar357 [32];
  float fVar371;
  float fVar372;
  float fVar377;
  float fVar379;
  undefined1 auVar373 [16];
  undefined1 auVar374 [16];
  float fVar378;
  float fVar380;
  float fVar381;
  float fVar382;
  float fVar383;
  float fVar384;
  float fVar385;
  float fVar386;
  float fVar387;
  float fVar388;
  undefined1 auVar375 [32];
  float fVar389;
  float fVar398;
  float fVar400;
  undefined1 auVar390 [16];
  undefined1 auVar391 [16];
  float fVar402;
  float fVar403;
  float fVar405;
  float fVar407;
  float fVar408;
  undefined1 auVar392 [32];
  undefined1 auVar393 [32];
  undefined1 auVar394 [32];
  undefined1 auVar395 [32];
  float fVar399;
  float fVar401;
  float fVar404;
  float fVar406;
  float fVar409;
  undefined1 auVar396 [32];
  undefined1 auVar397 [32];
  float fVar410;
  float fVar417;
  undefined1 auVar411 [16];
  undefined1 auVar412 [32];
  undefined1 auVar414 [32];
  undefined1 auVar415 [32];
  undefined1 auVar416 [32];
  undefined1 auVar418 [32];
  undefined1 auVar419 [32];
  undefined1 auVar420 [32];
  undefined1 auVar421 [32];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  BBox<embree::vfloat_impl<8>_> tp0;
  BBox<embree::vfloat_impl<8>_> tp1;
  StackEntry stack [3];
  uint local_bc8;
  uint uStack_ae4;
  float local_a80;
  float fStack_a7c;
  float fStack_a78;
  float fStack_a74;
  float local_a70;
  float fStack_a6c;
  float fStack_a68;
  float fStack_a64;
  float local_a60;
  float fStack_a5c;
  float fStack_a58;
  float fStack_a54;
  float local_a50;
  float fStack_a4c;
  float fStack_a48;
  float fStack_a44;
  float local_a00;
  float fStack_9fc;
  float fStack_9f8;
  float fStack_9f4;
  float local_9c0;
  float fStack_9bc;
  float fStack_9b8;
  float fStack_9b4;
  float fStack_9b0;
  float fStack_9ac;
  float fStack_9a8;
  RTCFilterFunctionNArguments local_970;
  undefined1 local_940 [8];
  float fStack_938;
  float fStack_934;
  float fStack_930;
  float fStack_92c;
  float fStack_928;
  float fStack_924;
  undefined1 local_920 [8];
  float fStack_918;
  float fStack_914;
  float fStack_910;
  float fStack_90c;
  float fStack_908;
  undefined1 local_900 [32];
  undefined1 local_8e0 [32];
  float local_8c0;
  float fStack_8bc;
  float fStack_8b8;
  float fStack_8b4;
  float fStack_8b0;
  float fStack_8ac;
  float fStack_8a8;
  float fStack_8a4;
  undefined1 local_8a0 [16];
  undefined1 local_890 [8];
  float fStack_888;
  float fStack_884;
  undefined1 local_880 [32];
  undefined1 local_850 [16];
  undefined1 local_840 [16];
  Primitive *local_830;
  ulong local_828;
  undefined1 local_820 [8];
  float fStack_818;
  float fStack_814;
  float fStack_810;
  float fStack_80c;
  float fStack_808;
  undefined1 local_800 [8];
  float fStack_7f8;
  float fStack_7f4;
  float fStack_7f0;
  float fStack_7ec;
  float fStack_7e8;
  undefined1 local_7e0 [8];
  float fStack_7d8;
  float fStack_7d4;
  float fStack_7d0;
  float fStack_7cc;
  float fStack_7c8;
  float fStack_7c4;
  undefined1 local_7c0 [8];
  float fStack_7b8;
  float fStack_7b4;
  float fStack_7b0;
  float fStack_7ac;
  float fStack_7a8;
  float fStack_7a4;
  undefined1 local_7a0 [8];
  float fStack_798;
  float fStack_794;
  float fStack_790;
  float fStack_78c;
  float fStack_788;
  float fStack_784;
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined1 local_720 [16];
  undefined1 local_710 [16];
  RTCHitN local_700 [16];
  undefined1 auStack_6f0 [16];
  undefined1 local_6e0 [16];
  undefined1 local_6d0 [16];
  undefined1 local_6c0 [16];
  undefined8 local_6b0;
  undefined8 uStack_6a8;
  undefined8 local_6a0;
  undefined8 uStack_698;
  uint local_690;
  uint uStack_68c;
  uint uStack_688;
  uint uStack_684;
  uint uStack_680;
  uint uStack_67c;
  uint uStack_678;
  uint uStack_674;
  undefined1 local_660 [32];
  undefined1 local_640 [8];
  float fStack_638;
  float fStack_634;
  float fStack_630;
  float fStack_62c;
  float fStack_628;
  undefined1 local_620 [16];
  undefined1 auStack_610 [16];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_530 [16];
  undefined1 local_520 [16];
  undefined1 local_510 [16];
  float local_500;
  float fStack_4fc;
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  float fStack_4e4;
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [8];
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  undefined1 local_440 [8];
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  undefined1 local_420 [8];
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  undefined1 local_400 [8];
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  undefined1 local_3e0 [8];
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  undefined1 local_3c0 [8];
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  undefined1 local_3a0 [8];
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  float fStack_364;
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  float local_300;
  float fStack_2fc;
  float fStack_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  float fStack_2e4;
  float local_2e0;
  float fStack_2dc;
  float fStack_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  float fStack_2c4;
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [8];
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  undefined1 local_240 [8];
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  undefined1 local_220 [8];
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  float fStack_204;
  undefined1 local_200 [8];
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  undefined1 local_1e0 [8];
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  undefined4 uStack_1c4;
  float local_1c0 [4];
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  float local_1a0 [4];
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  undefined8 uStack_140;
  int aiStack_138 [66];
  undefined1 auVar376 [64];
  undefined1 auVar413 [32];
  
  PVar10 = prim[1];
  uVar91 = (ulong)(byte)PVar10;
  lVar16 = uVar91 * 0x25;
  fVar124 = *(float *)(prim + lVar16 + 0x12);
  auVar252 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x10);
  auVar252 = vinsertps_avx(auVar252,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar17 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar17 = vinsertps_avx(auVar17,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar252 = vsubps_avx(auVar252,*(undefined1 (*) [16])(prim + lVar16 + 6));
  auVar134._0_4_ = fVar124 * auVar252._0_4_;
  auVar134._4_4_ = fVar124 * auVar252._4_4_;
  auVar134._8_4_ = fVar124 * auVar252._8_4_;
  auVar134._12_4_ = fVar124 * auVar252._12_4_;
  auVar276._0_4_ = fVar124 * auVar17._0_4_;
  auVar276._4_4_ = fVar124 * auVar17._4_4_;
  auVar276._8_4_ = fVar124 * auVar17._8_4_;
  auVar276._12_4_ = fVar124 * auVar17._12_4_;
  auVar252 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar91 * 4 + 6)));
  auVar252 = vcvtdq2ps_avx(auVar252);
  auVar17 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar91 * 5 + 6)));
  auVar17 = vcvtdq2ps_avx(auVar17);
  auVar130 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar91 * 6 + 6)));
  auVar130 = vcvtdq2ps_avx(auVar130);
  auVar18 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar91 * 0xf + 6)));
  auVar19 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar10 * 0x10 + 6)));
  auVar18 = vcvtdq2ps_avx(auVar18);
  auVar20 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar10 * 0x10 + uVar91 + 6)));
  auVar19 = vcvtdq2ps_avx(auVar19);
  auVar20 = vcvtdq2ps_avx(auVar20);
  auVar21 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar91 * 0x1a + 6)));
  auVar21 = vcvtdq2ps_avx(auVar21);
  auVar22 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar91 * 0x1b + 6)));
  auVar22 = vcvtdq2ps_avx(auVar22);
  auVar236 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar91 * 0x1c + 6)));
  auVar236 = vcvtdq2ps_avx(auVar236);
  auVar166 = vshufps_avx(auVar276,auVar276,0);
  auVar23 = vshufps_avx(auVar276,auVar276,0x55);
  auVar195 = vshufps_avx(auVar276,auVar276,0xaa);
  fVar124 = auVar195._0_4_;
  fVar148 = auVar195._4_4_;
  fVar126 = auVar195._8_4_;
  fVar152 = auVar195._12_4_;
  fVar210 = auVar23._0_4_;
  fVar224 = auVar23._4_4_;
  fVar225 = auVar23._8_4_;
  fVar227 = auVar23._12_4_;
  fVar185 = auVar166._0_4_;
  fVar206 = auVar166._4_4_;
  fVar207 = auVar166._8_4_;
  fVar208 = auVar166._12_4_;
  auVar373._0_4_ = fVar185 * auVar252._0_4_ + fVar210 * auVar17._0_4_ + fVar124 * auVar130._0_4_;
  auVar373._4_4_ = fVar206 * auVar252._4_4_ + fVar224 * auVar17._4_4_ + fVar148 * auVar130._4_4_;
  auVar373._8_4_ = fVar207 * auVar252._8_4_ + fVar225 * auVar17._8_4_ + fVar126 * auVar130._8_4_;
  auVar373._12_4_ = fVar208 * auVar252._12_4_ + fVar227 * auVar17._12_4_ + fVar152 * auVar130._12_4_
  ;
  auVar390._0_4_ = fVar185 * auVar18._0_4_ + fVar210 * auVar19._0_4_ + auVar20._0_4_ * fVar124;
  auVar390._4_4_ = fVar206 * auVar18._4_4_ + fVar224 * auVar19._4_4_ + auVar20._4_4_ * fVar148;
  auVar390._8_4_ = fVar207 * auVar18._8_4_ + fVar225 * auVar19._8_4_ + auVar20._8_4_ * fVar126;
  auVar390._12_4_ = fVar208 * auVar18._12_4_ + fVar227 * auVar19._12_4_ + auVar20._12_4_ * fVar152;
  auVar277._0_4_ = fVar185 * auVar21._0_4_ + fVar210 * auVar22._0_4_ + auVar236._0_4_ * fVar124;
  auVar277._4_4_ = fVar206 * auVar21._4_4_ + fVar224 * auVar22._4_4_ + auVar236._4_4_ * fVar148;
  auVar277._8_4_ = fVar207 * auVar21._8_4_ + fVar225 * auVar22._8_4_ + auVar236._8_4_ * fVar126;
  auVar277._12_4_ = fVar208 * auVar21._12_4_ + fVar227 * auVar22._12_4_ + auVar236._12_4_ * fVar152;
  auVar166 = vshufps_avx(auVar134,auVar134,0);
  auVar23 = vshufps_avx(auVar134,auVar134,0x55);
  auVar195 = vshufps_avx(auVar134,auVar134,0xaa);
  fVar124 = auVar195._0_4_;
  fVar148 = auVar195._4_4_;
  fVar126 = auVar195._8_4_;
  fVar152 = auVar195._12_4_;
  fVar210 = auVar23._0_4_;
  fVar224 = auVar23._4_4_;
  fVar225 = auVar23._8_4_;
  fVar227 = auVar23._12_4_;
  fVar185 = auVar166._0_4_;
  fVar206 = auVar166._4_4_;
  fVar207 = auVar166._8_4_;
  fVar208 = auVar166._12_4_;
  auVar127._0_4_ = fVar185 * auVar252._0_4_ + fVar210 * auVar17._0_4_ + fVar124 * auVar130._0_4_;
  auVar127._4_4_ = fVar206 * auVar252._4_4_ + fVar224 * auVar17._4_4_ + fVar148 * auVar130._4_4_;
  auVar127._8_4_ = fVar207 * auVar252._8_4_ + fVar225 * auVar17._8_4_ + fVar126 * auVar130._8_4_;
  auVar127._12_4_ = fVar208 * auVar252._12_4_ + fVar227 * auVar17._12_4_ + fVar152 * auVar130._12_4_
  ;
  auVar97._0_4_ = fVar185 * auVar18._0_4_ + auVar20._0_4_ * fVar124 + fVar210 * auVar19._0_4_;
  auVar97._4_4_ = fVar206 * auVar18._4_4_ + auVar20._4_4_ * fVar148 + fVar224 * auVar19._4_4_;
  auVar97._8_4_ = fVar207 * auVar18._8_4_ + auVar20._8_4_ * fVar126 + fVar225 * auVar19._8_4_;
  auVar97._12_4_ = fVar208 * auVar18._12_4_ + auVar20._12_4_ * fVar152 + fVar227 * auVar19._12_4_;
  auVar309._8_4_ = 0x7fffffff;
  auVar309._0_8_ = 0x7fffffff7fffffff;
  auVar309._12_4_ = 0x7fffffff;
  auVar252 = vandps_avx(auVar373,auVar309);
  auVar211._8_4_ = 0x219392ef;
  auVar211._0_8_ = 0x219392ef219392ef;
  auVar211._12_4_ = 0x219392ef;
  auVar252 = vcmpps_avx(auVar252,auVar211,1);
  auVar17 = vblendvps_avx(auVar373,auVar211,auVar252);
  auVar252 = vandps_avx(auVar390,auVar309);
  auVar252 = vcmpps_avx(auVar252,auVar211,1);
  auVar130 = vblendvps_avx(auVar390,auVar211,auVar252);
  auVar252 = vandps_avx(auVar309,auVar277);
  auVar252 = vcmpps_avx(auVar252,auVar211,1);
  auVar252 = vblendvps_avx(auVar277,auVar211,auVar252);
  auVar137._0_4_ = fVar185 * auVar21._0_4_ + fVar210 * auVar22._0_4_ + auVar236._0_4_ * fVar124;
  auVar137._4_4_ = fVar206 * auVar21._4_4_ + fVar224 * auVar22._4_4_ + auVar236._4_4_ * fVar148;
  auVar137._8_4_ = fVar207 * auVar21._8_4_ + fVar225 * auVar22._8_4_ + auVar236._8_4_ * fVar126;
  auVar137._12_4_ = fVar208 * auVar21._12_4_ + fVar227 * auVar22._12_4_ + auVar236._12_4_ * fVar152;
  auVar18 = vrcpps_avx(auVar17);
  fVar185 = auVar18._0_4_;
  auVar186._0_4_ = fVar185 * auVar17._0_4_;
  fVar206 = auVar18._4_4_;
  auVar186._4_4_ = fVar206 * auVar17._4_4_;
  fVar207 = auVar18._8_4_;
  auVar186._8_4_ = fVar207 * auVar17._8_4_;
  fVar208 = auVar18._12_4_;
  auVar186._12_4_ = fVar208 * auVar17._12_4_;
  auVar251._8_4_ = 0x3f800000;
  auVar251._0_8_ = 0x3f8000003f800000;
  auVar251._12_4_ = 0x3f800000;
  auVar17 = vsubps_avx(auVar251,auVar186);
  fVar185 = fVar185 + fVar185 * auVar17._0_4_;
  fVar206 = fVar206 + fVar206 * auVar17._4_4_;
  fVar207 = fVar207 + fVar207 * auVar17._8_4_;
  fVar208 = fVar208 + fVar208 * auVar17._12_4_;
  auVar17 = vrcpps_avx(auVar130);
  fVar210 = auVar17._0_4_;
  auVar234._0_4_ = fVar210 * auVar130._0_4_;
  fVar224 = auVar17._4_4_;
  auVar234._4_4_ = fVar224 * auVar130._4_4_;
  fVar225 = auVar17._8_4_;
  auVar234._8_4_ = fVar225 * auVar130._8_4_;
  fVar227 = auVar17._12_4_;
  auVar234._12_4_ = fVar227 * auVar130._12_4_;
  auVar17 = vsubps_avx(auVar251,auVar234);
  fVar210 = fVar210 + fVar210 * auVar17._0_4_;
  fVar224 = fVar224 + fVar224 * auVar17._4_4_;
  fVar225 = fVar225 + fVar225 * auVar17._8_4_;
  fVar227 = fVar227 + fVar227 * auVar17._12_4_;
  auVar17 = vrcpps_avx(auVar252);
  fVar232 = auVar17._0_4_;
  auVar278._0_4_ = fVar232 * auVar252._0_4_;
  fVar241 = auVar17._4_4_;
  auVar278._4_4_ = fVar241 * auVar252._4_4_;
  fVar243 = auVar17._8_4_;
  auVar278._8_4_ = fVar243 * auVar252._8_4_;
  fVar245 = auVar17._12_4_;
  auVar278._12_4_ = fVar245 * auVar252._12_4_;
  auVar252 = vsubps_avx(auVar251,auVar278);
  fVar232 = fVar232 + fVar232 * auVar252._0_4_;
  fVar241 = fVar241 + fVar241 * auVar252._4_4_;
  fVar243 = fVar243 + fVar243 * auVar252._8_4_;
  fVar245 = fVar245 + fVar245 * auVar252._12_4_;
  auVar252 = ZEXT416((uint)((*(float *)(ray + k * 4 + 0x70) - *(float *)(prim + lVar16 + 0x16)) *
                           *(float *)(prim + lVar16 + 0x1a)));
  auVar130 = vshufps_avx(auVar252,auVar252,0);
  auVar252._8_8_ = 0;
  auVar252._0_8_ = *(ulong *)(prim + uVar91 * 7 + 6);
  auVar252 = vpmovsxwd_avx(auVar252);
  auVar252 = vcvtdq2ps_avx(auVar252);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar91 * 0xb + 6);
  auVar17 = vpmovsxwd_avx(auVar17);
  auVar17 = vcvtdq2ps_avx(auVar17);
  auVar18 = vsubps_avx(auVar17,auVar252);
  fVar124 = auVar130._0_4_;
  fVar148 = auVar130._4_4_;
  fVar126 = auVar130._8_4_;
  fVar152 = auVar130._12_4_;
  auVar130._8_8_ = 0;
  auVar130._0_8_ = *(ulong *)(prim + uVar91 * 9 + 6);
  auVar17 = vpmovsxwd_avx(auVar130);
  auVar279._0_4_ = auVar18._0_4_ * fVar124 + auVar252._0_4_;
  auVar279._4_4_ = auVar18._4_4_ * fVar148 + auVar252._4_4_;
  auVar279._8_4_ = auVar18._8_4_ * fVar126 + auVar252._8_4_;
  auVar279._12_4_ = auVar18._12_4_ * fVar152 + auVar252._12_4_;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + uVar91 * 0xd + 6);
  auVar130 = vpmovsxwd_avx(auVar18);
  auVar252 = vcvtdq2ps_avx(auVar17);
  auVar17 = vcvtdq2ps_avx(auVar130);
  auVar17 = vsubps_avx(auVar17,auVar252);
  auVar310._0_4_ = auVar17._0_4_ * fVar124 + auVar252._0_4_;
  auVar310._4_4_ = auVar17._4_4_ * fVar148 + auVar252._4_4_;
  auVar310._8_4_ = auVar17._8_4_ * fVar126 + auVar252._8_4_;
  auVar310._12_4_ = auVar17._12_4_ * fVar152 + auVar252._12_4_;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + uVar91 * 0x12 + 6);
  auVar252 = vpmovsxwd_avx(auVar19);
  uVar87 = (ulong)(uint)((int)(uVar91 * 5) << 2);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + uVar91 * 2 + uVar87 + 6);
  auVar17 = vpmovsxwd_avx(auVar20);
  auVar252 = vcvtdq2ps_avx(auVar252);
  auVar17 = vcvtdq2ps_avx(auVar17);
  auVar17 = vsubps_avx(auVar17,auVar252);
  auVar329._0_4_ = auVar17._0_4_ * fVar124 + auVar252._0_4_;
  auVar329._4_4_ = auVar17._4_4_ * fVar148 + auVar252._4_4_;
  auVar329._8_4_ = auVar17._8_4_ * fVar126 + auVar252._8_4_;
  auVar329._12_4_ = auVar17._12_4_ * fVar152 + auVar252._12_4_;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(prim + uVar87 + 6);
  auVar252 = vpmovsxwd_avx(auVar21);
  auVar252 = vcvtdq2ps_avx(auVar252);
  auVar22._8_8_ = 0;
  auVar22._0_8_ = *(ulong *)(prim + uVar91 * 0x18 + 6);
  auVar17 = vpmovsxwd_avx(auVar22);
  auVar17 = vcvtdq2ps_avx(auVar17);
  auVar130 = vsubps_avx(auVar17,auVar252);
  auVar236._8_8_ = 0;
  auVar236._0_8_ = *(ulong *)(prim + uVar91 * 0x1d + 6);
  auVar17 = vpmovsxwd_avx(auVar236);
  auVar344._0_4_ = auVar130._0_4_ * fVar124 + auVar252._0_4_;
  auVar344._4_4_ = auVar130._4_4_ * fVar148 + auVar252._4_4_;
  auVar344._8_4_ = auVar130._8_4_ * fVar126 + auVar252._8_4_;
  auVar344._12_4_ = auVar130._12_4_ * fVar152 + auVar252._12_4_;
  auVar252 = vcvtdq2ps_avx(auVar17);
  auVar166._8_8_ = 0;
  auVar166._0_8_ = *(ulong *)(prim + uVar91 + (ulong)(byte)PVar10 * 0x20 + 6);
  auVar17 = vpmovsxwd_avx(auVar166);
  auVar17 = vcvtdq2ps_avx(auVar17);
  auVar17 = vsubps_avx(auVar17,auVar252);
  auVar354._0_4_ = auVar17._0_4_ * fVar124 + auVar252._0_4_;
  auVar354._4_4_ = auVar17._4_4_ * fVar148 + auVar252._4_4_;
  auVar354._8_4_ = auVar17._8_4_ * fVar126 + auVar252._8_4_;
  auVar354._12_4_ = auVar17._12_4_ * fVar152 + auVar252._12_4_;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar10 * 0x20 - uVar91) + 6);
  auVar252 = vpmovsxwd_avx(auVar23);
  auVar252 = vcvtdq2ps_avx(auVar252);
  auVar195._8_8_ = 0;
  auVar195._0_8_ = *(ulong *)(prim + uVar91 * 0x23 + 6);
  auVar17 = vpmovsxwd_avx(auVar195);
  auVar17 = vcvtdq2ps_avx(auVar17);
  auVar17 = vsubps_avx(auVar17,auVar252);
  auVar253._0_4_ = auVar252._0_4_ + auVar17._0_4_ * fVar124;
  auVar253._4_4_ = auVar252._4_4_ + auVar17._4_4_ * fVar148;
  auVar253._8_4_ = auVar252._8_4_ + auVar17._8_4_ * fVar126;
  auVar253._12_4_ = auVar252._12_4_ + auVar17._12_4_ * fVar152;
  auVar252 = vsubps_avx(auVar279,auVar127);
  auVar280._0_4_ = fVar185 * auVar252._0_4_;
  auVar280._4_4_ = fVar206 * auVar252._4_4_;
  auVar280._8_4_ = fVar207 * auVar252._8_4_;
  auVar280._12_4_ = fVar208 * auVar252._12_4_;
  auVar252 = vsubps_avx(auVar310,auVar127);
  auVar128._0_4_ = fVar185 * auVar252._0_4_;
  auVar128._4_4_ = fVar206 * auVar252._4_4_;
  auVar128._8_4_ = fVar207 * auVar252._8_4_;
  auVar128._12_4_ = fVar208 * auVar252._12_4_;
  auVar252 = vsubps_avx(auVar329,auVar97);
  auVar187._0_4_ = fVar210 * auVar252._0_4_;
  auVar187._4_4_ = fVar224 * auVar252._4_4_;
  auVar187._8_4_ = fVar225 * auVar252._8_4_;
  auVar187._12_4_ = fVar227 * auVar252._12_4_;
  auVar252 = vsubps_avx(auVar344,auVar97);
  auVar106._0_4_ = fVar210 * auVar252._0_4_;
  auVar106._4_4_ = fVar224 * auVar252._4_4_;
  auVar106._8_4_ = fVar225 * auVar252._8_4_;
  auVar106._12_4_ = fVar227 * auVar252._12_4_;
  auVar252 = vsubps_avx(auVar354,auVar137);
  auVar212._0_4_ = fVar232 * auVar252._0_4_;
  auVar212._4_4_ = fVar241 * auVar252._4_4_;
  auVar212._8_4_ = fVar243 * auVar252._8_4_;
  auVar212._12_4_ = fVar245 * auVar252._12_4_;
  auVar252 = vsubps_avx(auVar253,auVar137);
  auVar155._0_4_ = fVar232 * auVar252._0_4_;
  auVar155._4_4_ = fVar241 * auVar252._4_4_;
  auVar155._8_4_ = fVar243 * auVar252._8_4_;
  auVar155._12_4_ = fVar245 * auVar252._12_4_;
  auVar252 = vpminsd_avx(auVar280,auVar128);
  auVar17 = vpminsd_avx(auVar187,auVar106);
  auVar252 = vmaxps_avx(auVar252,auVar17);
  auVar17 = vpminsd_avx(auVar212,auVar155);
  uVar8 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar311._4_4_ = uVar8;
  auVar311._0_4_ = uVar8;
  auVar311._8_4_ = uVar8;
  auVar311._12_4_ = uVar8;
  auVar17 = vmaxps_avx(auVar17,auVar311);
  auVar252 = vmaxps_avx(auVar252,auVar17);
  local_520._0_4_ = auVar252._0_4_ * 0.99999964;
  local_520._4_4_ = auVar252._4_4_ * 0.99999964;
  local_520._8_4_ = auVar252._8_4_ * 0.99999964;
  local_520._12_4_ = auVar252._12_4_ * 0.99999964;
  auVar252 = vpmaxsd_avx(auVar280,auVar128);
  auVar17 = vpmaxsd_avx(auVar187,auVar106);
  auVar252 = vminps_avx(auVar252,auVar17);
  auVar17 = vpmaxsd_avx(auVar212,auVar155);
  uVar8 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar156._4_4_ = uVar8;
  auVar156._0_4_ = uVar8;
  auVar156._8_4_ = uVar8;
  auVar156._12_4_ = uVar8;
  auVar17 = vminps_avx(auVar17,auVar156);
  auVar252 = vminps_avx(auVar252,auVar17);
  auVar98._0_4_ = auVar252._0_4_ * 1.0000004;
  auVar98._4_4_ = auVar252._4_4_ * 1.0000004;
  auVar98._8_4_ = auVar252._8_4_ * 1.0000004;
  auVar98._12_4_ = auVar252._12_4_ * 1.0000004;
  auVar252 = vpshufd_avx(ZEXT116((byte)PVar10),0);
  auVar17 = vpcmpgtd_avx(auVar252,_DAT_01f7fcf0);
  auVar252 = vcmpps_avx(local_520,auVar98,2);
  auVar252 = vandps_avx(auVar252,auVar17);
  uVar84 = vmovmskps_avx(auVar252);
  if (uVar84 == 0) {
    return false;
  }
  uVar84 = uVar84 & 0xff;
  auVar111._16_16_ = mm_lookupmask_ps._240_16_;
  auVar111._0_16_ = mm_lookupmask_ps._240_16_;
  local_2a0 = vblendps_avx(auVar111,ZEXT832(0) << 0x20,0x80);
  local_830 = prim;
LAB_00f98b7b:
  local_828 = (ulong)uVar84;
  lVar16 = 0;
  if (local_828 != 0) {
    for (; (uVar84 >> lVar16 & 1) == 0; lVar16 = lVar16 + 1) {
    }
  }
  uVar84 = *(uint *)(local_830 + 2);
  pGVar11 = (context->scene->geometries).items[uVar84].ptr;
  uVar91 = (ulong)*(uint *)(*(long *)&pGVar11->field_0x58 +
                           (ulong)*(uint *)(local_830 + lVar16 * 4 + 6) *
                           pGVar11[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  fVar124 = (pGVar11->time_range).lower;
  fVar124 = pGVar11->fnumTimeSegments *
            ((*(float *)(ray + k * 4 + 0x70) - fVar124) / ((pGVar11->time_range).upper - fVar124));
  auVar252 = vroundss_avx(ZEXT416((uint)fVar124),ZEXT416((uint)fVar124),9);
  auVar252 = vminss_avx(auVar252,ZEXT416((uint)(pGVar11->fnumTimeSegments + -1.0)));
  auVar252 = vmaxss_avx(ZEXT816(0) << 0x20,auVar252);
  fVar124 = fVar124 - auVar252._0_4_;
  _Var12 = pGVar11[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar92 = (long)(int)auVar252._0_4_ * 0x38;
  lVar13 = *(long *)(_Var12 + lVar92);
  lVar14 = *(long *)(_Var12 + 0x10 + lVar92);
  auVar252 = vshufps_avx(ZEXT416((uint)(1.0 - fVar124)),ZEXT416((uint)(1.0 - fVar124)),0);
  pfVar1 = (float *)(lVar13 + lVar14 * uVar91);
  fVar210 = auVar252._0_4_;
  fVar224 = auVar252._4_4_;
  fVar225 = auVar252._8_4_;
  fVar227 = auVar252._12_4_;
  pfVar2 = (float *)(lVar13 + lVar14 * (uVar91 + 1));
  pfVar3 = (float *)(lVar13 + lVar14 * (uVar91 + 2));
  pfVar4 = (float *)(lVar13 + lVar14 * (uVar91 + 3));
  lVar13 = *(long *)(_Var12 + 0x38 + lVar92);
  lVar14 = *(long *)(_Var12 + 0x48 + lVar92);
  auVar252 = vshufps_avx(ZEXT416((uint)fVar124),ZEXT416((uint)fVar124),0);
  pfVar5 = (float *)(lVar13 + uVar91 * lVar14);
  fVar232 = auVar252._0_4_;
  fVar241 = auVar252._4_4_;
  fVar243 = auVar252._8_4_;
  fVar245 = auVar252._12_4_;
  pfVar6 = (float *)(lVar13 + (uVar91 + 1) * lVar14);
  pfVar7 = (float *)(lVar13 + (uVar91 + 2) * lVar14);
  auVar213._0_4_ = fVar232 * *pfVar5 + fVar210 * *pfVar1;
  auVar213._4_4_ = fVar241 * pfVar5[1] + fVar224 * pfVar1[1];
  auVar213._8_4_ = fVar243 * pfVar5[2] + fVar225 * pfVar1[2];
  auVar213._12_4_ = fVar245 * pfVar5[3] + fVar227 * pfVar1[3];
  auVar252 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x1c);
  auVar17 = vinsertps_avx(auVar252,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  auVar312 = ZEXT1664(auVar17);
  fVar124 = *(float *)(ray + k * 4 + 0x40);
  auVar374._4_4_ = fVar124;
  auVar374._0_4_ = fVar124;
  auVar374._8_4_ = fVar124;
  auVar374._12_4_ = fVar124;
  auVar376 = ZEXT3264(CONCAT428(fVar124,CONCAT424(fVar124,CONCAT420(fVar124,CONCAT416(fVar124,
                                                  auVar374)))));
  fVar148 = *(float *)(ray + k * 4 + 0x50);
  auVar391._4_4_ = fVar148;
  auVar391._0_4_ = fVar148;
  auVar391._8_4_ = fVar148;
  auVar391._12_4_ = fVar148;
  fStack_790 = fVar148;
  _local_7a0 = auVar391;
  fStack_78c = fVar148;
  fStack_788 = fVar148;
  fStack_784 = fVar148;
  auVar235._0_4_ = fVar210 * *pfVar2 + fVar232 * *pfVar6;
  auVar235._4_4_ = fVar224 * pfVar2[1] + fVar241 * pfVar6[1];
  auVar235._8_4_ = fVar225 * pfVar2[2] + fVar243 * pfVar6[2];
  auVar235._12_4_ = fVar227 * pfVar2[3] + fVar245 * pfVar6[3];
  auVar252 = vunpcklps_avx(auVar374,auVar391);
  fVar126 = *(float *)(ray + k * 4 + 0x60);
  auVar411._4_4_ = fVar126;
  auVar411._0_4_ = fVar126;
  auVar411._8_4_ = fVar126;
  auVar411._12_4_ = fVar126;
  fStack_910 = fVar126;
  _local_920 = auVar411;
  fStack_90c = fVar126;
  fStack_908 = fVar126;
  register0x0000159c = fVar126;
  _local_890 = vinsertps_avx(auVar252,auVar411,0x28);
  auVar99._0_4_ = (auVar213._0_4_ + auVar235._0_4_) * 0.5;
  auVar99._4_4_ = (auVar213._4_4_ + auVar235._4_4_) * 0.5;
  auVar99._8_4_ = (auVar213._8_4_ + auVar235._8_4_) * 0.5;
  auVar99._12_4_ = (auVar213._12_4_ + auVar235._12_4_) * 0.5;
  auVar252 = vsubps_avx(auVar99,auVar17);
  auVar252 = vdpps_avx(auVar252,_local_890,0x7f);
  local_8a0 = vdpps_avx(_local_890,_local_890,0x7f);
  auVar188._0_4_ = fVar210 * *pfVar3 + fVar232 * *pfVar7;
  auVar188._4_4_ = fVar224 * pfVar3[1] + fVar241 * pfVar7[1];
  auVar188._8_4_ = fVar225 * pfVar3[2] + fVar243 * pfVar7[2];
  auVar188._12_4_ = fVar227 * pfVar3[3] + fVar245 * pfVar7[3];
  auVar130 = vrcpss_avx(local_8a0,local_8a0);
  fVar208 = auVar252._0_4_ * auVar130._0_4_ * (2.0 - local_8a0._0_4_ * auVar130._0_4_);
  auVar252 = vshufps_avx(ZEXT416((uint)fVar208),ZEXT416((uint)fVar208),0);
  fVar152 = auVar252._0_4_;
  fVar185 = auVar252._4_4_;
  fVar206 = auVar252._8_4_;
  fVar207 = auVar252._12_4_;
  auVar254._0_4_ = auVar17._0_4_ + local_890._0_4_ * fVar152;
  auVar254._4_4_ = auVar17._4_4_ + local_890._4_4_ * fVar185;
  auVar254._8_4_ = auVar17._8_4_ + local_890._8_4_ * fVar206;
  auVar254._12_4_ = auVar17._12_4_ + local_890._12_4_ * fVar207;
  auVar252 = vblendps_avx(auVar254,_DAT_01f7aa10,8);
  auVar19 = vsubps_avx(auVar213,auVar252);
  auVar20 = vsubps_avx(auVar188,auVar252);
  pfVar1 = (float *)(lVar13 + lVar14 * (uVar91 + 3));
  auVar129._0_4_ = fVar210 * *pfVar4 + fVar232 * *pfVar1;
  auVar129._4_4_ = fVar224 * pfVar4[1] + fVar241 * pfVar1[1];
  auVar129._8_4_ = fVar225 * pfVar4[2] + fVar243 * pfVar1[2];
  auVar129._12_4_ = fVar227 * pfVar4[3] + fVar245 * pfVar1[3];
  auVar21 = vsubps_avx(auVar235,auVar252);
  auVar22 = vsubps_avx(auVar129,auVar252);
  auVar252 = vshufps_avx(auVar19,auVar19,0);
  register0x00001250 = auVar252;
  _local_3a0 = auVar252;
  auVar252 = vshufps_avx(auVar19,auVar19,0x55);
  register0x00001250 = auVar252;
  _local_1e0 = auVar252;
  auVar252 = vshufps_avx(auVar19,auVar19,0xaa);
  register0x00001250 = auVar252;
  _local_200 = auVar252;
  auVar252 = vshufps_avx(auVar19,auVar19,0xff);
  register0x00001290 = auVar252;
  _local_220 = auVar252;
  auVar252 = vshufps_avx(auVar21,auVar21,0);
  register0x00001290 = auVar252;
  _local_3c0 = auVar252;
  auVar252 = vshufps_avx(auVar21,auVar21,0x55);
  register0x00001290 = auVar252;
  _local_3e0 = auVar252;
  auVar252 = vshufps_avx(auVar21,auVar21,0xaa);
  register0x00001290 = auVar252;
  _local_400 = auVar252;
  auVar252 = vshufps_avx(auVar21,auVar21,0xff);
  register0x00001290 = auVar252;
  _local_240 = auVar252;
  auVar252 = vshufps_avx(auVar20,auVar20,0);
  register0x00001290 = auVar252;
  _local_420 = auVar252;
  auVar252 = vshufps_avx(auVar20,auVar20,0x55);
  register0x00001290 = auVar252;
  _local_440 = auVar252;
  auVar252 = vshufps_avx(auVar20,auVar20,0xaa);
  register0x00001290 = auVar252;
  _local_460 = auVar252;
  auVar252 = vshufps_avx(auVar20,auVar20,0xff);
  register0x00001290 = auVar252;
  _local_480 = auVar252;
  auVar252 = vshufps_avx(auVar22,auVar22,0);
  auVar17 = vshufps_avx(auVar22,auVar22,0x55);
  auVar130 = vshufps_avx(auVar22,auVar22,0xaa);
  register0x00001290 = auVar130;
  _local_4a0 = auVar130;
  auVar130 = vshufps_avx(auVar22,auVar22,0xff);
  register0x00001290 = auVar130;
  _local_260 = auVar130;
  auVar130 = ZEXT416((uint)(fVar124 * fVar124 + fVar148 * fVar148 + fVar126 * fVar126));
  auVar130 = vshufps_avx(auVar130,auVar130,0);
  local_280._16_16_ = auVar130;
  local_280._0_16_ = auVar130;
  fVar148 = *(float *)(ray + k * 4 + 0x30);
  local_850 = ZEXT416((uint)fVar208);
  auVar130 = vshufps_avx(ZEXT416((uint)(fVar148 - fVar208)),ZEXT416((uint)(fVar148 - fVar208)),0);
  local_2c0._16_16_ = auVar130;
  local_2c0._0_16_ = auVar130;
  local_710 = vpshufd_avx(ZEXT416(uVar84),0);
  local_720 = vpshufd_avx(ZEXT416(*(uint *)(local_830 + lVar16 * 4 + 6)),0);
  uVar91 = 0;
  bVar93 = false;
  local_bc8 = 1;
  auVar112._8_4_ = 0x7fffffff;
  auVar112._0_8_ = 0x7fffffff7fffffff;
  auVar112._12_4_ = 0x7fffffff;
  auVar112._16_4_ = 0x7fffffff;
  auVar112._20_4_ = 0x7fffffff;
  auVar112._24_4_ = 0x7fffffff;
  auVar112._28_4_ = 0x7fffffff;
  local_4c0 = vandps_avx(local_280,auVar112);
  auVar130 = vsqrtss_avx(local_8a0,local_8a0);
  auVar18 = vsqrtss_avx(local_8a0,local_8a0);
  local_510 = ZEXT816(0x3f80000000000000);
  do {
    auVar219._8_4_ = 0x3f800000;
    auVar219._0_8_ = 0x3f8000003f800000;
    auVar219._12_4_ = 0x3f800000;
    auVar219._16_4_ = 0x3f800000;
    auVar219._20_4_ = 0x3f800000;
    auVar219._24_4_ = 0x3f800000;
    auVar219._28_4_ = 0x3f800000;
    iVar90 = (int)uVar91;
    auVar236 = vmovshdup_avx(local_510);
    auVar23 = vsubps_avx(auVar236,local_510);
    auVar236 = vshufps_avx(local_510,local_510,0);
    local_900._16_16_ = auVar236;
    local_900._0_16_ = auVar236;
    auVar166 = vshufps_avx(auVar23,auVar23,0);
    local_760._16_16_ = auVar166;
    local_760._0_16_ = auVar166;
    fVar125 = auVar166._0_4_;
    fVar149 = auVar166._4_4_;
    fVar150 = auVar166._8_4_;
    fVar153 = auVar166._12_4_;
    fVar96 = auVar236._0_4_;
    auVar201._0_4_ = fVar96 + fVar125 * 0.0;
    fVar121 = auVar236._4_4_;
    auVar201._4_4_ = fVar121 + fVar149 * 0.14285715;
    fVar122 = auVar236._8_4_;
    auVar201._8_4_ = fVar122 + fVar150 * 0.2857143;
    fVar123 = auVar236._12_4_;
    auVar201._12_4_ = fVar123 + fVar153 * 0.42857146;
    auVar201._16_4_ = fVar96 + fVar125 * 0.5714286;
    auVar201._20_4_ = fVar121 + fVar149 * 0.71428573;
    auVar201._24_4_ = fVar122 + fVar150 * 0.8571429;
    auVar201._28_4_ = fVar123 + fVar153;
    auVar111 = vsubps_avx(auVar219,auVar201);
    local_940._4_4_ = auVar201._4_4_ * auVar201._4_4_;
    local_940._0_4_ = auVar201._0_4_ * auVar201._0_4_;
    fStack_938 = auVar201._8_4_ * auVar201._8_4_;
    fStack_934 = auVar201._12_4_ * auVar201._12_4_;
    fStack_930 = auVar201._16_4_ * auVar201._16_4_;
    fStack_92c = auVar201._20_4_ * auVar201._20_4_;
    fStack_928 = auVar201._24_4_ * auVar201._24_4_;
    fStack_924 = fVar123;
    fVar243 = auVar201._0_4_ * 3.0;
    fVar245 = auVar201._4_4_ * 3.0;
    fVar226 = auVar201._8_4_ * 3.0;
    fVar228 = auVar201._12_4_ * 3.0;
    fVar229 = auVar201._16_4_ * 3.0;
    fVar230 = auVar201._20_4_ * 3.0;
    fVar231 = auVar201._24_4_ * 3.0;
    fVar126 = auVar111._0_4_;
    auVar313._0_4_ = fVar126 * fVar126;
    fVar208 = auVar111._4_4_;
    auVar313._4_4_ = fVar208 * fVar208;
    fVar210 = auVar111._8_4_;
    auVar313._8_4_ = fVar210 * fVar210;
    fVar224 = auVar111._12_4_;
    auVar313._12_4_ = fVar224 * fVar224;
    fVar225 = auVar111._16_4_;
    auVar313._16_4_ = fVar225 * fVar225;
    fVar227 = auVar111._20_4_;
    auVar313._20_4_ = fVar227 * fVar227;
    fVar232 = auVar111._24_4_;
    auVar313._28_36_ = auVar312._28_36_;
    auVar313._24_4_ = fVar232 * fVar232;
    fVar241 = auVar111._28_4_;
    fVar233 = (auVar313._0_4_ * (fVar126 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar242 = (auVar313._4_4_ * (fVar208 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar244 = (auVar313._8_4_ * (fVar210 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar246 = (auVar313._12_4_ * (fVar224 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar247 = (auVar313._16_4_ * (fVar225 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar248 = (auVar313._20_4_ * (fVar227 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar249 = (auVar313._24_4_ * (fVar232 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar327 = -fVar126 * auVar201._0_4_ * auVar201._0_4_ * 0.5;
    fVar330 = -fVar208 * auVar201._4_4_ * auVar201._4_4_ * 0.5;
    fVar332 = -fVar210 * auVar201._8_4_ * auVar201._8_4_ * 0.5;
    fVar334 = -fVar224 * auVar201._12_4_ * auVar201._12_4_ * 0.5;
    fVar336 = -fVar225 * auVar201._16_4_ * auVar201._16_4_ * 0.5;
    fVar338 = -fVar227 * auVar201._20_4_ * auVar201._20_4_ * 0.5;
    fVar340 = -fVar232 * auVar201._24_4_ * auVar201._24_4_ * 0.5;
    fVar406 = auVar252._0_4_;
    fVar409 = auVar252._4_4_;
    fVar151 = auVar252._8_4_;
    fVar402 = auVar252._12_4_;
    fVar351 = auVar17._0_4_;
    fVar399 = auVar17._4_4_;
    fVar401 = auVar17._8_4_;
    fVar404 = auVar17._12_4_;
    fVar389 = (auVar201._0_4_ * auVar201._0_4_ * (fVar243 + -5.0) + 2.0) * 0.5;
    fVar398 = (auVar201._4_4_ * auVar201._4_4_ * (fVar245 + -5.0) + 2.0) * 0.5;
    fVar400 = (auVar201._8_4_ * auVar201._8_4_ * (fVar226 + -5.0) + 2.0) * 0.5;
    fVar403 = (auVar201._12_4_ * auVar201._12_4_ * (fVar228 + -5.0) + 2.0) * 0.5;
    fVar405 = (auVar201._16_4_ * auVar201._16_4_ * (fVar229 + -5.0) + 2.0) * 0.5;
    fVar407 = (auVar201._20_4_ * auVar201._20_4_ * (fVar230 + -5.0) + 2.0) * 0.5;
    fVar408 = (auVar201._24_4_ * auVar201._24_4_ * (fVar231 + -5.0) + 2.0) * 0.5;
    fVar371 = -auVar201._0_4_ * fVar126 * fVar126 * 0.5;
    fVar377 = -auVar201._4_4_ * fVar208 * fVar208 * 0.5;
    fVar379 = -auVar201._8_4_ * fVar210 * fVar210 * 0.5;
    fVar381 = -auVar201._12_4_ * fVar224 * fVar224 * 0.5;
    fVar383 = -auVar201._16_4_ * fVar225 * fVar225 * 0.5;
    fVar385 = -auVar201._20_4_ * fVar227 * fVar227 * 0.5;
    fVar387 = -auVar201._24_4_ * fVar232 * fVar232 * 0.5;
    local_8c0 = fVar371 * (float)local_3a0._0_4_ +
                fVar389 * (float)local_3c0._0_4_ +
                fVar406 * fVar327 + fVar233 * (float)local_420._0_4_;
    fStack_8bc = fVar377 * (float)local_3a0._4_4_ +
                 fVar398 * (float)local_3c0._4_4_ +
                 fVar409 * fVar330 + fVar242 * (float)local_420._4_4_;
    fStack_8b8 = fVar379 * fStack_398 +
                 fVar400 * fStack_3b8 + fVar151 * fVar332 + fVar244 * fStack_418;
    fStack_8b4 = fVar381 * fStack_394 +
                 fVar403 * fStack_3b4 + fVar402 * fVar334 + fVar246 * fStack_414;
    fStack_8b0 = fVar383 * fStack_390 +
                 fVar405 * fStack_3b0 + fVar406 * fVar336 + fVar247 * fStack_410;
    fStack_8ac = fVar385 * fStack_38c +
                 fVar407 * fStack_3ac + fVar409 * fVar338 + fVar248 * fStack_40c;
    fStack_8a8 = fVar387 * fStack_388 +
                 fVar408 * fStack_3a8 + fVar151 * fVar340 + fVar249 * fStack_408;
    fStack_8a4 = fVar402 + 2.0 + -fVar241 + fVar402 + -0.0;
    fVar328 = (float)local_1e0._0_4_ * fVar371 +
              fVar389 * (float)local_3e0._0_4_ +
              fVar351 * fVar327 + fVar233 * (float)local_440._0_4_;
    fVar331 = (float)local_1e0._4_4_ * fVar377 +
              fVar398 * (float)local_3e0._4_4_ +
              fVar399 * fVar330 + fVar242 * (float)local_440._4_4_;
    fVar333 = fStack_1d8 * fVar379 + fVar400 * fStack_3d8 + fVar401 * fVar332 + fVar244 * fStack_438
    ;
    fVar335 = fStack_1d4 * fVar381 + fVar403 * fStack_3d4 + fVar404 * fVar334 + fVar246 * fStack_434
    ;
    fVar337 = fStack_1d0 * fVar383 + fVar405 * fStack_3d0 + fVar351 * fVar336 + fVar247 * fStack_430
    ;
    fVar339 = fStack_1cc * fVar385 + fVar407 * fStack_3cc + fVar399 * fVar338 + fVar248 * fStack_42c
    ;
    fVar341 = fStack_1c8 * fVar387 + fVar408 * fStack_3c8 + fVar401 * fVar340 + fVar249 * fStack_428
    ;
    fVar343 = fStack_8a4 + fVar402 + -0.0 + fVar404 + fVar402;
    fVar154 = (float)local_200._0_4_ * fVar371 +
              fVar389 * (float)local_400._0_4_ +
              fVar327 * (float)local_4a0._0_4_ + fVar233 * (float)local_460._0_4_;
    fVar178 = (float)local_200._4_4_ * fVar377 +
              fVar398 * (float)local_400._4_4_ +
              fVar330 * (float)local_4a0._4_4_ + fVar242 * (float)local_460._4_4_;
    fVar179 = fStack_1f8 * fVar379 +
              fVar400 * fStack_3f8 + fVar332 * fStack_498 + fVar244 * fStack_458;
    fVar180 = fStack_1f4 * fVar381 +
              fVar403 * fStack_3f4 + fVar334 * fStack_494 + fVar246 * fStack_454;
    fVar181 = fStack_1f0 * fVar383 +
              fVar405 * fStack_3f0 + fVar336 * fStack_490 + fVar247 * fStack_450;
    fVar182 = fStack_1ec * fVar385 +
              fVar407 * fStack_3ec + fVar338 * fStack_48c + fVar248 * fStack_44c;
    fVar183 = fStack_1e8 * fVar387 +
              fVar408 * fStack_3e8 + fVar340 * fStack_488 + fVar249 * fStack_448;
    fVar184 = fVar343 + fVar404 + fVar402 + auVar376._28_4_ + fVar402;
    local_780._0_4_ =
         (float)local_220._0_4_ * fVar371 +
         (float)local_240._0_4_ * fVar389 +
         fVar327 * (float)local_260._0_4_ + fVar233 * (float)local_480._0_4_;
    local_780._4_4_ =
         (float)local_220._4_4_ * fVar377 +
         (float)local_240._4_4_ * fVar398 +
         fVar330 * (float)local_260._4_4_ + fVar242 * (float)local_480._4_4_;
    local_780._8_4_ =
         fStack_218 * fVar379 + fStack_238 * fVar400 + fVar332 * fStack_258 + fVar244 * fStack_478;
    local_780._12_4_ =
         fStack_214 * fVar381 + fStack_234 * fVar403 + fVar334 * fStack_254 + fVar246 * fStack_474;
    local_780._16_4_ =
         fStack_210 * fVar383 + fStack_230 * fVar405 + fVar336 * fStack_250 + fVar247 * fStack_470;
    local_780._20_4_ =
         fStack_20c * fVar385 + fStack_22c * fVar407 + fVar338 * fStack_24c + fVar248 * fStack_46c;
    local_780._24_4_ =
         fStack_208 * fVar387 + fStack_228 * fVar408 + fVar340 * fStack_248 + fVar249 * fStack_468;
    local_780._28_4_ = fVar343 + fVar402 + 2.0 + -fVar241 + -3.0;
    auVar28._4_4_ = (fVar208 + fVar208) * auVar201._4_4_;
    auVar28._0_4_ = (fVar126 + fVar126) * auVar201._0_4_;
    auVar28._8_4_ = (fVar210 + fVar210) * auVar201._8_4_;
    auVar28._12_4_ = (fVar224 + fVar224) * auVar201._12_4_;
    auVar28._16_4_ = (fVar225 + fVar225) * auVar201._16_4_;
    auVar28._20_4_ = (fVar227 + fVar227) * auVar201._20_4_;
    auVar28._24_4_ = (fVar232 + fVar232) * auVar201._24_4_;
    auVar28._28_4_ = auVar201._28_4_ + auVar201._28_4_;
    auVar111 = vsubps_avx(auVar28,auVar313._0_32_);
    auVar24._4_4_ = (fVar208 + fVar208) * (fVar245 + 2.0);
    auVar24._0_4_ = (fVar126 + fVar126) * (fVar243 + 2.0);
    auVar24._8_4_ = (fVar210 + fVar210) * (fVar226 + 2.0);
    auVar24._12_4_ = (fVar224 + fVar224) * (fVar228 + 2.0);
    auVar24._16_4_ = (fVar225 + fVar225) * (fVar229 + 2.0);
    auVar24._20_4_ = (fVar227 + fVar227) * (fVar230 + 2.0);
    auVar24._24_4_ = (fVar232 + fVar232) * (fVar231 + 2.0);
    auVar24._28_4_ = 0x40400000;
    auVar25._4_4_ = fVar208 * fVar208 * 3.0;
    auVar25._0_4_ = fVar126 * fVar126 * 3.0;
    auVar25._8_4_ = fVar210 * fVar210 * 3.0;
    auVar25._12_4_ = fVar224 * fVar224 * 3.0;
    auVar25._16_4_ = fVar225 * fVar225 * 3.0;
    auVar25._20_4_ = fVar227 * fVar227 * 3.0;
    auVar25._24_4_ = fVar232 * fVar232 * 3.0;
    auVar25._28_4_ = fVar241;
    auVar112 = vsubps_avx(auVar24,auVar25);
    auVar28 = vsubps_avx(_local_940,auVar28);
    fVar336 = auVar111._0_4_ * 0.5;
    fVar338 = auVar111._4_4_ * 0.5;
    fVar340 = auVar111._8_4_ * 0.5;
    fVar371 = auVar111._12_4_ * 0.5;
    fVar377 = auVar111._16_4_ * 0.5;
    fVar379 = auVar111._20_4_ * 0.5;
    fVar381 = auVar111._24_4_ * 0.5;
    fVar244 = (auVar201._0_4_ * fVar243 + (auVar201._0_4_ + auVar201._0_4_) * (fVar243 + -5.0)) *
              0.5;
    fVar248 = (auVar201._4_4_ * fVar245 + (auVar201._4_4_ + auVar201._4_4_) * (fVar245 + -5.0)) *
              0.5;
    fVar249 = (auVar201._8_4_ * fVar226 + (auVar201._8_4_ + auVar201._8_4_) * (fVar226 + -5.0)) *
              0.5;
    fVar327 = (auVar201._12_4_ * fVar228 + (auVar201._12_4_ + auVar201._12_4_) * (fVar228 + -5.0)) *
              0.5;
    fVar330 = (auVar201._16_4_ * fVar229 + (auVar201._16_4_ + auVar201._16_4_) * (fVar229 + -5.0)) *
              0.5;
    fVar332 = (auVar201._20_4_ * fVar230 + (auVar201._20_4_ + auVar201._20_4_) * (fVar230 + -5.0)) *
              0.5;
    fVar334 = (auVar201._24_4_ * fVar231 + (auVar201._24_4_ + auVar201._24_4_) * (fVar231 + -5.0)) *
              0.5;
    fVar126 = auVar112._0_4_ * 0.5;
    fVar208 = auVar112._4_4_ * 0.5;
    fVar210 = auVar112._8_4_ * 0.5;
    fVar224 = auVar112._12_4_ * 0.5;
    fVar243 = auVar112._16_4_ * 0.5;
    fVar245 = auVar112._20_4_ * 0.5;
    fVar230 = auVar112._24_4_ * 0.5;
    fVar227 = auVar28._0_4_ * 0.5;
    fVar226 = auVar28._4_4_ * 0.5;
    fVar229 = auVar28._8_4_ * 0.5;
    fVar231 = auVar28._12_4_ * 0.5;
    fVar233 = auVar28._16_4_ * 0.5;
    fVar246 = auVar28._20_4_ * 0.5;
    fVar247 = auVar28._24_4_ * 0.5;
    fVar326 = fVar241 + fVar241 + auVar111._28_4_;
    fVar306 = fVar326 + fVar241 + fVar241 + -4.0;
    auVar236 = vpermilps_avx(ZEXT416((uint)(auVar23._0_4_ * 0.04761905)),0);
    fVar225 = auVar236._0_4_;
    fVar274 = fVar225 * (fVar336 * (float)local_3a0._0_4_ +
                        fVar244 * (float)local_3c0._0_4_ +
                        fVar126 * (float)local_420._0_4_ + fVar227 * fVar406);
    fVar232 = auVar236._4_4_;
    fVar289 = fVar232 * (fVar338 * (float)local_3a0._4_4_ +
                        fVar248 * (float)local_3c0._4_4_ +
                        fVar208 * (float)local_420._4_4_ + fVar226 * fVar409);
    local_940._4_4_ = fVar289;
    local_940._0_4_ = fVar274;
    fVar228 = auVar236._8_4_;
    fVar291 = fVar228 * (fVar340 * fStack_398 +
                        fVar249 * fStack_3b8 + fVar210 * fStack_418 + fVar229 * fVar151);
    fStack_938 = fVar291;
    fVar242 = auVar236._12_4_;
    fVar294 = fVar242 * (fVar371 * fStack_394 +
                        fVar327 * fStack_3b4 + fVar224 * fStack_414 + fVar231 * fVar402);
    fStack_934 = fVar294;
    fVar297 = fVar225 * (fVar377 * fStack_390 +
                        fVar330 * fStack_3b0 + fVar243 * fStack_410 + fVar233 * fVar406);
    fStack_930 = fVar297;
    fVar300 = fVar232 * (fVar379 * fStack_38c +
                        fVar332 * fStack_3ac + fVar245 * fStack_40c + fVar246 * fVar409);
    fStack_92c = fVar300;
    fVar303 = fVar228 * (fVar381 * fStack_388 +
                        fVar334 * fStack_3a8 + fVar230 * fStack_408 + fVar247 * fVar151);
    fStack_928 = fVar303;
    fStack_924 = fVar306;
    fVar307 = fVar225 * ((float)local_1e0._0_4_ * fVar336 +
                        fVar244 * (float)local_3e0._0_4_ +
                        fVar126 * (float)local_440._0_4_ + fVar227 * fVar351);
    fVar314 = fVar232 * ((float)local_1e0._4_4_ * fVar338 +
                        fVar248 * (float)local_3e0._4_4_ +
                        fVar208 * (float)local_440._4_4_ + fVar226 * fVar399);
    auVar395._4_4_ = fVar314;
    auVar395._0_4_ = fVar307;
    fVar316 = fVar228 * (fStack_1d8 * fVar340 +
                        fVar249 * fStack_3d8 + fVar210 * fStack_438 + fVar229 * fVar401);
    auVar395._8_4_ = fVar316;
    fVar318 = fVar242 * (fStack_1d4 * fVar371 +
                        fVar327 * fStack_3d4 + fVar224 * fStack_434 + fVar231 * fVar404);
    auVar395._12_4_ = fVar318;
    fVar320 = fVar225 * (fStack_1d0 * fVar377 +
                        fVar330 * fStack_3d0 + fVar243 * fStack_430 + fVar233 * fVar351);
    auVar395._16_4_ = fVar320;
    fVar322 = fVar232 * (fStack_1cc * fVar379 +
                        fVar332 * fStack_3cc + fVar245 * fStack_42c + fVar246 * fVar399);
    auVar395._20_4_ = fVar322;
    fVar324 = fVar228 * (fStack_1c8 * fVar381 +
                        fVar334 * fStack_3c8 + fVar230 * fStack_428 + fVar247 * fVar401);
    auVar395._24_4_ = fVar324;
    auVar395._28_4_ = fVar326;
    fVar372 = fVar225 * ((float)local_200._0_4_ * fVar336 +
                        fVar126 * (float)local_460._0_4_ + fVar227 * (float)local_4a0._0_4_ +
                        fVar244 * (float)local_400._0_4_);
    fVar378 = fVar232 * ((float)local_200._4_4_ * fVar338 +
                        fVar208 * (float)local_460._4_4_ + fVar226 * (float)local_4a0._4_4_ +
                        fVar248 * (float)local_400._4_4_);
    auVar32._4_4_ = fVar378;
    auVar32._0_4_ = fVar372;
    fVar380 = fVar228 * (fStack_1f8 * fVar340 +
                        fVar210 * fStack_458 + fVar229 * fStack_498 + fVar249 * fStack_3f8);
    auVar32._8_4_ = fVar380;
    fVar382 = fVar242 * (fStack_1f4 * fVar371 +
                        fVar224 * fStack_454 + fVar231 * fStack_494 + fVar327 * fStack_3f4);
    auVar32._12_4_ = fVar382;
    fVar384 = fVar225 * (fStack_1f0 * fVar377 +
                        fVar243 * fStack_450 + fVar233 * fStack_490 + fVar330 * fStack_3f0);
    auVar32._16_4_ = fVar384;
    fVar386 = fVar232 * (fStack_1ec * fVar379 +
                        fVar245 * fStack_44c + fVar246 * fStack_48c + fVar332 * fStack_3ec);
    auVar32._20_4_ = fVar386;
    fVar388 = fVar228 * (fStack_1e8 * fVar381 +
                        fVar230 * fStack_448 + fVar247 * fStack_488 + fVar334 * fStack_3e8);
    auVar32._24_4_ = fVar388;
    auVar32._28_4_ = -auVar201._28_4_;
    fVar227 = fVar225 * ((float)local_220._0_4_ * fVar336 +
                        (float)local_240._0_4_ * fVar244 +
                        fVar126 * (float)local_480._0_4_ + (float)local_260._0_4_ * fVar227);
    fVar226 = fVar232 * ((float)local_220._4_4_ * fVar338 +
                        (float)local_240._4_4_ * fVar248 +
                        fVar208 * (float)local_480._4_4_ + (float)local_260._4_4_ * fVar226);
    auVar26._4_4_ = fVar226;
    auVar26._0_4_ = fVar227;
    fVar229 = fVar228 * (fStack_218 * fVar340 +
                        fStack_238 * fVar249 + fVar210 * fStack_478 + fStack_258 * fVar229);
    auVar26._8_4_ = fVar229;
    fVar244 = fVar242 * (fStack_214 * fVar371 +
                        fStack_234 * fVar327 + fVar224 * fStack_474 + fStack_254 * fVar231);
    auVar26._12_4_ = fVar244;
    fVar225 = fVar225 * (fStack_210 * fVar377 +
                        fStack_230 * fVar330 + fVar243 * fStack_470 + fStack_250 * fVar233);
    auVar26._16_4_ = fVar225;
    fVar232 = fVar232 * (fStack_20c * fVar379 +
                        fStack_22c * fVar332 + fVar245 * fStack_46c + fStack_24c * fVar246);
    auVar26._20_4_ = fVar232;
    fVar228 = fVar228 * (fStack_208 * fVar381 +
                        fStack_228 * fVar334 + fVar230 * fStack_468 + fStack_248 * fVar247);
    auVar26._24_4_ = fVar228;
    auVar26._28_4_ = fVar242;
    auVar78._4_4_ = fVar331;
    auVar78._0_4_ = fVar328;
    auVar78._8_4_ = fVar333;
    auVar78._12_4_ = fVar335;
    auVar78._16_4_ = fVar337;
    auVar78._20_4_ = fVar339;
    auVar78._24_4_ = fVar341;
    auVar78._28_4_ = fVar343;
    auVar111 = vperm2f128_avx(auVar78,auVar78,1);
    auVar111 = vshufps_avx(auVar111,auVar78,0x30);
    auVar24 = vshufps_avx(auVar78,auVar111,0x29);
    auVar30._4_4_ = fVar178;
    auVar30._0_4_ = fVar154;
    auVar30._8_4_ = fVar179;
    auVar30._12_4_ = fVar180;
    auVar30._16_4_ = fVar181;
    auVar30._20_4_ = fVar182;
    auVar30._24_4_ = fVar183;
    auVar30._28_4_ = fVar184;
    auVar111 = vperm2f128_avx(auVar30,auVar30,1);
    auVar111 = vshufps_avx(auVar111,auVar30,0x30);
    auVar25 = vshufps_avx(auVar30,auVar111,0x29);
    auVar112 = vsubps_avx(local_780,auVar26);
    auVar111 = vperm2f128_avx(auVar112,auVar112,1);
    auVar111 = vshufps_avx(auVar111,auVar112,0x30);
    auVar26 = vshufps_avx(auVar112,auVar111,0x29);
    auVar28 = vsubps_avx(auVar24,auVar78);
    auVar29 = vsubps_avx(auVar25,auVar30);
    fVar208 = auVar28._0_4_;
    fVar241 = auVar28._4_4_;
    auVar139._4_4_ = fVar378 * fVar241;
    auVar139._0_4_ = fVar372 * fVar208;
    fVar230 = auVar28._8_4_;
    auVar139._8_4_ = fVar380 * fVar230;
    fVar247 = auVar28._12_4_;
    auVar139._12_4_ = fVar382 * fVar247;
    fVar334 = auVar28._16_4_;
    auVar139._16_4_ = fVar384 * fVar334;
    fVar379 = auVar28._20_4_;
    auVar139._20_4_ = fVar386 * fVar379;
    fVar383 = auVar28._24_4_;
    auVar139._24_4_ = fVar388 * fVar383;
    auVar139._28_4_ = auVar112._28_4_;
    fVar210 = auVar29._0_4_;
    fVar243 = auVar29._4_4_;
    auVar420._4_4_ = fVar314 * fVar243;
    auVar420._0_4_ = fVar307 * fVar210;
    fVar231 = auVar29._8_4_;
    auVar420._8_4_ = fVar316 * fVar231;
    fVar248 = auVar29._12_4_;
    auVar420._12_4_ = fVar318 * fVar248;
    fVar336 = auVar29._16_4_;
    auVar420._16_4_ = fVar320 * fVar336;
    fVar381 = auVar29._20_4_;
    auVar420._20_4_ = fVar322 * fVar381;
    fVar385 = auVar29._24_4_;
    auVar420._24_4_ = fVar324 * fVar385;
    auVar420._28_4_ = auVar111._28_4_;
    auVar420 = vsubps_avx(auVar420,auVar139);
    auVar80._4_4_ = fStack_8bc;
    auVar80._0_4_ = local_8c0;
    auVar80._8_4_ = fStack_8b8;
    auVar80._12_4_ = fStack_8b4;
    auVar80._16_4_ = fStack_8b0;
    auVar80._20_4_ = fStack_8ac;
    auVar80._24_4_ = fStack_8a8;
    auVar80._28_4_ = fStack_8a4;
    auVar111 = vperm2f128_avx(auVar80,auVar80,1);
    auVar111 = vshufps_avx(auVar111,auVar80,0x30);
    auVar139 = vshufps_avx(auVar80,auVar111,0x29);
    auVar30 = vsubps_avx(auVar139,auVar80);
    auVar31._4_4_ = fVar289 * fVar243;
    auVar31._0_4_ = fVar274 * fVar210;
    auVar31._8_4_ = fVar291 * fVar231;
    auVar31._12_4_ = fVar294 * fVar248;
    auVar31._16_4_ = fVar297 * fVar336;
    auVar31._20_4_ = fVar300 * fVar381;
    auVar31._24_4_ = fVar303 * fVar385;
    auVar31._28_4_ = auVar139._28_4_;
    fVar224 = auVar30._0_4_;
    fVar245 = auVar30._4_4_;
    auVar394._4_4_ = fVar378 * fVar245;
    auVar394._0_4_ = fVar372 * fVar224;
    fVar233 = auVar30._8_4_;
    auVar394._8_4_ = fVar380 * fVar233;
    fVar249 = auVar30._12_4_;
    auVar394._12_4_ = fVar382 * fVar249;
    fVar338 = auVar30._16_4_;
    auVar394._16_4_ = fVar384 * fVar338;
    fVar351 = auVar30._20_4_;
    auVar394._20_4_ = fVar386 * fVar351;
    fVar387 = auVar30._24_4_;
    auVar394._24_4_ = fVar388 * fVar387;
    auVar394._28_4_ = fStack_8a4;
    auVar31 = vsubps_avx(auVar394,auVar31);
    auVar419._4_4_ = fVar314 * fVar245;
    auVar419._0_4_ = fVar307 * fVar224;
    auVar419._8_4_ = fVar316 * fVar233;
    auVar419._12_4_ = fVar318 * fVar249;
    auVar419._16_4_ = fVar320 * fVar338;
    auVar419._20_4_ = fVar322 * fVar351;
    auVar419._24_4_ = fVar324 * fVar387;
    auVar419._28_4_ = fStack_8a4;
    auVar27._4_4_ = fVar289 * fVar241;
    auVar27._0_4_ = fVar274 * fVar208;
    auVar27._8_4_ = fVar291 * fVar230;
    auVar27._12_4_ = fVar294 * fVar247;
    auVar27._16_4_ = fVar297 * fVar334;
    auVar27._20_4_ = fVar300 * fVar379;
    auVar27._24_4_ = fVar303 * fVar383;
    auVar27._28_4_ = fVar184;
    auVar394 = vsubps_avx(auVar27,auVar419);
    fVar126 = auVar394._28_4_;
    fVar246 = auVar31._28_4_ + fVar126;
    auVar202._0_4_ = fVar224 * fVar224 + fVar208 * fVar208 + fVar210 * fVar210;
    auVar202._4_4_ = fVar245 * fVar245 + fVar241 * fVar241 + fVar243 * fVar243;
    auVar202._8_4_ = fVar233 * fVar233 + fVar230 * fVar230 + fVar231 * fVar231;
    auVar202._12_4_ = fVar249 * fVar249 + fVar247 * fVar247 + fVar248 * fVar248;
    auVar202._16_4_ = fVar338 * fVar338 + fVar334 * fVar334 + fVar336 * fVar336;
    auVar202._20_4_ = fVar351 * fVar351 + fVar379 * fVar379 + fVar381 * fVar381;
    auVar202._24_4_ = fVar387 * fVar387 + fVar383 * fVar383 + fVar385 * fVar385;
    auVar202._28_4_ = fVar126 + fVar126 + fVar246;
    auVar111 = vrcpps_avx(auVar202);
    fVar126 = auVar111._0_4_;
    fVar327 = auVar111._4_4_;
    auVar33._4_4_ = fVar327 * auVar202._4_4_;
    auVar33._0_4_ = fVar126 * auVar202._0_4_;
    fVar330 = auVar111._8_4_;
    auVar33._8_4_ = fVar330 * auVar202._8_4_;
    fVar332 = auVar111._12_4_;
    auVar33._12_4_ = fVar332 * auVar202._12_4_;
    fVar340 = auVar111._16_4_;
    auVar33._16_4_ = fVar340 * auVar202._16_4_;
    fVar371 = auVar111._20_4_;
    auVar33._20_4_ = fVar371 * auVar202._20_4_;
    fVar377 = auVar111._24_4_;
    auVar33._24_4_ = fVar377 * auVar202._24_4_;
    auVar33._28_4_ = fVar184;
    auVar355._8_4_ = 0x3f800000;
    auVar355._0_8_ = 0x3f8000003f800000;
    auVar355._12_4_ = 0x3f800000;
    auVar355._16_4_ = 0x3f800000;
    auVar355._20_4_ = 0x3f800000;
    auVar355._24_4_ = 0x3f800000;
    auVar355._28_4_ = 0x3f800000;
    auVar419 = vsubps_avx(auVar355,auVar33);
    fVar126 = auVar419._0_4_ * fVar126 + fVar126;
    fVar327 = auVar419._4_4_ * fVar327 + fVar327;
    fVar330 = auVar419._8_4_ * fVar330 + fVar330;
    fVar332 = auVar419._12_4_ * fVar332 + fVar332;
    fVar340 = auVar419._16_4_ * fVar340 + fVar340;
    fVar371 = auVar419._20_4_ * fVar371 + fVar371;
    fVar377 = auVar419._24_4_ * fVar377 + fVar377;
    auVar112 = vperm2f128_avx(auVar395,auVar395,1);
    auVar112 = vshufps_avx(auVar112,auVar395,0x30);
    auVar112 = vshufps_avx(auVar395,auVar112,0x29);
    auVar28 = vperm2f128_avx(auVar32,auVar32,1);
    auVar28 = vshufps_avx(auVar28,auVar32,0x30);
    auVar395 = vshufps_avx(auVar32,auVar28,0x29);
    fVar352 = auVar395._0_4_;
    fVar358 = auVar395._4_4_;
    auVar34._4_4_ = fVar358 * fVar241;
    auVar34._0_4_ = fVar352 * fVar208;
    fVar360 = auVar395._8_4_;
    auVar34._8_4_ = fVar360 * fVar230;
    fVar362 = auVar395._12_4_;
    auVar34._12_4_ = fVar362 * fVar247;
    fVar364 = auVar395._16_4_;
    auVar34._16_4_ = fVar364 * fVar334;
    fVar366 = auVar395._20_4_;
    auVar34._20_4_ = fVar366 * fVar379;
    fVar368 = auVar395._24_4_;
    auVar34._24_4_ = fVar368 * fVar383;
    auVar34._28_4_ = auVar28._28_4_;
    fVar308 = auVar112._0_4_;
    fVar315 = auVar112._4_4_;
    auVar35._4_4_ = fVar315 * fVar243;
    auVar35._0_4_ = fVar308 * fVar210;
    fVar317 = auVar112._8_4_;
    auVar35._8_4_ = fVar317 * fVar231;
    fVar319 = auVar112._12_4_;
    auVar35._12_4_ = fVar319 * fVar248;
    fVar321 = auVar112._16_4_;
    auVar35._16_4_ = fVar321 * fVar336;
    fVar323 = auVar112._20_4_;
    auVar35._20_4_ = fVar323 * fVar381;
    fVar325 = auVar112._24_4_;
    auVar35._24_4_ = fVar325 * fVar385;
    auVar35._28_4_ = -auVar201._28_4_;
    auVar28 = vsubps_avx(auVar35,auVar34);
    auVar112 = vperm2f128_avx(_local_940,_local_940,1);
    auVar112 = vshufps_avx(auVar112,_local_940,0x30);
    local_740 = vshufps_avx(_local_940,auVar112,0x29);
    fVar275 = local_740._0_4_;
    fVar290 = local_740._4_4_;
    auVar36._4_4_ = fVar290 * fVar243;
    auVar36._0_4_ = fVar275 * fVar210;
    fVar292 = local_740._8_4_;
    auVar36._8_4_ = fVar292 * fVar231;
    fVar295 = local_740._12_4_;
    auVar36._12_4_ = fVar295 * fVar248;
    fVar298 = local_740._16_4_;
    auVar36._16_4_ = fVar298 * fVar336;
    fVar301 = local_740._20_4_;
    auVar36._20_4_ = fVar301 * fVar381;
    fVar304 = local_740._24_4_;
    auVar36._24_4_ = fVar304 * fVar385;
    auVar36._28_4_ = auVar112._28_4_;
    auVar37._4_4_ = fVar358 * fVar245;
    auVar37._0_4_ = fVar352 * fVar224;
    auVar37._8_4_ = fVar360 * fVar233;
    auVar37._12_4_ = fVar362 * fVar249;
    auVar37._16_4_ = fVar364 * fVar338;
    auVar37._20_4_ = fVar366 * fVar351;
    auVar37._24_4_ = fVar368 * fVar387;
    auVar37._28_4_ = uStack_1c4;
    auVar112 = vsubps_avx(auVar37,auVar36);
    auVar38._4_4_ = fVar315 * fVar245;
    auVar38._0_4_ = fVar308 * fVar224;
    auVar38._8_4_ = fVar317 * fVar233;
    auVar38._12_4_ = fVar319 * fVar249;
    auVar38._16_4_ = fVar321 * fVar338;
    auVar38._20_4_ = fVar323 * fVar351;
    auVar38._24_4_ = fVar325 * fVar387;
    auVar38._28_4_ = uStack_1c4;
    auVar39._4_4_ = fVar290 * fVar241;
    auVar39._0_4_ = fVar275 * fVar208;
    auVar39._8_4_ = fVar292 * fVar230;
    auVar39._12_4_ = fVar295 * fVar247;
    auVar39._16_4_ = fVar298 * fVar334;
    auVar39._20_4_ = fVar301 * fVar379;
    auVar39._24_4_ = fVar304 * fVar383;
    auVar39._28_4_ = fStack_204;
    auVar32 = vsubps_avx(auVar39,auVar38);
    auVar40._4_4_ =
         (auVar420._4_4_ * auVar420._4_4_ +
         auVar31._4_4_ * auVar31._4_4_ + auVar394._4_4_ * auVar394._4_4_) * fVar327;
    auVar40._0_4_ =
         (auVar420._0_4_ * auVar420._0_4_ +
         auVar31._0_4_ * auVar31._0_4_ + auVar394._0_4_ * auVar394._0_4_) * fVar126;
    auVar40._8_4_ =
         (auVar420._8_4_ * auVar420._8_4_ +
         auVar31._8_4_ * auVar31._8_4_ + auVar394._8_4_ * auVar394._8_4_) * fVar330;
    auVar40._12_4_ =
         (auVar420._12_4_ * auVar420._12_4_ +
         auVar31._12_4_ * auVar31._12_4_ + auVar394._12_4_ * auVar394._12_4_) * fVar332;
    auVar40._16_4_ =
         (auVar420._16_4_ * auVar420._16_4_ +
         auVar31._16_4_ * auVar31._16_4_ + auVar394._16_4_ * auVar394._16_4_) * fVar340;
    auVar40._20_4_ =
         (auVar420._20_4_ * auVar420._20_4_ +
         auVar31._20_4_ * auVar31._20_4_ + auVar394._20_4_ * auVar394._20_4_) * fVar371;
    auVar40._24_4_ =
         (auVar420._24_4_ * auVar420._24_4_ +
         auVar31._24_4_ * auVar31._24_4_ + auVar394._24_4_ * auVar394._24_4_) * fVar377;
    auVar40._28_4_ = auVar420._28_4_ + fVar246;
    auVar41._4_4_ =
         (auVar28._4_4_ * auVar28._4_4_ +
         auVar112._4_4_ * auVar112._4_4_ + auVar32._4_4_ * auVar32._4_4_) * fVar327;
    auVar41._0_4_ =
         (auVar28._0_4_ * auVar28._0_4_ +
         auVar112._0_4_ * auVar112._0_4_ + auVar32._0_4_ * auVar32._0_4_) * fVar126;
    auVar41._8_4_ =
         (auVar28._8_4_ * auVar28._8_4_ +
         auVar112._8_4_ * auVar112._8_4_ + auVar32._8_4_ * auVar32._8_4_) * fVar330;
    auVar41._12_4_ =
         (auVar28._12_4_ * auVar28._12_4_ +
         auVar112._12_4_ * auVar112._12_4_ + auVar32._12_4_ * auVar32._12_4_) * fVar332;
    auVar41._16_4_ =
         (auVar28._16_4_ * auVar28._16_4_ +
         auVar112._16_4_ * auVar112._16_4_ + auVar32._16_4_ * auVar32._16_4_) * fVar340;
    auVar41._20_4_ =
         (auVar28._20_4_ * auVar28._20_4_ +
         auVar112._20_4_ * auVar112._20_4_ + auVar32._20_4_ * auVar32._20_4_) * fVar371;
    auVar41._24_4_ =
         (auVar28._24_4_ * auVar28._24_4_ +
         auVar112._24_4_ * auVar112._24_4_ + auVar32._24_4_ * auVar32._24_4_) * fVar377;
    auVar41._28_4_ = auVar419._28_4_ + auVar111._28_4_;
    auVar111 = vmaxps_avx(auVar40,auVar41);
    auVar112 = vperm2f128_avx(local_780,local_780,1);
    auVar112 = vshufps_avx(auVar112,local_780,0x30);
    auVar420 = vshufps_avx(local_780,auVar112,0x29);
    auVar113._0_4_ = (float)local_780._0_4_ + fVar227;
    auVar113._4_4_ = local_780._4_4_ + fVar226;
    auVar113._8_4_ = local_780._8_4_ + fVar229;
    auVar113._12_4_ = local_780._12_4_ + fVar244;
    auVar113._16_4_ = local_780._16_4_ + fVar225;
    auVar113._20_4_ = local_780._20_4_ + fVar232;
    auVar113._24_4_ = local_780._24_4_ + fVar228;
    auVar113._28_4_ = local_780._28_4_ + fVar242;
    auVar112 = vmaxps_avx(local_780,auVar113);
    auVar28 = vmaxps_avx(auVar26,auVar420);
    auVar112 = vmaxps_avx(auVar112,auVar28);
    auVar28 = vrsqrtps_avx(auVar202);
    fVar126 = auVar28._0_4_;
    fVar225 = auVar28._4_4_;
    fVar227 = auVar28._8_4_;
    fVar232 = auVar28._12_4_;
    fVar226 = auVar28._16_4_;
    fVar228 = auVar28._20_4_;
    fVar229 = auVar28._24_4_;
    auVar42._4_4_ = fVar225 * fVar225 * fVar225 * auVar202._4_4_ * 0.5;
    auVar42._0_4_ = fVar126 * fVar126 * fVar126 * auVar202._0_4_ * 0.5;
    auVar42._8_4_ = fVar227 * fVar227 * fVar227 * auVar202._8_4_ * 0.5;
    auVar42._12_4_ = fVar232 * fVar232 * fVar232 * auVar202._12_4_ * 0.5;
    auVar42._16_4_ = fVar226 * fVar226 * fVar226 * auVar202._16_4_ * 0.5;
    auVar42._20_4_ = fVar228 * fVar228 * fVar228 * auVar202._20_4_ * 0.5;
    auVar42._24_4_ = fVar229 * fVar229 * fVar229 * auVar202._24_4_ * 0.5;
    auVar42._28_4_ = auVar202._28_4_;
    auVar43._4_4_ = fVar225 * 1.5;
    auVar43._0_4_ = fVar126 * 1.5;
    auVar43._8_4_ = fVar227 * 1.5;
    auVar43._12_4_ = fVar232 * 1.5;
    auVar43._16_4_ = fVar226 * 1.5;
    auVar43._20_4_ = fVar228 * 1.5;
    auVar43._24_4_ = fVar229 * 1.5;
    auVar43._28_4_ = auVar28._28_4_;
    auVar31 = vsubps_avx(auVar43,auVar42);
    auVar312 = ZEXT3264(auVar31);
    auVar79._4_4_ = fVar331;
    auVar79._0_4_ = fVar328;
    auVar79._8_4_ = fVar333;
    auVar79._12_4_ = fVar335;
    auVar79._16_4_ = fVar337;
    auVar79._20_4_ = fVar339;
    auVar79._24_4_ = fVar341;
    auVar79._28_4_ = fVar343;
    local_8e0 = vsubps_avx(ZEXT832(0) << 0x20,auVar79);
    auVar77._4_4_ = fVar178;
    auVar77._0_4_ = fVar154;
    auVar77._8_4_ = fVar179;
    auVar77._12_4_ = fVar180;
    auVar77._16_4_ = fVar181;
    auVar77._20_4_ = fVar182;
    auVar77._24_4_ = fVar183;
    auVar77._28_4_ = fVar184;
    auVar394 = vsubps_avx(ZEXT832(0) << 0x20,auVar77);
    fVar225 = auVar394._0_4_;
    fVar226 = auVar394._4_4_;
    fVar242 = auVar394._8_4_;
    fVar327 = auVar394._12_4_;
    fVar340 = auVar394._16_4_;
    fVar399 = auVar394._20_4_;
    fVar406 = auVar394._24_4_;
    fVar227 = local_8e0._0_4_;
    fVar228 = local_8e0._4_4_;
    fVar244 = local_8e0._8_4_;
    fVar330 = local_8e0._12_4_;
    fVar371 = local_8e0._16_4_;
    fVar401 = local_8e0._20_4_;
    fVar389 = local_8e0._24_4_;
    auVar81._4_4_ = fStack_8bc;
    auVar81._0_4_ = local_8c0;
    auVar81._8_4_ = fStack_8b8;
    auVar81._12_4_ = fStack_8b4;
    auVar81._16_4_ = fStack_8b0;
    auVar81._20_4_ = fStack_8ac;
    auVar81._24_4_ = fStack_8a8;
    auVar81._28_4_ = fStack_8a4;
    auVar419 = vsubps_avx(ZEXT832(0) << 0x20,auVar81);
    fVar232 = auVar419._0_4_;
    fVar229 = auVar419._4_4_;
    fVar246 = auVar419._8_4_;
    fVar332 = auVar419._12_4_;
    fVar377 = auVar419._16_4_;
    fVar404 = auVar419._20_4_;
    fVar409 = auVar419._24_4_;
    auVar392._0_4_ =
         fVar124 * fVar232 + (float)local_7a0._0_4_ * fVar227 + (float)local_920._0_4_ * fVar225;
    auVar392._4_4_ =
         fVar124 * fVar229 + (float)local_7a0._4_4_ * fVar228 + (float)local_920._4_4_ * fVar226;
    auVar392._8_4_ = fVar124 * fVar246 + fStack_798 * fVar244 + fStack_918 * fVar242;
    auVar392._12_4_ = fVar124 * fVar332 + fStack_794 * fVar330 + fStack_914 * fVar327;
    auVar392._16_4_ = fVar124 * fVar377 + fStack_790 * fVar371 + fStack_910 * fVar340;
    auVar392._20_4_ = fVar124 * fVar404 + fStack_78c * fVar401 + fStack_90c * fVar399;
    auVar392._24_4_ = fVar124 * fVar409 + fStack_788 * fVar389 + fStack_908 * fVar406;
    auVar392._28_4_ = fStack_204 + auVar32._28_4_ + auVar28._28_4_;
    auVar412._0_4_ = fVar232 * fVar232 + fVar227 * fVar227 + fVar225 * fVar225;
    auVar412._4_4_ = fVar229 * fVar229 + fVar228 * fVar228 + fVar226 * fVar226;
    auVar412._8_4_ = fVar246 * fVar246 + fVar244 * fVar244 + fVar242 * fVar242;
    auVar412._12_4_ = fVar332 * fVar332 + fVar330 * fVar330 + fVar327 * fVar327;
    auVar412._16_4_ = fVar377 * fVar377 + fVar371 * fVar371 + fVar340 * fVar340;
    auVar412._20_4_ = fVar404 * fVar404 + fVar401 * fVar401 + fVar399 * fVar399;
    auVar412._24_4_ = fVar409 * fVar409 + fVar389 * fVar389 + fVar406 * fVar406;
    auVar412._28_4_ = local_780._28_4_ + local_780._28_4_ + fStack_204;
    fVar408 = auVar31._0_4_;
    fVar264 = auVar31._4_4_;
    fVar266 = auVar31._8_4_;
    fVar268 = auVar31._12_4_;
    fVar269 = auVar31._16_4_;
    fVar271 = auVar31._20_4_;
    fVar273 = auVar31._24_4_;
    fVar126 = fStack_784 + auVar29._28_4_;
    local_500 = fVar124 * fVar224 * fVar408 +
                fVar408 * fVar208 * (float)local_7a0._0_4_ +
                (float)local_920._0_4_ * fVar408 * fVar210;
    fStack_4fc = fVar124 * fVar245 * fVar264 +
                 fVar264 * fVar241 * (float)local_7a0._4_4_ +
                 (float)local_920._4_4_ * fVar264 * fVar243;
    fStack_4f8 = fVar124 * fVar233 * fVar266 +
                 fVar266 * fVar230 * fStack_798 + fStack_918 * fVar266 * fVar231;
    fStack_4f4 = fVar124 * fVar249 * fVar268 +
                 fVar268 * fVar247 * fStack_794 + fStack_914 * fVar268 * fVar248;
    fStack_4f0 = fVar124 * fVar338 * fVar269 +
                 fVar269 * fVar334 * fStack_790 + fStack_910 * fVar269 * fVar336;
    fStack_4ec = fVar124 * fVar351 * fVar271 +
                 fVar271 * fVar379 * fStack_78c + fStack_90c * fVar271 * fVar381;
    fStack_4e8 = fVar124 * fVar387 * fVar273 +
                 fVar273 * fVar383 * fStack_788 + fStack_908 * fVar273 * fVar385;
    fStack_4e4 = fVar124 + fVar126;
    fVar126 = fVar124 + fVar126;
    fVar353 = fVar232 * fVar224 * fVar408 +
              fVar408 * fVar208 * fVar227 + fVar408 * fVar210 * fVar225;
    fVar359 = fVar229 * fVar245 * fVar264 +
              fVar264 * fVar241 * fVar228 + fVar264 * fVar243 * fVar226;
    fVar361 = fVar246 * fVar233 * fVar266 +
              fVar266 * fVar230 * fVar244 + fVar266 * fVar231 * fVar242;
    fVar363 = fVar332 * fVar249 * fVar268 +
              fVar268 * fVar247 * fVar330 + fVar268 * fVar248 * fVar327;
    fVar365 = fVar377 * fVar338 * fVar269 +
              fVar269 * fVar334 * fVar371 + fVar269 * fVar336 * fVar340;
    fVar367 = fVar404 * fVar351 * fVar271 +
              fVar271 * fVar379 * fVar401 + fVar271 * fVar381 * fVar399;
    fVar369 = fVar409 * fVar387 * fVar273 +
              fVar273 * fVar383 * fVar389 + fVar273 * fVar385 * fVar406;
    fVar370 = fStack_784 + fVar126;
    auVar29._4_4_ = fVar359 * fStack_4fc;
    auVar29._0_4_ = fVar353 * local_500;
    auVar29._8_4_ = fVar361 * fStack_4f8;
    auVar29._12_4_ = fVar363 * fStack_4f4;
    auVar29._16_4_ = fVar365 * fStack_4f0;
    auVar29._20_4_ = fVar367 * fStack_4ec;
    auVar29._24_4_ = fVar369 * fStack_4e8;
    auVar29._28_4_ = fVar126;
    auVar29 = vsubps_avx(auVar392,auVar29);
    auVar44._4_4_ = fVar359 * fVar359;
    auVar44._0_4_ = fVar353 * fVar353;
    auVar44._8_4_ = fVar361 * fVar361;
    auVar44._12_4_ = fVar363 * fVar363;
    auVar44._16_4_ = fVar365 * fVar365;
    auVar44._20_4_ = fVar367 * fVar367;
    auVar44._24_4_ = fVar369 * fVar369;
    auVar44._28_4_ = fStack_784;
    auVar31 = vsubps_avx(auVar412,auVar44);
    auVar28 = vsqrtps_avx(auVar111);
    fVar126 = (auVar112._0_4_ + auVar28._0_4_) * 1.0000002;
    fVar398 = (auVar112._4_4_ + auVar28._4_4_) * 1.0000002;
    fVar151 = (auVar112._8_4_ + auVar28._8_4_) * 1.0000002;
    fVar400 = (auVar112._12_4_ + auVar28._12_4_) * 1.0000002;
    fVar403 = (auVar112._16_4_ + auVar28._16_4_) * 1.0000002;
    fVar405 = (auVar112._20_4_ + auVar28._20_4_) * 1.0000002;
    fVar407 = (auVar112._24_4_ + auVar28._24_4_) * 1.0000002;
    auVar45._4_4_ = fVar398 * fVar398;
    auVar45._0_4_ = fVar126 * fVar126;
    auVar45._8_4_ = fVar151 * fVar151;
    auVar45._12_4_ = fVar400 * fVar400;
    auVar45._16_4_ = fVar403 * fVar403;
    auVar45._20_4_ = fVar405 * fVar405;
    auVar45._24_4_ = fVar407 * fVar407;
    auVar45._28_4_ = auVar112._28_4_ + auVar28._28_4_;
    fVar410 = auVar29._0_4_ + auVar29._0_4_;
    fVar417 = auVar29._4_4_ + auVar29._4_4_;
    auVar413._0_8_ = CONCAT44(fVar417,fVar410);
    auVar413._8_4_ = auVar29._8_4_ + auVar29._8_4_;
    auVar413._12_4_ = auVar29._12_4_ + auVar29._12_4_;
    auVar413._16_4_ = auVar29._16_4_ + auVar29._16_4_;
    auVar413._20_4_ = auVar29._20_4_ + auVar29._20_4_;
    auVar413._24_4_ = auVar29._24_4_ + auVar29._24_4_;
    fVar126 = auVar29._28_4_;
    auVar413._28_4_ = fVar126 + fVar126;
    auVar29 = vsubps_avx(auVar31,auVar45);
    auVar46._4_4_ = fStack_4fc * fStack_4fc;
    auVar46._0_4_ = local_500 * local_500;
    auVar46._8_4_ = fStack_4f8 * fStack_4f8;
    auVar46._12_4_ = fStack_4f4 * fStack_4f4;
    auVar46._16_4_ = fStack_4f0 * fStack_4f0;
    auVar46._20_4_ = fStack_4ec * fStack_4ec;
    auVar46._24_4_ = fStack_4e8 * fStack_4e8;
    auVar46._28_4_ = local_8e0._28_4_;
    local_4e0 = vsubps_avx(local_280,auVar46);
    auVar47._4_4_ = fVar417 * fVar417;
    auVar47._0_4_ = fVar410 * fVar410;
    auVar47._8_4_ = auVar413._8_4_ * auVar413._8_4_;
    auVar47._12_4_ = auVar413._12_4_ * auVar413._12_4_;
    auVar47._16_4_ = auVar413._16_4_ * auVar413._16_4_;
    auVar47._20_4_ = auVar413._20_4_ * auVar413._20_4_;
    auVar47._24_4_ = auVar413._24_4_ * auVar413._24_4_;
    auVar47._28_4_ = fVar126;
    fVar398 = local_4e0._0_4_;
    fVar151 = local_4e0._4_4_;
    fVar400 = local_4e0._8_4_;
    fVar403 = local_4e0._12_4_;
    fVar405 = local_4e0._16_4_;
    fVar407 = local_4e0._20_4_;
    fVar342 = local_4e0._24_4_;
    auVar48._4_4_ = auVar29._4_4_ * fVar151 * 4.0;
    auVar48._0_4_ = auVar29._0_4_ * fVar398 * 4.0;
    auVar48._8_4_ = auVar29._8_4_ * fVar400 * 4.0;
    auVar48._12_4_ = auVar29._12_4_ * fVar403 * 4.0;
    auVar48._16_4_ = auVar29._16_4_ * fVar405 * 4.0;
    auVar48._20_4_ = auVar29._20_4_ * fVar407 * 4.0;
    auVar48._24_4_ = auVar29._24_4_ * fVar342 * 4.0;
    auVar48._28_4_ = 0x40800000;
    auVar32 = vsubps_avx(auVar47,auVar48);
    auVar111 = vcmpps_avx(auVar32,ZEXT432(0) << 0x20,5);
    fVar126 = local_4e0._28_4_;
    if ((((((((auVar111 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar111 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar111 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar111 >> 0x7f,0) == '\0') &&
          (auVar111 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar111 >> 0xbf,0) == '\0') &&
        (auVar111 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar111[0x1f])
    {
      auVar356._8_4_ = 0x7f800000;
      auVar356._0_8_ = 0x7f8000007f800000;
      auVar356._12_4_ = 0x7f800000;
      auVar356._16_4_ = 0x7f800000;
      auVar356._20_4_ = 0x7f800000;
      auVar356._24_4_ = 0x7f800000;
      auVar356._28_4_ = 0x7f800000;
      auVar414._8_4_ = 0xff800000;
      auVar414._0_8_ = 0xff800000ff800000;
      auVar414._12_4_ = 0xff800000;
      auVar414._16_4_ = 0xff800000;
      auVar414._20_4_ = 0xff800000;
      auVar414._24_4_ = 0xff800000;
      auVar414._28_4_ = 0xff800000;
    }
    else {
      auVar112 = vcmpps_avx(auVar32,ZEXT432(0) << 0x20,5);
      auVar27 = vsqrtps_avx(auVar32);
      auVar257._0_4_ = fVar398 + fVar398;
      auVar257._4_4_ = fVar151 + fVar151;
      auVar257._8_4_ = fVar400 + fVar400;
      auVar257._12_4_ = fVar403 + fVar403;
      auVar257._16_4_ = fVar405 + fVar405;
      auVar257._20_4_ = fVar407 + fVar407;
      auVar257._24_4_ = fVar342 + fVar342;
      auVar257._28_4_ = fVar126 + fVar126;
      auVar32 = vrcpps_avx(auVar257);
      fVar250 = auVar32._0_4_;
      fVar263 = auVar32._4_4_;
      auVar49._4_4_ = auVar257._4_4_ * fVar263;
      auVar49._0_4_ = auVar257._0_4_ * fVar250;
      fVar265 = auVar32._8_4_;
      auVar49._8_4_ = auVar257._8_4_ * fVar265;
      fVar267 = auVar32._12_4_;
      auVar49._12_4_ = auVar257._12_4_ * fVar267;
      fVar209 = auVar32._16_4_;
      auVar49._16_4_ = auVar257._16_4_ * fVar209;
      fVar270 = auVar32._20_4_;
      auVar49._20_4_ = auVar257._20_4_ * fVar270;
      fVar272 = auVar32._24_4_;
      auVar49._24_4_ = auVar257._24_4_ * fVar272;
      auVar49._28_4_ = auVar257._28_4_;
      auVar170._8_4_ = 0x3f800000;
      auVar170._0_8_ = 0x3f8000003f800000;
      auVar170._12_4_ = 0x3f800000;
      auVar170._16_4_ = 0x3f800000;
      auVar170._20_4_ = 0x3f800000;
      auVar170._24_4_ = 0x3f800000;
      auVar170._28_4_ = 0x3f800000;
      auVar33 = vsubps_avx(auVar170,auVar49);
      fVar250 = fVar250 + fVar250 * auVar33._0_4_;
      fVar263 = fVar263 + fVar263 * auVar33._4_4_;
      fVar265 = fVar265 + fVar265 * auVar33._8_4_;
      fVar267 = fVar267 + fVar267 * auVar33._12_4_;
      fVar209 = fVar209 + fVar209 * auVar33._16_4_;
      fVar270 = fVar270 + fVar270 * auVar33._20_4_;
      fVar272 = fVar272 + fVar272 * auVar33._24_4_;
      auVar283._0_8_ = CONCAT44(fVar417,fVar410) ^ 0x8000000080000000;
      auVar283._8_4_ = -auVar413._8_4_;
      auVar283._12_4_ = -auVar413._12_4_;
      auVar283._16_4_ = -auVar413._16_4_;
      auVar283._20_4_ = -auVar413._20_4_;
      auVar283._24_4_ = -auVar413._24_4_;
      auVar283._28_4_ = -auVar413._28_4_;
      auVar34 = vsubps_avx(auVar283,auVar27);
      fVar410 = auVar34._0_4_ * fVar250;
      fVar417 = auVar34._4_4_ * fVar263;
      auVar50._4_4_ = fVar417;
      auVar50._0_4_ = fVar410;
      fVar293 = auVar34._8_4_ * fVar265;
      auVar50._8_4_ = fVar293;
      fVar296 = auVar34._12_4_ * fVar267;
      auVar50._12_4_ = fVar296;
      fVar299 = auVar34._16_4_ * fVar209;
      auVar50._16_4_ = fVar299;
      fVar302 = auVar34._20_4_ * fVar270;
      auVar50._20_4_ = fVar302;
      fVar305 = auVar34._24_4_ * fVar272;
      auVar50._24_4_ = fVar305;
      auVar50._28_4_ = auVar34._28_4_;
      auVar27 = vsubps_avx(auVar27,auVar413);
      fVar250 = auVar27._0_4_ * fVar250;
      fVar263 = auVar27._4_4_ * fVar263;
      auVar51._4_4_ = fVar263;
      auVar51._0_4_ = fVar250;
      fVar265 = auVar27._8_4_ * fVar265;
      auVar51._8_4_ = fVar265;
      fVar267 = auVar27._12_4_ * fVar267;
      auVar51._12_4_ = fVar267;
      fVar209 = auVar27._16_4_ * fVar209;
      auVar51._16_4_ = fVar209;
      fVar270 = auVar27._20_4_ * fVar270;
      auVar51._20_4_ = fVar270;
      fVar272 = auVar27._24_4_ * fVar272;
      auVar51._24_4_ = fVar272;
      auVar51._28_4_ = auVar27._28_4_;
      local_2e0 = fVar408 * (fVar353 + local_500 * fVar410);
      fStack_2dc = fVar264 * (fVar359 + fStack_4fc * fVar417);
      fStack_2d8 = fVar266 * (fVar361 + fStack_4f8 * fVar293);
      fStack_2d4 = fVar268 * (fVar363 + fStack_4f4 * fVar296);
      fStack_2d0 = fVar269 * (fVar365 + fStack_4f0 * fVar299);
      fStack_2cc = fVar271 * (fVar367 + fStack_4ec * fVar302);
      fStack_2c8 = fVar273 * (fVar369 + fStack_4e8 * fVar305);
      fStack_2c4 = fVar370 + auVar32._28_4_ + auVar33._28_4_;
      auVar347._8_4_ = 0x7fffffff;
      auVar347._0_8_ = 0x7fffffff7fffffff;
      auVar347._12_4_ = 0x7fffffff;
      auVar347._16_4_ = 0x7fffffff;
      auVar347._20_4_ = 0x7fffffff;
      auVar347._24_4_ = 0x7fffffff;
      auVar347._28_4_ = 0x7fffffff;
      auVar32 = vandps_avx(auVar347,auVar46);
      auVar27 = vmaxps_avx(local_4c0,auVar32);
      auVar52._4_4_ = auVar27._4_4_ * 1.9073486e-06;
      auVar52._0_4_ = auVar27._0_4_ * 1.9073486e-06;
      auVar52._8_4_ = auVar27._8_4_ * 1.9073486e-06;
      auVar52._12_4_ = auVar27._12_4_ * 1.9073486e-06;
      auVar52._16_4_ = auVar27._16_4_ * 1.9073486e-06;
      auVar52._20_4_ = auVar27._20_4_ * 1.9073486e-06;
      auVar52._24_4_ = auVar27._24_4_ * 1.9073486e-06;
      auVar52._28_4_ = auVar27._28_4_;
      auVar32 = vandps_avx(local_4e0,auVar347);
      auVar32 = vcmpps_avx(auVar32,auVar52,1);
      auVar348._8_4_ = 0x7f800000;
      auVar348._0_8_ = 0x7f8000007f800000;
      auVar348._12_4_ = 0x7f800000;
      auVar348._16_4_ = 0x7f800000;
      auVar348._20_4_ = 0x7f800000;
      auVar348._24_4_ = 0x7f800000;
      auVar348._28_4_ = 0x7f800000;
      auVar356 = vblendvps_avx(auVar348,auVar50,auVar112);
      local_300 = fVar408 * (fVar353 + local_500 * fVar250);
      fStack_2fc = fVar264 * (fVar359 + fStack_4fc * fVar263);
      fStack_2f8 = fVar266 * (fVar361 + fStack_4f8 * fVar265);
      fStack_2f4 = fVar268 * (fVar363 + fStack_4f4 * fVar267);
      fStack_2f0 = fVar269 * (fVar365 + fStack_4f0 * fVar209);
      fStack_2ec = fVar271 * (fVar367 + fStack_4ec * fVar270);
      fStack_2e8 = fVar273 * (fVar369 + fStack_4e8 * fVar272);
      fStack_2e4 = fVar370 + auVar27._28_4_;
      auVar258._8_4_ = 0xff800000;
      auVar258._0_8_ = 0xff800000ff800000;
      auVar258._12_4_ = 0xff800000;
      auVar258._16_4_ = 0xff800000;
      auVar258._20_4_ = 0xff800000;
      auVar258._24_4_ = 0xff800000;
      auVar258._28_4_ = 0xff800000;
      auVar414 = vblendvps_avx(auVar258,auVar51,auVar112);
      auVar27 = auVar112 & auVar32;
      if ((((((((auVar27 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar27 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar27 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar27 >> 0x7f,0) != '\0') ||
            (auVar27 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar27 >> 0xbf,0) != '\0') ||
          (auVar27 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar27[0x1f] < '\0') {
        auVar111 = vandps_avx(auVar32,auVar112);
        auVar236 = vpackssdw_avx(auVar111._0_16_,auVar111._16_16_);
        auVar32 = vcmpps_avx(auVar29,ZEXT832(0) << 0x20,2);
        auVar396._8_4_ = 0xff800000;
        auVar396._0_8_ = 0xff800000ff800000;
        auVar396._12_4_ = 0xff800000;
        auVar396._16_4_ = 0xff800000;
        auVar396._20_4_ = 0xff800000;
        auVar396._24_4_ = 0xff800000;
        auVar396._28_4_ = 0xff800000;
        auVar421._8_4_ = 0x7f800000;
        auVar421._0_8_ = 0x7f8000007f800000;
        auVar421._12_4_ = 0x7f800000;
        auVar421._16_4_ = 0x7f800000;
        auVar421._20_4_ = 0x7f800000;
        auVar421._24_4_ = 0x7f800000;
        auVar421._28_4_ = 0x7f800000;
        auVar29 = vblendvps_avx(auVar421,auVar396,auVar32);
        auVar166 = vpmovsxwd_avx(auVar236);
        auVar236 = vpunpckhwd_avx(auVar236,auVar236);
        auVar240._16_16_ = auVar236;
        auVar240._0_16_ = auVar166;
        auVar356 = vblendvps_avx(auVar356,auVar29,auVar240);
        auVar29 = vblendvps_avx(auVar396,auVar421,auVar32);
        auVar414 = vblendvps_avx(auVar414,auVar29,auVar240);
        auVar29 = vcmpps_avx(ZEXT1632((undefined1  [16])0x0),ZEXT1632((undefined1  [16])0x0),0xf);
        auVar147._0_4_ = auVar111._0_4_ ^ auVar29._0_4_;
        auVar147._4_4_ = auVar111._4_4_ ^ auVar29._4_4_;
        auVar147._8_4_ = auVar111._8_4_ ^ auVar29._8_4_;
        auVar147._12_4_ = auVar111._12_4_ ^ auVar29._12_4_;
        auVar147._16_4_ = auVar111._16_4_ ^ auVar29._16_4_;
        auVar147._20_4_ = auVar111._20_4_ ^ auVar29._20_4_;
        auVar147._24_4_ = auVar111._24_4_ ^ auVar29._24_4_;
        auVar147._28_4_ = auVar111._28_4_ ^ auVar29._28_4_;
        auVar111 = vorps_avx(auVar32,auVar147);
        auVar111 = vandps_avx(auVar112,auVar111);
      }
    }
    auVar376 = ZEXT3264(auVar112);
    auVar112 = local_2a0 & auVar111;
    if ((((((((auVar112 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar112 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar112 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar112 >> 0x7f,0) != '\0') ||
          (auVar112 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar112 >> 0xbf,0) != '\0') ||
        (auVar112 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        auVar112[0x1f] < '\0') {
      local_530 = ZEXT416((uint)*(float *)(ray + k * 4 + 0x80));
      auVar236 = ZEXT416((uint)(*(float *)(ray + k * 4 + 0x80) - (float)local_850._0_4_));
      auVar236 = vshufps_avx(auVar236,auVar236,0);
      auVar239._16_16_ = auVar236;
      auVar239._0_16_ = auVar236;
      auVar32 = vminps_avx(auVar239,auVar414);
      fVar209 = local_8e0._28_4_ + auVar394._28_4_;
      auVar171._0_4_ =
           fVar124 * fVar274 + (float)local_7a0._0_4_ * fVar307 + (float)local_920._0_4_ * fVar372;
      auVar171._4_4_ =
           fVar124 * fVar289 + (float)local_7a0._4_4_ * fVar314 + (float)local_920._4_4_ * fVar378;
      auVar171._8_4_ = fVar124 * fVar291 + fStack_798 * fVar316 + fStack_918 * fVar380;
      auVar171._12_4_ = fVar124 * fVar294 + fStack_794 * fVar318 + fStack_914 * fVar382;
      auVar171._16_4_ = fVar124 * fVar297 + fStack_790 * fVar320 + fStack_910 * fVar384;
      auVar171._20_4_ = fVar124 * fVar300 + fStack_78c * fVar322 + fStack_90c * fVar386;
      auVar171._24_4_ = fVar124 * fVar303 + fStack_788 * fVar324 + fStack_908 * fVar388;
      auVar171._28_4_ = fVar209 + fVar326 + fVar209;
      auVar112 = vrcpps_avx(auVar171);
      fVar326 = auVar112._0_4_;
      fVar410 = auVar112._4_4_;
      auVar53._4_4_ = auVar171._4_4_ * fVar410;
      auVar53._0_4_ = auVar171._0_4_ * fVar326;
      fVar417 = auVar112._8_4_;
      auVar53._8_4_ = auVar171._8_4_ * fVar417;
      fVar250 = auVar112._12_4_;
      auVar53._12_4_ = auVar171._12_4_ * fVar250;
      fVar263 = auVar112._16_4_;
      auVar53._16_4_ = auVar171._16_4_ * fVar263;
      fVar265 = auVar112._20_4_;
      auVar53._20_4_ = auVar171._20_4_ * fVar265;
      fVar267 = auVar112._24_4_;
      auVar53._24_4_ = auVar171._24_4_ * fVar267;
      auVar53._28_4_ = fVar306;
      auVar393._8_4_ = 0x3f800000;
      auVar393._0_8_ = 0x3f8000003f800000;
      auVar393._12_4_ = 0x3f800000;
      auVar393._16_4_ = 0x3f800000;
      auVar393._20_4_ = 0x3f800000;
      auVar393._24_4_ = 0x3f800000;
      auVar393._28_4_ = 0x3f800000;
      auVar394 = vsubps_avx(auVar393,auVar53);
      auVar284._8_4_ = 0x7fffffff;
      auVar284._0_8_ = 0x7fffffff7fffffff;
      auVar284._12_4_ = 0x7fffffff;
      auVar284._16_4_ = 0x7fffffff;
      auVar284._20_4_ = 0x7fffffff;
      auVar284._24_4_ = 0x7fffffff;
      auVar284._28_4_ = 0x7fffffff;
      auVar112 = vandps_avx(auVar171,auVar284);
      auVar418._8_4_ = 0x219392ef;
      auVar418._0_8_ = 0x219392ef219392ef;
      auVar418._12_4_ = 0x219392ef;
      auVar418._16_4_ = 0x219392ef;
      auVar418._20_4_ = 0x219392ef;
      auVar418._24_4_ = 0x219392ef;
      auVar418._28_4_ = 0x219392ef;
      auVar29 = vcmpps_avx(auVar112,auVar418,1);
      auVar54._4_4_ =
           (fVar410 + fVar410 * auVar394._4_4_) *
           -(fVar289 * fVar229 + fVar314 * fVar228 + fVar378 * fVar226);
      auVar54._0_4_ =
           (fVar326 + fVar326 * auVar394._0_4_) *
           -(fVar274 * fVar232 + fVar307 * fVar227 + fVar372 * fVar225);
      auVar54._8_4_ =
           (fVar417 + fVar417 * auVar394._8_4_) *
           -(fVar291 * fVar246 + fVar316 * fVar244 + fVar380 * fVar242);
      auVar54._12_4_ =
           (fVar250 + fVar250 * auVar394._12_4_) *
           -(fVar294 * fVar332 + fVar318 * fVar330 + fVar382 * fVar327);
      auVar54._16_4_ =
           (fVar263 + fVar263 * auVar394._16_4_) *
           -(fVar297 * fVar377 + fVar320 * fVar371 + fVar384 * fVar340);
      auVar54._20_4_ =
           (fVar265 + fVar265 * auVar394._20_4_) *
           -(fVar300 * fVar404 + fVar322 * fVar401 + fVar386 * fVar399);
      auVar54._24_4_ =
           (fVar267 + fVar267 * auVar394._24_4_) *
           -(fVar303 * fVar409 + fVar324 * fVar389 + fVar388 * fVar406);
      auVar54._28_4_ = -(auVar419._28_4_ + fVar209);
      auVar394 = ZEXT1232(ZEXT812(0)) << 0x20;
      auVar112 = vcmpps_avx(auVar171,auVar394,1);
      auVar112 = vorps_avx(auVar29,auVar112);
      auVar357._8_4_ = 0xff800000;
      auVar357._0_8_ = 0xff800000ff800000;
      auVar357._12_4_ = 0xff800000;
      auVar357._16_4_ = 0xff800000;
      auVar357._20_4_ = 0xff800000;
      auVar357._24_4_ = 0xff800000;
      auVar357._28_4_ = 0xff800000;
      auVar112 = vblendvps_avx(auVar54,auVar357,auVar112);
      auVar394 = vcmpps_avx(auVar171,auVar394,6);
      auVar29 = vorps_avx(auVar29,auVar394);
      auVar415._8_4_ = 0x7f800000;
      auVar415._0_8_ = 0x7f8000007f800000;
      auVar415._12_4_ = 0x7f800000;
      auVar415._16_4_ = 0x7f800000;
      auVar415._20_4_ = 0x7f800000;
      auVar415._24_4_ = 0x7f800000;
      auVar415._28_4_ = 0x7f800000;
      auVar29 = vblendvps_avx(auVar54,auVar415,auVar29);
      auVar394 = vmaxps_avx(local_2c0,auVar356);
      auVar394 = vmaxps_avx(auVar394,auVar112);
      auVar29 = vminps_avx(auVar32,auVar29);
      uStack_ae4 = auVar395._28_4_;
      auVar395 = ZEXT1232(ZEXT812(0)) << 0x20;
      auVar112 = vsubps_avx(auVar395,auVar24);
      auVar24 = vsubps_avx(auVar395,auVar25);
      auVar55._4_4_ = auVar24._4_4_ * -fVar358;
      auVar55._0_4_ = auVar24._0_4_ * -fVar352;
      auVar55._8_4_ = auVar24._8_4_ * -fVar360;
      auVar55._12_4_ = auVar24._12_4_ * -fVar362;
      auVar55._16_4_ = auVar24._16_4_ * -fVar364;
      auVar55._20_4_ = auVar24._20_4_ * -fVar366;
      auVar55._24_4_ = auVar24._24_4_ * -fVar368;
      auVar55._28_4_ = auVar24._28_4_;
      auVar56._4_4_ = fVar315 * auVar112._4_4_;
      auVar56._0_4_ = fVar308 * auVar112._0_4_;
      auVar56._8_4_ = fVar317 * auVar112._8_4_;
      auVar56._12_4_ = fVar319 * auVar112._12_4_;
      auVar56._16_4_ = fVar321 * auVar112._16_4_;
      auVar56._20_4_ = fVar323 * auVar112._20_4_;
      auVar56._24_4_ = fVar325 * auVar112._24_4_;
      auVar56._28_4_ = auVar112._28_4_;
      auVar112 = vsubps_avx(auVar55,auVar56);
      auVar24 = vsubps_avx(auVar395,auVar139);
      auVar57._4_4_ = fVar290 * auVar24._4_4_;
      auVar57._0_4_ = fVar275 * auVar24._0_4_;
      auVar57._8_4_ = fVar292 * auVar24._8_4_;
      auVar57._12_4_ = fVar295 * auVar24._12_4_;
      auVar57._16_4_ = fVar298 * auVar24._16_4_;
      auVar57._20_4_ = fVar301 * auVar24._20_4_;
      uVar8 = auVar24._28_4_;
      auVar57._24_4_ = fVar304 * auVar24._24_4_;
      auVar57._28_4_ = uVar8;
      auVar25 = vsubps_avx(auVar112,auVar57);
      auVar58._4_4_ = -fVar358 * (float)local_920._4_4_;
      auVar58._0_4_ = -fVar352 * (float)local_920._0_4_;
      auVar58._8_4_ = -fVar360 * fStack_918;
      auVar58._12_4_ = -fVar362 * fStack_914;
      auVar58._16_4_ = -fVar364 * fStack_910;
      auVar58._20_4_ = -fVar366 * fStack_90c;
      auVar58._24_4_ = -fVar368 * fStack_908;
      auVar58._28_4_ = uStack_ae4 ^ 0x80000000;
      auVar59._4_4_ = (float)local_7a0._4_4_ * fVar315;
      auVar59._0_4_ = (float)local_7a0._0_4_ * fVar308;
      auVar59._8_4_ = fStack_798 * fVar317;
      auVar59._12_4_ = fStack_794 * fVar319;
      auVar59._16_4_ = fStack_790 * fVar321;
      auVar59._20_4_ = fStack_78c * fVar323;
      auVar59._24_4_ = fStack_788 * fVar325;
      auVar59._28_4_ = uVar8;
      auVar112 = vsubps_avx(auVar58,auVar59);
      auVar60._4_4_ = fVar290 * fVar124;
      auVar60._0_4_ = fVar275 * fVar124;
      auVar60._8_4_ = fVar292 * fVar124;
      auVar60._12_4_ = fVar295 * fVar124;
      auVar60._16_4_ = fVar298 * fVar124;
      auVar60._20_4_ = fVar301 * fVar124;
      auVar60._24_4_ = fVar304 * fVar124;
      auVar60._28_4_ = uVar8;
      auVar139 = vsubps_avx(auVar112,auVar60);
      auVar112 = vrcpps_avx(auVar139);
      fVar225 = auVar112._0_4_;
      fVar227 = auVar112._4_4_;
      auVar61._4_4_ = auVar139._4_4_ * fVar227;
      auVar61._0_4_ = auVar139._0_4_ * fVar225;
      fVar232 = auVar112._8_4_;
      auVar61._8_4_ = auVar139._8_4_ * fVar232;
      fVar226 = auVar112._12_4_;
      auVar61._12_4_ = auVar139._12_4_ * fVar226;
      fVar228 = auVar112._16_4_;
      auVar61._16_4_ = auVar139._16_4_ * fVar228;
      fVar229 = auVar112._20_4_;
      auVar61._20_4_ = auVar139._20_4_ * fVar229;
      fVar242 = auVar112._24_4_;
      auVar61._24_4_ = auVar139._24_4_ * fVar242;
      auVar61._28_4_ = fVar124;
      auVar375._8_4_ = 0x3f800000;
      auVar375._0_8_ = 0x3f8000003f800000;
      auVar375._12_4_ = 0x3f800000;
      auVar375._16_4_ = 0x3f800000;
      auVar375._20_4_ = 0x3f800000;
      auVar375._24_4_ = 0x3f800000;
      auVar375._28_4_ = 0x3f800000;
      auVar312 = ZEXT3264(auVar375);
      auVar395 = vsubps_avx(auVar375,auVar61);
      auVar112 = vandps_avx(auVar139,auVar284);
      auVar24 = vcmpps_avx(auVar112,auVar418,1);
      auVar75 = ZEXT812(0);
      auVar419 = ZEXT1232(auVar75) << 0x20;
      auVar62._4_4_ = (fVar227 + fVar227 * auVar395._4_4_) * -auVar25._4_4_;
      auVar62._0_4_ = (fVar225 + fVar225 * auVar395._0_4_) * -auVar25._0_4_;
      auVar62._8_4_ = (fVar232 + fVar232 * auVar395._8_4_) * -auVar25._8_4_;
      auVar62._12_4_ = (fVar226 + fVar226 * auVar395._12_4_) * -auVar25._12_4_;
      auVar62._16_4_ = (fVar228 + fVar228 * auVar395._16_4_) * -auVar25._16_4_;
      auVar62._20_4_ = (fVar229 + fVar229 * auVar395._20_4_) * -auVar25._20_4_;
      auVar62._24_4_ = (fVar242 + fVar242 * auVar395._24_4_) * -auVar25._24_4_;
      auVar62._28_4_ = auVar25._28_4_ ^ 0x80000000;
      auVar112 = vcmpps_avx(auVar139,ZEXT1232(auVar75) << 0x20,1);
      auVar112 = vorps_avx(auVar24,auVar112);
      auVar112 = vblendvps_avx(auVar62,auVar357,auVar112);
      auVar25 = vmaxps_avx(auVar394,auVar112);
      auVar112 = vcmpps_avx(auVar139,ZEXT1232(auVar75) << 0x20,6);
      auVar112 = vorps_avx(auVar24,auVar112);
      auVar112 = vblendvps_avx(auVar62,auVar415,auVar112);
      auVar111 = vandps_avx(local_2a0,auVar111);
      local_320 = vminps_avx(auVar29,auVar112);
      auVar112 = vcmpps_avx(auVar25,local_320,2);
      auVar24 = auVar111 & auVar112;
      if ((((((((auVar24 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar24 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar24 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar24 >> 0x7f,0) != '\0') ||
            (auVar24 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar24 >> 0xbf,0) != '\0') ||
          (auVar24 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar24[0x1f] < '\0') {
        auVar24 = vminps_avx(local_780,auVar113);
        auVar26 = vminps_avx(auVar26,auVar420);
        auVar24 = vminps_avx(auVar24,auVar26);
        auVar28 = vsubps_avx(auVar24,auVar28);
        auVar111 = vandps_avx(auVar112,auVar111);
        auVar83._4_4_ = fStack_2dc;
        auVar83._0_4_ = local_2e0;
        auVar83._8_4_ = fStack_2d8;
        auVar83._12_4_ = fStack_2d4;
        auVar83._16_4_ = fStack_2d0;
        auVar83._20_4_ = fStack_2cc;
        auVar83._24_4_ = fStack_2c8;
        auVar83._28_4_ = fStack_2c4;
        auVar112 = vminps_avx(auVar83,auVar375);
        auVar112 = vmaxps_avx(auVar112,ZEXT832(0) << 0x20);
        local_1a0[0] = fVar96 + fVar125 * (auVar112._0_4_ + 0.0) * 0.125;
        local_1a0[1] = fVar121 + fVar149 * (auVar112._4_4_ + 1.0) * 0.125;
        local_1a0[2] = fVar122 + fVar150 * (auVar112._8_4_ + 2.0) * 0.125;
        local_1a0[3] = fVar123 + fVar153 * (auVar112._12_4_ + 3.0) * 0.125;
        fStack_190 = fVar96 + fVar125 * (auVar112._16_4_ + 4.0) * 0.125;
        fStack_18c = fVar121 + fVar149 * (auVar112._20_4_ + 5.0) * 0.125;
        fStack_188 = fVar122 + fVar150 * (auVar112._24_4_ + 6.0) * 0.125;
        fStack_184 = fVar123 + auVar112._28_4_ + 7.0;
        auVar82._4_4_ = fStack_2fc;
        auVar82._0_4_ = local_300;
        auVar82._8_4_ = fStack_2f8;
        auVar82._12_4_ = fStack_2f4;
        auVar82._16_4_ = fStack_2f0;
        auVar82._20_4_ = fStack_2ec;
        auVar82._24_4_ = fStack_2e8;
        auVar82._28_4_ = fStack_2e4;
        auVar112 = vminps_avx(auVar82,auVar375);
        auVar112 = vmaxps_avx(auVar112,ZEXT832(0) << 0x20);
        local_1c0[0] = fVar96 + fVar125 * (auVar112._0_4_ + 0.0) * 0.125;
        local_1c0[1] = fVar121 + fVar149 * (auVar112._4_4_ + 1.0) * 0.125;
        local_1c0[2] = fVar122 + fVar150 * (auVar112._8_4_ + 2.0) * 0.125;
        local_1c0[3] = fVar123 + fVar153 * (auVar112._12_4_ + 3.0) * 0.125;
        fStack_1b0 = fVar96 + fVar125 * (auVar112._16_4_ + 4.0) * 0.125;
        fStack_1ac = fVar121 + fVar149 * (auVar112._20_4_ + 5.0) * 0.125;
        fStack_1a8 = fVar122 + fVar150 * (auVar112._24_4_ + 6.0) * 0.125;
        fStack_1a4 = fVar123 + auVar112._28_4_ + 7.0;
        auVar63._4_4_ = auVar28._4_4_ * 0.99999976;
        auVar63._0_4_ = auVar28._0_4_ * 0.99999976;
        auVar63._8_4_ = auVar28._8_4_ * 0.99999976;
        auVar63._12_4_ = auVar28._12_4_ * 0.99999976;
        auVar63._16_4_ = auVar28._16_4_ * 0.99999976;
        auVar63._20_4_ = auVar28._20_4_ * 0.99999976;
        auVar63._24_4_ = auVar28._24_4_ * 0.99999976;
        auVar63._28_4_ = 0x3f7ffffc;
        auVar112 = vmaxps_avx(ZEXT1232(auVar75) << 0x20,auVar63);
        auVar64._4_4_ = auVar112._4_4_ * auVar112._4_4_;
        auVar64._0_4_ = auVar112._0_4_ * auVar112._0_4_;
        auVar64._8_4_ = auVar112._8_4_ * auVar112._8_4_;
        auVar64._12_4_ = auVar112._12_4_ * auVar112._12_4_;
        auVar64._16_4_ = auVar112._16_4_ * auVar112._16_4_;
        auVar64._20_4_ = auVar112._20_4_ * auVar112._20_4_;
        auVar64._24_4_ = auVar112._24_4_ * auVar112._24_4_;
        auVar64._28_4_ = auVar112._28_4_;
        auVar28 = vsubps_avx(auVar31,auVar64);
        auVar65._4_4_ = auVar28._4_4_ * fVar151 * 4.0;
        auVar65._0_4_ = auVar28._0_4_ * fVar398 * 4.0;
        auVar65._8_4_ = auVar28._8_4_ * fVar400 * 4.0;
        auVar65._12_4_ = auVar28._12_4_ * fVar403 * 4.0;
        auVar65._16_4_ = auVar28._16_4_ * fVar405 * 4.0;
        auVar65._20_4_ = auVar28._20_4_ * fVar407 * 4.0;
        auVar65._24_4_ = auVar28._24_4_ * fVar342 * 4.0;
        auVar65._28_4_ = auVar112._28_4_;
        auVar24 = vsubps_avx(auVar47,auVar65);
        auVar112 = vcmpps_avx(auVar24,ZEXT832(0) << 0x20,5);
        if ((((((((auVar112 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar112 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar112 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar112 >> 0x7f,0) == '\0') &&
              (auVar112 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar112 >> 0xbf,0) == '\0') &&
            (auVar112 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar112[0x1f]) {
          auVar139 = SUB6432(ZEXT864(0),0) << 0x20;
          _local_820 = ZEXT832(0) << 0x20;
          _local_640 = ZEXT832(0) << 0x20;
          auVar200 = ZEXT1228(ZEXT812(0)) << 0x20;
          auVar218 = ZEXT828(0) << 0x20;
          auVar259._8_4_ = 0x7f800000;
          auVar259._0_8_ = 0x7f8000007f800000;
          auVar259._12_4_ = 0x7f800000;
          auVar259._16_4_ = 0x7f800000;
          auVar259._20_4_ = 0x7f800000;
          auVar259._24_4_ = 0x7f800000;
          auVar259._28_4_ = 0x7f800000;
          auVar285._8_4_ = 0xff800000;
          auVar285._0_8_ = 0xff800000ff800000;
          auVar285._12_4_ = 0xff800000;
          auVar285._16_4_ = 0xff800000;
          auVar285._20_4_ = 0xff800000;
          auVar285._24_4_ = 0xff800000;
          auVar285._28_4_ = 0xff800000;
          _local_800 = _local_820;
        }
        else {
          auVar139 = vsqrtps_avx(auVar24);
          auVar203._0_4_ = fVar398 + fVar398;
          auVar203._4_4_ = fVar151 + fVar151;
          auVar203._8_4_ = fVar400 + fVar400;
          auVar203._12_4_ = fVar403 + fVar403;
          auVar203._16_4_ = fVar405 + fVar405;
          auVar203._20_4_ = fVar407 + fVar407;
          auVar203._24_4_ = fVar342 + fVar342;
          auVar203._28_4_ = fVar126 + fVar126;
          auVar26 = vrcpps_avx(auVar203);
          fVar126 = auVar26._0_4_;
          fVar225 = auVar26._4_4_;
          auVar66._4_4_ = auVar203._4_4_ * fVar225;
          auVar66._0_4_ = auVar203._0_4_ * fVar126;
          fVar227 = auVar26._8_4_;
          auVar66._8_4_ = auVar203._8_4_ * fVar227;
          fVar232 = auVar26._12_4_;
          auVar66._12_4_ = auVar203._12_4_ * fVar232;
          fVar226 = auVar26._16_4_;
          auVar66._16_4_ = auVar203._16_4_ * fVar226;
          fVar228 = auVar26._20_4_;
          auVar66._20_4_ = auVar203._20_4_ * fVar228;
          fVar229 = auVar26._24_4_;
          auVar66._24_4_ = auVar203._24_4_ * fVar229;
          auVar66._28_4_ = auVar203._28_4_;
          auVar395 = vsubps_avx(auVar375,auVar66);
          fVar126 = fVar126 + fVar126 * auVar395._0_4_;
          fVar225 = fVar225 + fVar225 * auVar395._4_4_;
          fVar227 = fVar227 + fVar227 * auVar395._8_4_;
          fVar232 = fVar232 + fVar232 * auVar395._12_4_;
          fVar226 = fVar226 + fVar226 * auVar395._16_4_;
          fVar228 = fVar228 + fVar228 * auVar395._20_4_;
          fVar229 = fVar229 + fVar229 * auVar395._24_4_;
          fVar242 = auVar26._28_4_ + auVar395._28_4_;
          auVar220._0_8_ = auVar413._0_8_ ^ 0x8000000080000000;
          auVar220._8_4_ = -auVar413._8_4_;
          auVar220._12_4_ = -auVar413._12_4_;
          auVar220._16_4_ = -auVar413._16_4_;
          auVar220._20_4_ = -auVar413._20_4_;
          auVar220._24_4_ = -auVar413._24_4_;
          auVar220._28_4_ = -auVar413._28_4_;
          auVar26 = vsubps_avx(auVar220,auVar139);
          fVar377 = auVar26._0_4_ * fVar126;
          fVar399 = auVar26._4_4_ * fVar225;
          auVar67._4_4_ = fVar399;
          auVar67._0_4_ = fVar377;
          fVar401 = auVar26._8_4_ * fVar227;
          auVar67._8_4_ = fVar401;
          fVar404 = auVar26._12_4_ * fVar232;
          auVar67._12_4_ = fVar404;
          fVar406 = auVar26._16_4_ * fVar226;
          auVar67._16_4_ = fVar406;
          fVar389 = auVar26._20_4_ * fVar228;
          auVar67._20_4_ = fVar389;
          fVar409 = auVar26._24_4_ * fVar229;
          auVar67._24_4_ = fVar409;
          auVar67._28_4_ = fVar402;
          auVar139 = vsubps_avx(auVar139,auVar413);
          fVar126 = auVar139._0_4_ * fVar126;
          fVar225 = auVar139._4_4_ * fVar225;
          auVar68._4_4_ = fVar225;
          auVar68._0_4_ = fVar126;
          fVar227 = auVar139._8_4_ * fVar227;
          auVar68._8_4_ = fVar227;
          fVar232 = auVar139._12_4_ * fVar232;
          auVar68._12_4_ = fVar232;
          fVar226 = auVar139._16_4_ * fVar226;
          auVar68._16_4_ = fVar226;
          fVar228 = auVar139._20_4_ * fVar228;
          auVar68._20_4_ = fVar228;
          fVar229 = auVar139._24_4_ * fVar229;
          auVar68._24_4_ = fVar229;
          auVar68._28_4_ = auVar25._28_4_;
          fVar244 = fVar408 * (fVar377 * local_500 + fVar353);
          fVar246 = fVar264 * (fVar399 * fStack_4fc + fVar359);
          fVar327 = fVar266 * (fVar401 * fStack_4f8 + fVar361);
          fVar330 = fVar268 * (fVar404 * fStack_4f4 + fVar363);
          fVar332 = fVar269 * (fVar406 * fStack_4f0 + fVar365);
          fVar340 = fVar271 * (fVar389 * fStack_4ec + fVar367);
          fVar371 = fVar273 * (fVar409 * fStack_4e8 + fVar369);
          local_600._28_4_ = auVar30._28_4_;
          auVar140._0_4_ = local_8c0 + fVar224 * fVar244;
          auVar140._4_4_ = fStack_8bc + fVar245 * fVar246;
          auVar140._8_4_ = fStack_8b8 + fVar233 * fVar327;
          auVar140._12_4_ = fStack_8b4 + fVar249 * fVar330;
          auVar140._16_4_ = fStack_8b0 + fVar338 * fVar332;
          auVar140._20_4_ = fStack_8ac + fVar351 * fVar340;
          auVar140._24_4_ = fStack_8a8 + fVar387 * fVar371;
          auVar140._28_4_ = fStack_8a4 + auVar139._28_4_ + fVar370;
          auVar69._4_4_ = fVar124 * fVar399;
          auVar69._0_4_ = fVar124 * fVar377;
          auVar69._8_4_ = fVar124 * fVar401;
          auVar69._12_4_ = fVar124 * fVar404;
          auVar69._16_4_ = fVar124 * fVar406;
          auVar69._20_4_ = fVar124 * fVar389;
          auVar69._24_4_ = fVar124 * fVar409;
          auVar69._28_4_ = fVar242;
          auVar139 = vsubps_avx(auVar69,auVar140);
          auVar204._0_4_ = fVar328 + fVar208 * fVar244;
          auVar204._4_4_ = fVar331 + fVar241 * fVar246;
          auVar204._8_4_ = fVar333 + fVar230 * fVar327;
          auVar204._12_4_ = fVar335 + fVar247 * fVar330;
          auVar204._16_4_ = fVar337 + fVar334 * fVar332;
          auVar204._20_4_ = fVar339 + fVar379 * fVar340;
          auVar204._24_4_ = fVar341 + fVar383 * fVar371;
          auVar204._28_4_ = fVar343 + fVar242;
          auVar260._0_4_ = (float)local_7a0._0_4_ * fVar377;
          auVar260._4_4_ = (float)local_7a0._4_4_ * fVar399;
          auVar260._8_4_ = fStack_798 * fVar401;
          auVar260._12_4_ = fStack_794 * fVar404;
          auVar260._16_4_ = fStack_790 * fVar406;
          auVar260._20_4_ = fStack_78c * fVar389;
          auVar260._24_4_ = fStack_788 * fVar409;
          auVar260._28_4_ = 0;
          _local_940 = vsubps_avx(auVar260,auVar204);
          auVar221._0_4_ = fVar154 + fVar210 * fVar244;
          auVar221._4_4_ = fVar178 + fVar243 * fVar246;
          auVar221._8_4_ = fVar179 + fVar231 * fVar327;
          auVar221._12_4_ = fVar180 + fVar248 * fVar330;
          auVar221._16_4_ = fVar181 + fVar336 * fVar332;
          auVar221._20_4_ = fVar182 + fVar381 * fVar340;
          auVar221._24_4_ = fVar183 + fVar385 * fVar371;
          auVar221._28_4_ = fVar184 + auVar26._28_4_;
          auVar70._4_4_ = (float)local_920._4_4_ * fVar399;
          auVar70._0_4_ = (float)local_920._0_4_ * fVar377;
          auVar70._8_4_ = fStack_918 * fVar401;
          auVar70._12_4_ = fStack_914 * fVar404;
          auVar70._16_4_ = fStack_910 * fVar406;
          auVar70._20_4_ = fStack_90c * fVar389;
          auVar70._24_4_ = fStack_908 * fVar409;
          auVar70._28_4_ = 0;
          auVar26 = vsubps_avx(auVar70,auVar221);
          auVar218 = auVar26._0_28_;
          fVar408 = fVar408 * (fVar126 * local_500 + fVar353);
          fVar264 = fVar264 * (fVar225 * fStack_4fc + fVar359);
          fVar266 = fVar266 * (fVar227 * fStack_4f8 + fVar361);
          fVar268 = fVar268 * (fVar232 * fStack_4f4 + fVar363);
          fVar269 = fVar269 * (fVar226 * fStack_4f0 + fVar365);
          fVar271 = fVar271 * (fVar228 * fStack_4ec + fVar367);
          fVar273 = fVar273 * (fVar229 * fStack_4e8 + fVar369);
          auVar286._0_4_ = local_8c0 + fVar224 * fVar408;
          auVar286._4_4_ = fStack_8bc + fVar245 * fVar264;
          auVar286._8_4_ = fStack_8b8 + fVar233 * fVar266;
          auVar286._12_4_ = fStack_8b4 + fVar249 * fVar268;
          auVar286._16_4_ = fStack_8b0 + fVar338 * fVar269;
          auVar286._20_4_ = fStack_8ac + fVar351 * fVar271;
          auVar286._24_4_ = fStack_8a8 + fVar387 * fVar273;
          auVar286._28_4_ = fStack_8a4 + (float)local_600._28_4_;
          auVar71._4_4_ = fVar124 * fVar225;
          auVar71._0_4_ = fVar124 * fVar126;
          auVar71._8_4_ = fVar124 * fVar227;
          auVar71._12_4_ = fVar124 * fVar232;
          auVar71._16_4_ = fVar124 * fVar226;
          auVar71._20_4_ = fVar124 * fVar228;
          auVar71._24_4_ = fVar124 * fVar229;
          auVar71._28_4_ = fStack_8a4;
          _local_800 = vsubps_avx(auVar71,auVar286);
          auVar287._0_4_ = fVar328 + fVar208 * fVar408;
          auVar287._4_4_ = fVar331 + fVar241 * fVar264;
          auVar287._8_4_ = fVar333 + fVar230 * fVar266;
          auVar287._12_4_ = fVar335 + fVar247 * fVar268;
          auVar287._16_4_ = fVar337 + fVar334 * fVar269;
          auVar287._20_4_ = fVar339 + fVar379 * fVar271;
          auVar287._24_4_ = fVar341 + fVar383 * fVar273;
          auVar287._28_4_ = fVar343 + local_800._28_4_;
          auVar72._4_4_ = (float)local_7a0._4_4_ * fVar225;
          auVar72._0_4_ = (float)local_7a0._0_4_ * fVar126;
          auVar72._8_4_ = fStack_798 * fVar227;
          auVar72._12_4_ = fStack_794 * fVar232;
          auVar72._16_4_ = fStack_790 * fVar226;
          auVar72._20_4_ = fStack_78c * fVar228;
          auVar72._24_4_ = fStack_788 * fVar229;
          auVar72._28_4_ = fStack_8a4;
          _local_820 = vsubps_avx(auVar72,auVar287);
          auVar261._0_4_ = fVar154 + fVar210 * fVar408;
          auVar261._4_4_ = fVar178 + fVar243 * fVar264;
          auVar261._8_4_ = fVar179 + fVar231 * fVar266;
          auVar261._12_4_ = fVar180 + fVar248 * fVar268;
          auVar261._16_4_ = fVar181 + fVar336 * fVar269;
          auVar261._20_4_ = fVar182 + fVar381 * fVar271;
          auVar261._24_4_ = fVar183 + fVar385 * fVar273;
          auVar261._28_4_ = fVar184 + fVar370 + 0.0;
          auVar73._4_4_ = (float)local_920._4_4_ * fVar225;
          auVar73._0_4_ = (float)local_920._0_4_ * fVar126;
          auVar73._8_4_ = fStack_918 * fVar227;
          auVar73._12_4_ = fStack_914 * fVar232;
          auVar73._16_4_ = fStack_910 * fVar226;
          auVar73._20_4_ = fStack_90c * fVar228;
          auVar73._24_4_ = fStack_908 * fVar229;
          auVar73._28_4_ = local_820._28_4_;
          auVar419 = ZEXT1232(ZEXT812(0)) << 0x20;
          _local_640 = vsubps_avx(auVar73,auVar261);
          auVar420 = ZEXT1232(ZEXT812(0)) << 0x20;
          auVar26 = vcmpps_avx(auVar24,auVar420,5);
          auVar262._8_4_ = 0x7f800000;
          auVar262._0_8_ = 0x7f8000007f800000;
          auVar262._12_4_ = 0x7f800000;
          auVar262._16_4_ = 0x7f800000;
          auVar262._20_4_ = 0x7f800000;
          auVar262._24_4_ = 0x7f800000;
          auVar262._28_4_ = 0x7f800000;
          auVar259 = vblendvps_avx(auVar262,auVar67,auVar26);
          auVar349._8_4_ = 0x7fffffff;
          auVar349._0_8_ = 0x7fffffff7fffffff;
          auVar349._12_4_ = 0x7fffffff;
          auVar349._16_4_ = 0x7fffffff;
          auVar349._20_4_ = 0x7fffffff;
          auVar349._24_4_ = 0x7fffffff;
          auVar349._28_4_ = 0x7fffffff;
          auVar24 = vandps_avx(auVar349,auVar46);
          auVar24 = vmaxps_avx(local_4c0,auVar24);
          auVar74._4_4_ = auVar24._4_4_ * 1.9073486e-06;
          auVar74._0_4_ = auVar24._0_4_ * 1.9073486e-06;
          auVar74._8_4_ = auVar24._8_4_ * 1.9073486e-06;
          auVar74._12_4_ = auVar24._12_4_ * 1.9073486e-06;
          auVar74._16_4_ = auVar24._16_4_ * 1.9073486e-06;
          auVar74._20_4_ = auVar24._20_4_ * 1.9073486e-06;
          auVar74._24_4_ = auVar24._24_4_ * 1.9073486e-06;
          auVar74._28_4_ = auVar24._28_4_;
          auVar24 = vandps_avx(auVar349,local_4e0);
          auVar24 = vcmpps_avx(auVar24,auVar74,1);
          auVar288._8_4_ = 0xff800000;
          auVar288._0_8_ = 0xff800000ff800000;
          auVar288._12_4_ = 0xff800000;
          auVar288._16_4_ = 0xff800000;
          auVar288._20_4_ = 0xff800000;
          auVar288._24_4_ = 0xff800000;
          auVar288._28_4_ = 0xff800000;
          auVar285 = vblendvps_avx(auVar288,auVar68,auVar26);
          auVar395 = auVar26 & auVar24;
          if ((((((((auVar395 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar395 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar395 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar395 >> 0x7f,0) != '\0') ||
                (auVar395 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar395 >> 0xbf,0) != '\0') ||
              (auVar395 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar395[0x1f] < '\0') {
            auVar112 = vandps_avx(auVar24,auVar26);
            auVar236 = vpackssdw_avx(auVar112._0_16_,auVar112._16_16_);
            auVar24 = vcmpps_avx(auVar28,auVar420,2);
            auVar397._8_4_ = 0xff800000;
            auVar397._0_8_ = 0xff800000ff800000;
            auVar397._12_4_ = 0xff800000;
            auVar397._16_4_ = 0xff800000;
            auVar397._20_4_ = 0xff800000;
            auVar397._24_4_ = 0xff800000;
            auVar397._28_4_ = 0xff800000;
            auVar416._8_4_ = 0x7f800000;
            auVar416._0_8_ = 0x7f8000007f800000;
            auVar416._12_4_ = 0x7f800000;
            auVar416._16_4_ = 0x7f800000;
            auVar416._20_4_ = 0x7f800000;
            auVar416._24_4_ = 0x7f800000;
            auVar416._28_4_ = 0x7f800000;
            auVar28 = vblendvps_avx(auVar416,auVar397,auVar24);
            auVar166 = vpmovsxwd_avx(auVar236);
            auVar236 = vpunpckhwd_avx(auVar236,auVar236);
            auVar350._16_16_ = auVar236;
            auVar350._0_16_ = auVar166;
            auVar259 = vblendvps_avx(auVar259,auVar28,auVar350);
            auVar28 = vblendvps_avx(auVar397,auVar416,auVar24);
            auVar285 = vblendvps_avx(auVar285,auVar28,auVar350);
            auVar28 = vcmpps_avx(auVar419,auVar419,0xf);
            auVar120._0_4_ = auVar28._0_4_ ^ auVar112._0_4_;
            auVar120._4_4_ = auVar28._4_4_ ^ auVar112._4_4_;
            auVar120._8_4_ = auVar28._8_4_ ^ auVar112._8_4_;
            auVar120._12_4_ = auVar28._12_4_ ^ auVar112._12_4_;
            auVar120._16_4_ = auVar28._16_4_ ^ auVar112._16_4_;
            auVar120._20_4_ = auVar28._20_4_ ^ auVar112._20_4_;
            auVar120._24_4_ = auVar28._24_4_ ^ auVar112._24_4_;
            auVar120._28_4_ = auVar28._28_4_ ^ auVar112._28_4_;
            auVar112 = vorps_avx(auVar24,auVar120);
            auVar112 = vandps_avx(auVar26,auVar112);
          }
          auVar200 = local_940._0_28_;
        }
        auVar376 = ZEXT3264(auVar25);
        _local_380 = auVar25;
        local_360 = vminps_avx(local_320,auVar259);
        _local_7e0 = vmaxps_avx(auVar25,auVar285);
        local_340 = _local_7e0;
        auVar28 = vcmpps_avx(auVar25,local_360,2);
        local_580 = vandps_avx(auVar111,auVar28);
        auVar28 = vcmpps_avx(_local_7e0,local_320,2);
        local_5c0 = vandps_avx(auVar111,auVar28);
        auVar111 = vorps_avx(local_5c0,local_580);
        auVar312 = ZEXT1664(local_530);
        if ((((((((auVar111 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar111 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar111 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar111 >> 0x7f,0) != '\0') ||
              (auVar111 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar111 >> 0xbf,0) != '\0') ||
            (auVar111 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar111[0x1f] < '\0') {
          local_660 = vcmpps_avx(auVar419,auVar419,0xf);
          local_5e0._0_4_ = auVar112._0_4_ ^ local_660._0_4_;
          local_5e0._4_4_ = auVar112._4_4_ ^ local_660._4_4_;
          local_5e0._8_4_ = auVar112._8_4_ ^ local_660._8_4_;
          local_5e0._12_4_ = auVar112._12_4_ ^ local_660._12_4_;
          local_5e0._16_4_ = auVar112._16_4_ ^ local_660._16_4_;
          local_5e0._20_4_ = auVar112._20_4_ ^ local_660._20_4_;
          local_5e0._24_4_ = auVar112._24_4_ ^ local_660._24_4_;
          local_5e0._28_4_ = (uint)auVar112._28_4_ ^ local_660._28_4_;
          auVar116._0_4_ =
               auVar139._0_4_ * fVar124 +
               (float)local_7a0._0_4_ * auVar200._0_4_ + (float)local_920._0_4_ * auVar218._0_4_;
          auVar116._4_4_ =
               auVar139._4_4_ * fVar124 +
               (float)local_7a0._4_4_ * auVar200._4_4_ + (float)local_920._4_4_ * auVar218._4_4_;
          auVar116._8_4_ =
               auVar139._8_4_ * fVar124 + fStack_798 * auVar200._8_4_ + fStack_918 * auVar218._8_4_;
          auVar116._12_4_ =
               auVar139._12_4_ * fVar124 +
               fStack_794 * auVar200._12_4_ + fStack_914 * auVar218._12_4_;
          auVar116._16_4_ =
               auVar139._16_4_ * fVar124 +
               fStack_790 * auVar200._16_4_ + fStack_910 * auVar218._16_4_;
          auVar116._20_4_ =
               auVar139._20_4_ * fVar124 +
               fStack_78c * auVar200._20_4_ + fStack_90c * auVar218._20_4_;
          auVar116._24_4_ =
               auVar139._24_4_ * fVar124 +
               fStack_788 * auVar200._24_4_ + fStack_908 * auVar218._24_4_;
          auVar116._28_4_ = auVar112._28_4_ + auVar139._28_4_ + fStack_784;
          auVar142._8_4_ = 0x7fffffff;
          auVar142._0_8_ = 0x7fffffff7fffffff;
          auVar142._12_4_ = 0x7fffffff;
          auVar142._16_4_ = 0x7fffffff;
          auVar142._20_4_ = 0x7fffffff;
          auVar142._24_4_ = 0x7fffffff;
          auVar142._28_4_ = 0x7fffffff;
          auVar111 = vandps_avx(auVar116,auVar142);
          auVar143._8_4_ = 0x3e99999a;
          auVar143._0_8_ = 0x3e99999a3e99999a;
          auVar143._12_4_ = 0x3e99999a;
          auVar143._16_4_ = 0x3e99999a;
          auVar143._20_4_ = 0x3e99999a;
          auVar143._24_4_ = 0x3e99999a;
          auVar143._28_4_ = 0x3e99999a;
          auVar111 = vcmpps_avx(auVar111,auVar143,1);
          auVar111 = vorps_avx(auVar111,local_5e0);
          auVar144._8_4_ = 3;
          auVar144._0_8_ = 0x300000003;
          auVar144._12_4_ = 3;
          auVar144._16_4_ = 3;
          auVar144._20_4_ = 3;
          auVar144._24_4_ = 3;
          auVar144._28_4_ = 3;
          auVar172._8_4_ = 2;
          auVar172._0_8_ = 0x200000002;
          auVar172._12_4_ = 2;
          auVar172._16_4_ = 2;
          auVar172._20_4_ = 2;
          auVar172._24_4_ = 2;
          auVar172._28_4_ = 2;
          auVar111 = vblendvps_avx(auVar172,auVar144,auVar111);
          local_600 = ZEXT432(local_bc8);
          local_620 = vpshufd_avx(ZEXT416(local_bc8),0);
          fVar126 = 0.0;
          auVar236 = vpcmpgtd_avx(auVar111._16_16_,local_620);
          auStack_610 = auVar413._16_16_;
          auVar166 = vpcmpgtd_avx(auVar111._0_16_,local_620);
          auVar145._16_16_ = auVar236;
          auVar145._0_16_ = auVar166;
          local_5a0 = vblendps_avx(ZEXT1632(auVar166),auVar145,0xf0);
          local_560 = vandnps_avx(local_5a0,local_580);
          auVar312 = ZEXT3264(local_560);
          auVar111 = local_580 & ~local_5a0;
          local_a80 = auVar22._0_4_;
          fStack_a7c = auVar22._4_4_;
          fStack_a78 = auVar22._8_4_;
          fStack_a74 = auVar22._12_4_;
          local_a60 = auVar20._0_4_;
          fStack_a5c = auVar20._4_4_;
          fStack_a58 = auVar20._8_4_;
          fStack_a54 = auVar20._12_4_;
          local_a70 = auVar21._0_4_;
          fStack_a6c = auVar21._4_4_;
          fStack_a68 = auVar21._8_4_;
          fStack_a64 = auVar21._12_4_;
          local_a50 = auVar19._0_4_;
          fStack_a4c = auVar19._4_4_;
          fStack_a48 = auVar19._8_4_;
          fStack_a44 = auVar19._12_4_;
          if ((((((((auVar111 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar111 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar111 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar111 >> 0x7f,0) == '\0') &&
                (auVar111 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar111 >> 0xbf,0) == '\0') &&
              (auVar111 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar111[0x1f]) {
            auVar236 = vshufps_avx(local_530,local_530,0);
            auVar117._16_16_ = auVar236;
            auVar117._0_16_ = auVar236;
            fVar208 = (float)local_920._0_4_;
            fVar210 = (float)local_920._4_4_;
            fVar225 = fStack_918;
            fVar227 = fStack_914;
            fVar232 = fStack_910;
            fVar241 = fStack_90c;
            fVar243 = fStack_908;
          }
          else {
            local_9c0 = auVar25._0_4_;
            fStack_9bc = auVar25._4_4_;
            fStack_9b8 = auVar25._8_4_;
            fStack_9b4 = auVar25._12_4_;
            fStack_9b0 = auVar25._16_4_;
            fStack_9ac = auVar25._20_4_;
            fStack_9a8 = auVar25._24_4_;
            local_7c0._4_4_ = fVar185 + fStack_9bc;
            local_7c0._0_4_ = fVar152 + local_9c0;
            fStack_7b8 = fVar206 + fStack_9b8;
            fStack_7b4 = fVar207 + fStack_9b4;
            fStack_7b0 = fVar152 + fStack_9b0;
            fStack_7ac = fVar185 + fStack_9ac;
            fStack_7a8 = fVar206 + fStack_9a8;
            fStack_7a4 = fVar207 + auVar25._28_4_;
            do {
              auVar118._8_4_ = 0x7f800000;
              auVar118._0_8_ = 0x7f8000007f800000;
              auVar118._12_4_ = 0x7f800000;
              auVar118._16_4_ = 0x7f800000;
              auVar118._20_4_ = 0x7f800000;
              auVar118._24_4_ = 0x7f800000;
              auVar118._28_4_ = 0x7f800000;
              auVar111 = auVar312._0_32_;
              auVar112 = vblendvps_avx(auVar118,auVar25,auVar111);
              auVar28 = vshufps_avx(auVar112,auVar112,0xb1);
              auVar28 = vminps_avx(auVar112,auVar28);
              auVar24 = vshufpd_avx(auVar28,auVar28,5);
              auVar28 = vminps_avx(auVar28,auVar24);
              auVar24 = vperm2f128_avx(auVar28,auVar28,1);
              auVar28 = vminps_avx(auVar28,auVar24);
              auVar112 = vcmpps_avx(auVar112,auVar28,0);
              auVar28 = auVar111 & auVar112;
              if ((((((((auVar28 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar28 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar28 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar28 >> 0x7f,0) != '\0') ||
                    (auVar28 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar28 >> 0xbf,0) != '\0') ||
                  (auVar28 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar28[0x1f] < '\0') {
                auVar111 = vandps_avx(auVar112,auVar111);
              }
              uVar85 = vmovmskps_avx(auVar111);
              uVar88 = 0;
              if (uVar85 != 0) {
                for (; (uVar85 >> uVar88 & 1) == 0; uVar88 = uVar88 + 1) {
                }
              }
              uVar87 = (ulong)uVar88;
              *(undefined4 *)(local_560 + uVar87 * 4) = 0;
              fVar126 = local_1a0[uVar87];
              uVar88 = *(uint *)(local_380 + uVar87 * 4);
              fVar208 = auVar130._0_4_;
              if ((float)local_8a0._0_4_ < 0.0) {
                fVar208 = sqrtf((float)local_8a0._0_4_);
              }
              auVar166 = vminps_avx(auVar19,auVar21);
              auVar236 = vmaxps_avx(auVar19,auVar21);
              auVar23 = vminps_avx(auVar20,auVar22);
              auVar195 = vminps_avx(auVar166,auVar23);
              auVar166 = vmaxps_avx(auVar20,auVar22);
              auVar23 = vmaxps_avx(auVar236,auVar166);
              auVar189._8_4_ = 0x7fffffff;
              auVar189._0_8_ = 0x7fffffff7fffffff;
              auVar189._12_4_ = 0x7fffffff;
              auVar236 = vandps_avx(auVar195,auVar189);
              auVar166 = vandps_avx(auVar23,auVar189);
              auVar236 = vmaxps_avx(auVar236,auVar166);
              auVar166 = vmovshdup_avx(auVar236);
              auVar166 = vmaxss_avx(auVar166,auVar236);
              auVar236 = vshufpd_avx(auVar236,auVar236,1);
              auVar236 = vmaxss_avx(auVar236,auVar166);
              local_8c0 = auVar236._0_4_ * 1.9073486e-06;
              local_740._0_4_ = fVar208 * 1.9073486e-06;
              local_780._0_16_ = vshufps_avx(auVar23,auVar23,0xff);
              auVar236 = vinsertps_avx(ZEXT416(uVar88),ZEXT416((uint)fVar126),0x10);
              bVar94 = true;
              uVar87 = 0;
              do {
                auVar166 = vshufps_avx(auVar236,auVar236,0);
                auVar101._0_4_ = auVar166._0_4_ * (float)local_890._0_4_ + 0.0;
                auVar101._4_4_ = auVar166._4_4_ * (float)local_890._4_4_ + 0.0;
                auVar101._8_4_ = auVar166._8_4_ * fStack_888 + 0.0;
                auVar101._12_4_ = auVar166._12_4_ * fStack_884 + 0.0;
                auVar23 = vmovshdup_avx(auVar236);
                fVar225 = auVar23._0_4_;
                fVar210 = 1.0 - fVar225;
                fVar208 = fVar225 * 3.0;
                fVar126 = fVar208 + -5.0;
                auVar166 = ZEXT416((uint)(fVar225 * fVar225 * -fVar210 * 0.5));
                auVar166 = vshufps_avx(auVar166,auVar166,0);
                auVar195 = ZEXT416((uint)((fVar210 * fVar210 * (fVar210 * 3.0 + -5.0) + 2.0) * 0.5))
                ;
                auVar195 = vshufps_avx(auVar195,auVar195,0);
                auVar97 = ZEXT416((uint)((fVar225 * fVar225 * fVar126 + 2.0) * 0.5));
                auVar97 = vshufps_avx(auVar97,auVar97,0);
                auVar106 = ZEXT416((uint)(fVar210 * fVar210 * -fVar225 * 0.5));
                auVar106 = vshufps_avx(auVar106,auVar106,0);
                auVar157._0_4_ =
                     auVar106._0_4_ * local_a50 +
                     auVar97._0_4_ * local_a70 +
                     auVar195._0_4_ * local_a60 + auVar166._0_4_ * local_a80;
                auVar157._4_4_ =
                     auVar106._4_4_ * fStack_a4c +
                     auVar97._4_4_ * fStack_a6c +
                     auVar195._4_4_ * fStack_a5c + auVar166._4_4_ * fStack_a7c;
                auVar157._8_4_ =
                     auVar106._8_4_ * fStack_a48 +
                     auVar97._8_4_ * fStack_a68 +
                     auVar195._8_4_ * fStack_a58 + auVar166._8_4_ * fStack_a78;
                auVar157._12_4_ =
                     auVar106._12_4_ * fStack_a44 +
                     auVar97._12_4_ * fStack_a64 +
                     auVar195._12_4_ * fStack_a54 + auVar166._12_4_ * fStack_a74;
                _local_940 = auVar157;
                auVar195 = vsubps_avx(auVar101,auVar157);
                auVar166 = vdpps_avx(auVar195,auVar195,0x7f);
                fVar224 = auVar166._0_4_;
                if (fVar224 < 0.0) {
                  local_8e0._0_4_ = fVar208;
                  local_900._0_4_ = fVar126;
                  local_760._0_4_ = fVar210 * -2.0;
                  fVar227 = sqrtf(fVar224);
                  fVar126 = (float)local_900._0_4_;
                  fVar232 = (float)local_760._0_4_;
                  fVar241 = (float)local_8e0._0_4_;
                }
                else {
                  auVar97 = vsqrtss_avx(auVar166,auVar166);
                  fVar227 = auVar97._0_4_;
                  fVar232 = fVar210 * -2.0;
                  fVar241 = fVar208;
                }
                auVar376 = ZEXT1664(auVar23);
                auVar97 = ZEXT416((uint)((fVar225 * fVar225 + fVar225 * fVar232) * 0.5));
                auVar97 = vshufps_avx(auVar97,auVar97,0);
                auVar106 = ZEXT416((uint)(((fVar210 + fVar210) * (fVar241 + 2.0) +
                                          fVar210 * fVar210 * -3.0) * 0.5));
                auVar106 = vshufps_avx(auVar106,auVar106,0);
                auVar98 = ZEXT416((uint)((fVar126 * (fVar225 + fVar225) + fVar225 * fVar241) * 0.5))
                ;
                auVar98 = vshufps_avx(auVar98,auVar98,0);
                auVar134 = ZEXT416((uint)((fVar225 * (fVar210 + fVar210) - fVar210 * fVar210) * 0.5)
                                  );
                auVar134 = vshufps_avx(auVar134,auVar134,0);
                auVar345._0_4_ =
                     local_a50 * auVar134._0_4_ +
                     local_a70 * auVar98._0_4_ +
                     local_a80 * auVar97._0_4_ + local_a60 * auVar106._0_4_;
                auVar345._4_4_ =
                     fStack_a4c * auVar134._4_4_ +
                     fStack_a6c * auVar98._4_4_ +
                     fStack_a7c * auVar97._4_4_ + fStack_a5c * auVar106._4_4_;
                auVar345._8_4_ =
                     fStack_a48 * auVar134._8_4_ +
                     fStack_a68 * auVar98._8_4_ +
                     fStack_a78 * auVar97._8_4_ + fStack_a58 * auVar106._8_4_;
                auVar345._12_4_ =
                     fStack_a44 * auVar134._12_4_ +
                     fStack_a64 * auVar98._12_4_ +
                     fStack_a74 * auVar97._12_4_ + fStack_a54 * auVar106._12_4_;
                auVar134 = vpermilps_avx(ZEXT416((uint)(fVar208 + -1.0)),0);
                auVar127 = vpermilps_avx(ZEXT416((uint)(fVar225 * -9.0 + 4.0)),0);
                auVar97 = ZEXT416((uint)(fVar225 * 9.0 + -5.0));
                auVar97 = vshufps_avx(auVar97,auVar97,0);
                auVar106 = ZEXT416((uint)(fVar225 * -3.0 + 2.0));
                auVar98 = vshufps_avx(auVar106,auVar106,0);
                auVar106 = vdpps_avx(auVar345,auVar345,0x7f);
                auVar131._0_4_ =
                     local_a50 * auVar98._0_4_ +
                     local_a70 * auVar97._0_4_ +
                     local_a60 * auVar127._0_4_ + local_a80 * auVar134._0_4_;
                auVar131._4_4_ =
                     fStack_a4c * auVar98._4_4_ +
                     fStack_a6c * auVar97._4_4_ +
                     fStack_a5c * auVar127._4_4_ + fStack_a7c * auVar134._4_4_;
                auVar131._8_4_ =
                     fStack_a48 * auVar98._8_4_ +
                     fStack_a68 * auVar97._8_4_ +
                     fStack_a58 * auVar127._8_4_ + fStack_a78 * auVar134._8_4_;
                auVar131._12_4_ =
                     fStack_a44 * auVar98._12_4_ +
                     fStack_a64 * auVar97._12_4_ +
                     fStack_a54 * auVar127._12_4_ + fStack_a74 * auVar134._12_4_;
                auVar97 = vblendps_avx(auVar106,_DAT_01f7aa10,0xe);
                auVar98 = vrsqrtss_avx(auVar97,auVar97);
                fVar208 = auVar98._0_4_;
                fVar126 = auVar106._0_4_;
                auVar98 = vdpps_avx(auVar345,auVar131,0x7f);
                auVar134 = vshufps_avx(auVar106,auVar106,0);
                auVar132._0_4_ = auVar131._0_4_ * auVar134._0_4_;
                auVar132._4_4_ = auVar131._4_4_ * auVar134._4_4_;
                auVar132._8_4_ = auVar131._8_4_ * auVar134._8_4_;
                auVar132._12_4_ = auVar131._12_4_ * auVar134._12_4_;
                auVar98 = vshufps_avx(auVar98,auVar98,0);
                auVar214._0_4_ = auVar345._0_4_ * auVar98._0_4_;
                auVar214._4_4_ = auVar345._4_4_ * auVar98._4_4_;
                auVar214._8_4_ = auVar345._8_4_ * auVar98._8_4_;
                auVar214._12_4_ = auVar345._12_4_ * auVar98._12_4_;
                auVar127 = vsubps_avx(auVar132,auVar214);
                auVar98 = vrcpss_avx(auVar97,auVar97);
                auVar97 = vmaxss_avx(ZEXT416((uint)local_8c0),
                                     ZEXT416((uint)(auVar236._0_4_ * (float)local_740._0_4_)));
                auVar98 = ZEXT416((uint)(auVar98._0_4_ * (2.0 - fVar126 * auVar98._0_4_)));
                auVar98 = vshufps_avx(auVar98,auVar98,0);
                uVar76 = CONCAT44(auVar345._4_4_,auVar345._0_4_);
                auVar281._0_8_ = uVar76 ^ 0x8000000080000000;
                auVar281._8_4_ = -auVar345._8_4_;
                auVar281._12_4_ = -auVar345._12_4_;
                auVar134 = ZEXT416((uint)(fVar208 * 1.5 +
                                         fVar126 * -0.5 * fVar208 * fVar208 * fVar208));
                auVar134 = vshufps_avx(auVar134,auVar134,0);
                auVar190._0_4_ = auVar134._0_4_ * auVar127._0_4_ * auVar98._0_4_;
                auVar190._4_4_ = auVar134._4_4_ * auVar127._4_4_ * auVar98._4_4_;
                auVar190._8_4_ = auVar134._8_4_ * auVar127._8_4_ * auVar98._8_4_;
                auVar190._12_4_ = auVar134._12_4_ * auVar127._12_4_ * auVar98._12_4_;
                auVar255._0_4_ = auVar345._0_4_ * auVar134._0_4_;
                auVar255._4_4_ = auVar345._4_4_ * auVar134._4_4_;
                auVar255._8_4_ = auVar345._8_4_ * auVar134._8_4_;
                auVar255._12_4_ = auVar345._12_4_ * auVar134._12_4_;
                if (fVar126 < 0.0) {
                  auVar376 = ZEXT1664(auVar23);
                  fVar126 = sqrtf(fVar126);
                }
                else {
                  auVar23 = vsqrtss_avx(auVar106,auVar106);
                  fVar126 = auVar23._0_4_;
                }
                auVar23 = vdpps_avx(auVar195,auVar255,0x7f);
                fVar126 = (local_8c0 / fVar126) * (fVar227 + 1.0) +
                          auVar97._0_4_ + fVar227 * local_8c0;
                auVar106 = vdpps_avx(auVar281,auVar255,0x7f);
                auVar98 = vdpps_avx(auVar195,auVar190,0x7f);
                auVar134 = vdpps_avx(_local_890,auVar255,0x7f);
                auVar127 = vdpps_avx(auVar195,auVar281,0x7f);
                fVar208 = auVar106._0_4_ + auVar98._0_4_;
                fVar225 = auVar23._0_4_;
                auVar102._0_4_ = fVar225 * fVar225;
                auVar102._4_4_ = auVar23._4_4_ * auVar23._4_4_;
                auVar102._8_4_ = auVar23._8_4_ * auVar23._8_4_;
                auVar102._12_4_ = auVar23._12_4_ * auVar23._12_4_;
                auVar128 = vsubps_avx(auVar166,auVar102);
                auVar106 = vdpps_avx(auVar195,_local_890,0x7f);
                fVar227 = auVar127._0_4_ - fVar225 * fVar208;
                auVar98 = vrsqrtss_avx(auVar128,auVar128);
                fVar232 = auVar128._0_4_;
                fVar210 = auVar98._0_4_;
                fVar210 = fVar210 * 1.5 + fVar232 * -0.5 * fVar210 * fVar210 * fVar210;
                if (fVar232 < 0.0) {
                  local_8e0._0_4_ = fVar227;
                  local_900._0_4_ = fVar210;
                  auVar376 = ZEXT1664(auVar376._0_16_);
                  fVar232 = sqrtf(fVar232);
                  fVar210 = (float)local_900._0_4_;
                  fVar227 = (float)local_8e0._0_4_;
                }
                else {
                  auVar98 = vsqrtss_avx(auVar128,auVar128);
                  fVar232 = auVar98._0_4_;
                }
                auVar127 = vpermilps_avx(_local_940,0xff);
                auVar128 = vshufps_avx(auVar345,auVar345,0xff);
                fVar227 = fVar227 * fVar210 - auVar128._0_4_;
                fVar210 = (auVar106._0_4_ - fVar225 * auVar134._0_4_) * fVar210;
                auVar215._0_8_ = auVar134._0_8_ ^ 0x8000000080000000;
                auVar215._8_4_ = auVar134._8_4_ ^ 0x80000000;
                auVar215._12_4_ = auVar134._12_4_ ^ 0x80000000;
                auVar237._0_4_ = -fVar227;
                auVar237._4_4_ = 0x80000000;
                auVar237._8_4_ = 0x80000000;
                auVar237._12_4_ = 0x80000000;
                auVar106 = vinsertps_avx(auVar237,ZEXT416((uint)fVar210),0x1c);
                auVar134 = vmovsldup_avx(ZEXT416((uint)(fVar208 * fVar210 - auVar134._0_4_ * fVar227
                                                       )));
                auVar106 = vdivps_avx(auVar106,auVar134);
                auVar98 = vinsertps_avx(ZEXT416((uint)fVar208),auVar215,0x10);
                auVar98 = vdivps_avx(auVar98,auVar134);
                auVar134 = vmovsldup_avx(auVar23);
                auVar137 = ZEXT416((uint)(fVar232 - auVar127._0_4_));
                auVar127 = vmovsldup_avx(auVar137);
                auVar158._0_4_ = auVar134._0_4_ * auVar106._0_4_ + auVar127._0_4_ * auVar98._0_4_;
                auVar158._4_4_ = auVar134._4_4_ * auVar106._4_4_ + auVar127._4_4_ * auVar98._4_4_;
                auVar158._8_4_ = auVar134._8_4_ * auVar106._8_4_ + auVar127._8_4_ * auVar98._8_4_;
                auVar158._12_4_ =
                     auVar134._12_4_ * auVar106._12_4_ + auVar127._12_4_ * auVar98._12_4_;
                auVar236 = vsubps_avx(auVar236,auVar158);
                auVar159._8_4_ = 0x7fffffff;
                auVar159._0_8_ = 0x7fffffff7fffffff;
                auVar159._12_4_ = 0x7fffffff;
                auVar23 = vandps_avx(auVar23,auVar159);
                fVar208 = (float)local_920._0_4_;
                fVar210 = (float)local_920._4_4_;
                fVar225 = fStack_918;
                fVar227 = fStack_914;
                fVar232 = fStack_910;
                fVar241 = fStack_90c;
                fVar243 = fStack_908;
                if (auVar23._0_4_ < fVar126) {
                  auVar191._8_4_ = 0x7fffffff;
                  auVar191._0_8_ = 0x7fffffff7fffffff;
                  auVar191._12_4_ = 0x7fffffff;
                  auVar23 = vandps_avx(auVar137,auVar191);
                  if (auVar23._0_4_ <
                      (float)local_780._0_4_ * 1.9073486e-06 + auVar97._0_4_ + fVar126) {
                    fVar126 = auVar236._0_4_ + (float)local_850._0_4_;
                    if (fVar126 < fVar148) {
                      bVar95 = 0;
                    }
                    else {
                      fVar245 = *(float *)(ray + k * 4 + 0x80);
                      if (fVar245 < fVar126) {
                        bVar95 = 0;
                      }
                      else {
                        auVar23 = vmovshdup_avx(auVar236);
                        bVar95 = 0;
                        if ((0.0 <= auVar23._0_4_) && (auVar23._0_4_ <= 1.0)) {
                          auVar166 = vrsqrtss_avx(auVar166,auVar166);
                          fVar226 = auVar166._0_4_;
                          pGVar11 = (context->scene->geometries).items[uVar84].ptr;
                          if ((pGVar11->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                            bVar95 = 0;
                          }
                          else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                                  (bVar95 = 1, pGVar11->occlusionFilterN != (RTCFilterFunctionN)0x0)
                                  ) {
                            auVar166 = ZEXT416((uint)(fVar226 * 1.5 +
                                                     fVar224 * -0.5 * fVar226 * fVar226 * fVar226));
                            auVar166 = vshufps_avx(auVar166,auVar166,0);
                            local_a00 = auVar195._0_4_;
                            fStack_9fc = auVar195._4_4_;
                            fStack_9f8 = auVar195._8_4_;
                            fStack_9f4 = auVar195._12_4_;
                            auVar160._0_4_ = auVar166._0_4_ * local_a00;
                            auVar160._4_4_ = auVar166._4_4_ * fStack_9fc;
                            auVar160._8_4_ = auVar166._8_4_ * fStack_9f8;
                            auVar160._12_4_ = auVar166._12_4_ * fStack_9f4;
                            auVar103._0_4_ = auVar345._0_4_ + auVar128._0_4_ * auVar160._0_4_;
                            auVar103._4_4_ = auVar345._4_4_ + auVar128._4_4_ * auVar160._4_4_;
                            auVar103._8_4_ = auVar345._8_4_ + auVar128._8_4_ * auVar160._8_4_;
                            auVar103._12_4_ = auVar345._12_4_ + auVar128._12_4_ * auVar160._12_4_;
                            auVar166 = vshufps_avx(auVar160,auVar160,0xc9);
                            auVar23 = vshufps_avx(auVar345,auVar345,0xc9);
                            auVar161._0_4_ = auVar23._0_4_ * auVar160._0_4_;
                            auVar161._4_4_ = auVar23._4_4_ * auVar160._4_4_;
                            auVar161._8_4_ = auVar23._8_4_ * auVar160._8_4_;
                            auVar161._12_4_ = auVar23._12_4_ * auVar160._12_4_;
                            auVar192._0_4_ = auVar345._0_4_ * auVar166._0_4_;
                            auVar192._4_4_ = auVar345._4_4_ * auVar166._4_4_;
                            auVar192._8_4_ = auVar345._8_4_ * auVar166._8_4_;
                            auVar192._12_4_ = auVar345._12_4_ * auVar166._12_4_;
                            auVar195 = vsubps_avx(auVar192,auVar161);
                            auVar166 = vshufps_avx(auVar195,auVar195,0xc9);
                            auVar23 = vshufps_avx(auVar103,auVar103,0xc9);
                            auVar193._0_4_ = auVar23._0_4_ * auVar166._0_4_;
                            auVar193._4_4_ = auVar23._4_4_ * auVar166._4_4_;
                            auVar193._8_4_ = auVar23._8_4_ * auVar166._8_4_;
                            auVar193._12_4_ = auVar23._12_4_ * auVar166._12_4_;
                            auVar166 = vshufps_avx(auVar195,auVar195,0xd2);
                            auVar104._0_4_ = auVar103._0_4_ * auVar166._0_4_;
                            auVar104._4_4_ = auVar103._4_4_ * auVar166._4_4_;
                            auVar104._8_4_ = auVar103._8_4_ * auVar166._8_4_;
                            auVar104._12_4_ = auVar103._12_4_ * auVar166._12_4_;
                            auVar166 = vsubps_avx(auVar193,auVar104);
                            local_6d0 = vshufps_avx(auVar236,auVar236,0x55);
                            local_700 = (RTCHitN  [16])vshufps_avx(auVar166,auVar166,0x55);
                            auStack_6f0 = vshufps_avx(auVar166,auVar166,0xaa);
                            local_6e0 = vshufps_avx(auVar166,auVar166,0);
                            local_6c0 = ZEXT816(0) << 0x20;
                            local_6b0 = local_720._0_8_;
                            uStack_6a8 = local_720._8_8_;
                            local_6a0 = local_710._0_8_;
                            uStack_698 = local_710._8_8_;
                            uVar88 = context->user->instID[0];
                            _local_690 = CONCAT44(uVar88,uVar88);
                            _uStack_688 = CONCAT44(uVar88,uVar88);
                            uVar88 = context->user->instPrimID[0];
                            _uStack_680 = CONCAT44(uVar88,uVar88);
                            _uStack_678 = CONCAT44(uVar88,uVar88);
                            *(float *)(ray + k * 4 + 0x80) = fVar126;
                            auVar236 = *(undefined1 (*) [16])
                                        (mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
                            local_880._0_16_ = auVar236;
                            local_970.valid = (int *)local_880;
                            local_970.geometryUserPtr = pGVar11->userPtr;
                            local_970.context = context->user;
                            local_970.hit = local_700;
                            local_970.N = 4;
                            local_970.ray = (RTCRayN *)ray;
                            if (pGVar11->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                              auVar376 = ZEXT1664(auVar376._0_16_);
                              (*pGVar11->occlusionFilterN)(&local_970);
                              auVar236 = local_880._0_16_;
                              fVar208 = (float)local_920._0_4_;
                              fVar210 = (float)local_920._4_4_;
                              fVar225 = fStack_918;
                              fVar227 = fStack_914;
                              fVar232 = fStack_910;
                              fVar241 = fStack_90c;
                              fVar243 = fStack_908;
                            }
                            if (auVar236 == (undefined1  [16])0x0) {
                              auVar236 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                              auVar236 = auVar236 ^ _DAT_01f7ae20;
                            }
                            else {
                              p_Var15 = context->args->filter;
                              if ((p_Var15 != (RTCFilterFunctionN)0x0) &&
                                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER
                                   ) != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                  (((pGVar11->field_8).field_0x2 & 0x40) != 0)))) {
                                auVar376 = ZEXT1664(auVar376._0_16_);
                                (*p_Var15)(&local_970);
                                auVar236 = local_880._0_16_;
                                fVar208 = (float)local_920._0_4_;
                                fVar210 = (float)local_920._4_4_;
                                fVar225 = fStack_918;
                                fVar227 = fStack_914;
                                fVar232 = fStack_910;
                                fVar241 = fStack_90c;
                                fVar243 = fStack_908;
                              }
                              auVar166 = vpcmpeqd_avx(auVar236,_DAT_01f7aa10);
                              auVar236 = auVar166 ^ _DAT_01f7ae20;
                              auVar162._8_4_ = 0xff800000;
                              auVar162._0_8_ = 0xff800000ff800000;
                              auVar162._12_4_ = 0xff800000;
                              auVar166 = vblendvps_avx(auVar162,*(undefined1 (*) [16])
                                                                 (local_970.ray + 0x80),auVar166);
                              *(undefined1 (*) [16])(local_970.ray + 0x80) = auVar166;
                            }
                            auVar133._8_8_ = 0x100000001;
                            auVar133._0_8_ = 0x100000001;
                            bVar95 = (auVar133 & auVar236) != (undefined1  [16])0x0;
                            if (!(bool)bVar95) {
                              *(float *)(ray + k * 4 + 0x80) = fVar245;
                            }
                          }
                        }
                      }
                    }
                    goto LAB_00f9aac2;
                  }
                }
                bVar94 = uVar87 < 4;
                uVar87 = uVar87 + 1;
              } while (uVar87 != 5);
              bVar94 = false;
              bVar95 = 5;
LAB_00f9aac2:
              bVar93 = (bool)(bVar93 | bVar94 & bVar95);
              uVar8 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar117._4_4_ = uVar8;
              auVar117._0_4_ = uVar8;
              auVar117._8_4_ = uVar8;
              auVar117._12_4_ = uVar8;
              auVar117._16_4_ = uVar8;
              auVar117._20_4_ = uVar8;
              auVar117._24_4_ = uVar8;
              auVar117._28_4_ = uVar8;
              auVar112 = vcmpps_avx(_local_7c0,auVar117,2);
              fVar126 = auVar112._28_4_;
              auVar111 = vandps_avx(auVar112,local_560);
              auVar312 = ZEXT3264(auVar111);
              auVar112 = local_560 & auVar112;
              local_560 = auVar111;
            } while ((((((((auVar112 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar112 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar112 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar112 >> 0x7f,0) != '\0') ||
                       (auVar112 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar112 >> 0xbf,0) != '\0') ||
                     (auVar112 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar112[0x1f] < '\0');
            auVar312 = ZEXT3264(local_340);
          }
          auVar28 = local_340;
          auVar146._0_4_ =
               fVar124 * (float)local_800._0_4_ +
               (float)local_7a0._0_4_ * (float)local_820._0_4_ + fVar208 * (float)local_640._0_4_;
          auVar146._4_4_ =
               fVar124 * (float)local_800._4_4_ +
               (float)local_7a0._4_4_ * (float)local_820._4_4_ + fVar210 * (float)local_640._4_4_;
          auVar146._8_4_ = fVar124 * fStack_7f8 + fStack_798 * fStack_818 + fVar225 * fStack_638;
          auVar146._12_4_ = fVar124 * fStack_7f4 + fStack_794 * fStack_814 + fVar227 * fStack_634;
          auVar146._16_4_ = fVar124 * fStack_7f0 + fStack_790 * fStack_810 + fVar232 * fStack_630;
          auVar146._20_4_ = fVar124 * fStack_7ec + fStack_78c * fStack_80c + fVar241 * fStack_62c;
          auVar146._24_4_ = fVar124 * fStack_7e8 + fStack_788 * fStack_808 + fVar243 * fStack_628;
          auVar146._28_4_ = fVar126 + fVar126 + auVar312._28_4_;
          auVar173._8_4_ = 0x7fffffff;
          auVar173._0_8_ = 0x7fffffff7fffffff;
          auVar173._12_4_ = 0x7fffffff;
          auVar173._16_4_ = 0x7fffffff;
          auVar173._20_4_ = 0x7fffffff;
          auVar173._24_4_ = 0x7fffffff;
          auVar173._28_4_ = 0x7fffffff;
          auVar111 = vandps_avx(auVar146,auVar173);
          auVar174._8_4_ = 0x3e99999a;
          auVar174._0_8_ = 0x3e99999a3e99999a;
          auVar174._12_4_ = 0x3e99999a;
          auVar174._16_4_ = 0x3e99999a;
          auVar174._20_4_ = 0x3e99999a;
          auVar174._24_4_ = 0x3e99999a;
          auVar174._28_4_ = 0x3e99999a;
          auVar111 = vcmpps_avx(auVar111,auVar174,1);
          auVar112 = vorps_avx(auVar111,local_5e0);
          auVar175._0_4_ = (float)local_7e0._0_4_ + fVar152;
          auVar175._4_4_ = (float)local_7e0._4_4_ + fVar185;
          auVar175._8_4_ = fStack_7d8 + fVar206;
          auVar175._12_4_ = fStack_7d4 + fVar207;
          auVar175._16_4_ = fStack_7d0 + fVar152;
          auVar175._20_4_ = fStack_7cc + fVar185;
          auVar175._24_4_ = fStack_7c8 + fVar206;
          auVar175._28_4_ = fStack_7c4 + fVar207;
          auVar111 = vcmpps_avx(auVar175,auVar117,2);
          _local_820 = vandps_avx(auVar111,local_5c0);
          auVar176._8_4_ = 3;
          auVar176._0_8_ = 0x300000003;
          auVar176._12_4_ = 3;
          auVar176._16_4_ = 3;
          auVar176._20_4_ = 3;
          auVar176._24_4_ = 3;
          auVar176._28_4_ = 3;
          auVar205._8_4_ = 2;
          auVar205._0_8_ = 0x200000002;
          auVar205._12_4_ = 2;
          auVar205._16_4_ = 2;
          auVar205._20_4_ = 2;
          auVar205._24_4_ = 2;
          auVar205._28_4_ = 2;
          auVar111 = vblendvps_avx(auVar205,auVar176,auVar112);
          auVar236 = vpcmpgtd_avx(auVar111._16_16_,local_620);
          auVar166 = vpshufd_avx(local_600._0_16_,0);
          auVar166 = vpcmpgtd_avx(auVar111._0_16_,auVar166);
          auVar177._16_16_ = auVar236;
          auVar177._0_16_ = auVar117._0_16_;
          _local_800 = vblendps_avx(ZEXT1632(auVar166),auVar177,0xf0);
          auVar111 = vandnps_avx(_local_800,_local_820);
          auVar112 = _local_820 & ~_local_800;
          local_880 = auVar111;
          if ((((((((auVar112 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar112 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar112 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar112 >> 0x7f,0) != '\0') ||
                (auVar112 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar112 >> 0xbf,0) != '\0') ||
              (auVar112 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar112[0x1f] < '\0') {
            local_7c0._4_4_ = fVar185 + local_340._4_4_;
            local_7c0._0_4_ = fVar152 + local_340._0_4_;
            fStack_7b8 = fVar206 + local_340._8_4_;
            fStack_7b4 = fVar207 + local_340._12_4_;
            fStack_7b0 = fVar152 + local_340._16_4_;
            fStack_7ac = fVar185 + local_340._20_4_;
            fStack_7a8 = fVar206 + local_340._24_4_;
            fStack_7a4 = fVar207 + local_340._28_4_;
            do {
              auVar119._8_4_ = 0x7f800000;
              auVar119._0_8_ = 0x7f8000007f800000;
              auVar119._12_4_ = 0x7f800000;
              auVar119._16_4_ = 0x7f800000;
              auVar119._20_4_ = 0x7f800000;
              auVar119._24_4_ = 0x7f800000;
              auVar119._28_4_ = 0x7f800000;
              auVar112 = vblendvps_avx(auVar119,auVar28,auVar111);
              auVar24 = vshufps_avx(auVar112,auVar112,0xb1);
              auVar24 = vminps_avx(auVar112,auVar24);
              auVar25 = vshufpd_avx(auVar24,auVar24,5);
              auVar24 = vminps_avx(auVar24,auVar25);
              auVar25 = vperm2f128_avx(auVar24,auVar24,1);
              auVar24 = vminps_avx(auVar24,auVar25);
              auVar24 = vcmpps_avx(auVar112,auVar24,0);
              auVar25 = auVar111 & auVar24;
              auVar112 = auVar111;
              if ((((((((auVar25 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar25 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar25 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar25 >> 0x7f,0) != '\0') ||
                    (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar25 >> 0xbf,0) != '\0') ||
                  (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar25[0x1f] < '\0') {
                auVar112 = vandps_avx(auVar24,auVar111);
              }
              uVar85 = vmovmskps_avx(auVar112);
              uVar88 = 0;
              if (uVar85 != 0) {
                for (; (uVar85 >> uVar88 & 1) == 0; uVar88 = uVar88 + 1) {
                }
              }
              uVar87 = (ulong)uVar88;
              local_880 = auVar111;
              *(undefined4 *)(local_880 + uVar87 * 4) = 0;
              fVar126 = local_1c0[uVar87];
              uVar88 = *(uint *)(local_320 + uVar87 * 4);
              fVar208 = auVar18._0_4_;
              if ((float)local_8a0._0_4_ < 0.0) {
                fVar208 = sqrtf((float)local_8a0._0_4_);
              }
              auVar166 = vminps_avx(auVar19,auVar21);
              auVar236 = vmaxps_avx(auVar19,auVar21);
              auVar23 = vminps_avx(auVar20,auVar22);
              auVar195 = vminps_avx(auVar166,auVar23);
              auVar166 = vmaxps_avx(auVar20,auVar22);
              auVar23 = vmaxps_avx(auVar236,auVar166);
              auVar194._8_4_ = 0x7fffffff;
              auVar194._0_8_ = 0x7fffffff7fffffff;
              auVar194._12_4_ = 0x7fffffff;
              auVar236 = vandps_avx(auVar195,auVar194);
              auVar166 = vandps_avx(auVar23,auVar194);
              auVar236 = vmaxps_avx(auVar236,auVar166);
              auVar166 = vmovshdup_avx(auVar236);
              auVar166 = vmaxss_avx(auVar166,auVar236);
              auVar236 = vshufpd_avx(auVar236,auVar236,1);
              auVar236 = vmaxss_avx(auVar236,auVar166);
              local_8c0 = auVar236._0_4_ * 1.9073486e-06;
              local_740._0_4_ = fVar208 * 1.9073486e-06;
              local_780._0_16_ = vshufps_avx(auVar23,auVar23,0xff);
              auVar236 = vinsertps_avx(ZEXT416(uVar88),ZEXT416((uint)fVar126),0x10);
              bVar94 = true;
              uVar87 = 0;
              do {
                auVar166 = vshufps_avx(auVar236,auVar236,0);
                auVar105._0_4_ = auVar166._0_4_ * (float)local_890._0_4_ + 0.0;
                auVar105._4_4_ = auVar166._4_4_ * (float)local_890._4_4_ + 0.0;
                auVar105._8_4_ = auVar166._8_4_ * fStack_888 + 0.0;
                auVar105._12_4_ = auVar166._12_4_ * fStack_884 + 0.0;
                auVar23 = vmovshdup_avx(auVar236);
                fVar225 = auVar23._0_4_;
                fVar210 = 1.0 - fVar225;
                fVar208 = fVar225 * 3.0;
                fVar126 = fVar208 + -5.0;
                auVar166 = ZEXT416((uint)(fVar225 * fVar225 * -fVar210 * 0.5));
                auVar166 = vshufps_avx(auVar166,auVar166,0);
                auVar195 = ZEXT416((uint)((fVar210 * fVar210 * (fVar210 * 3.0 + -5.0) + 2.0) * 0.5))
                ;
                auVar195 = vshufps_avx(auVar195,auVar195,0);
                auVar97 = ZEXT416((uint)((fVar225 * fVar225 * fVar126 + 2.0) * 0.5));
                auVar97 = vshufps_avx(auVar97,auVar97,0);
                auVar106 = ZEXT416((uint)(fVar210 * fVar210 * -fVar225 * 0.5));
                auVar106 = vshufps_avx(auVar106,auVar106,0);
                auVar163._0_4_ =
                     auVar106._0_4_ * local_a50 +
                     auVar97._0_4_ * local_a70 +
                     auVar195._0_4_ * local_a60 + auVar166._0_4_ * local_a80;
                auVar163._4_4_ =
                     auVar106._4_4_ * fStack_a4c +
                     auVar97._4_4_ * fStack_a6c +
                     auVar195._4_4_ * fStack_a5c + auVar166._4_4_ * fStack_a7c;
                auVar163._8_4_ =
                     auVar106._8_4_ * fStack_a48 +
                     auVar97._8_4_ * fStack_a68 +
                     auVar195._8_4_ * fStack_a58 + auVar166._8_4_ * fStack_a78;
                auVar163._12_4_ =
                     auVar106._12_4_ * fStack_a44 +
                     auVar97._12_4_ * fStack_a64 +
                     auVar195._12_4_ * fStack_a54 + auVar166._12_4_ * fStack_a74;
                _local_940 = auVar163;
                auVar195 = vsubps_avx(auVar105,auVar163);
                auVar166 = vdpps_avx(auVar195,auVar195,0x7f);
                fVar224 = auVar166._0_4_;
                if (fVar224 < 0.0) {
                  local_8e0._0_4_ = fVar208;
                  local_900._0_4_ = fVar126;
                  local_760._0_4_ = fVar210 * -2.0;
                  fVar227 = sqrtf(fVar224);
                  fVar126 = (float)local_900._0_4_;
                  fVar232 = (float)local_760._0_4_;
                  fVar241 = (float)local_8e0._0_4_;
                }
                else {
                  auVar97 = vsqrtss_avx(auVar166,auVar166);
                  fVar227 = auVar97._0_4_;
                  fVar232 = fVar210 * -2.0;
                  fVar241 = fVar208;
                }
                auVar376 = ZEXT1664(auVar23);
                auVar97 = ZEXT416((uint)((fVar225 * fVar225 + fVar225 * fVar232) * 0.5));
                auVar97 = vshufps_avx(auVar97,auVar97,0);
                auVar106 = ZEXT416((uint)(((fVar210 + fVar210) * (fVar241 + 2.0) +
                                          fVar210 * fVar210 * -3.0) * 0.5));
                auVar106 = vshufps_avx(auVar106,auVar106,0);
                auVar98 = ZEXT416((uint)((fVar126 * (fVar225 + fVar225) + fVar225 * fVar241) * 0.5))
                ;
                auVar98 = vshufps_avx(auVar98,auVar98,0);
                auVar134 = ZEXT416((uint)((fVar225 * (fVar210 + fVar210) - fVar210 * fVar210) * 0.5)
                                  );
                auVar134 = vshufps_avx(auVar134,auVar134,0);
                auVar346._0_4_ =
                     local_a50 * auVar134._0_4_ +
                     local_a70 * auVar98._0_4_ +
                     local_a80 * auVar97._0_4_ + local_a60 * auVar106._0_4_;
                auVar346._4_4_ =
                     fStack_a4c * auVar134._4_4_ +
                     fStack_a6c * auVar98._4_4_ +
                     fStack_a7c * auVar97._4_4_ + fStack_a5c * auVar106._4_4_;
                auVar346._8_4_ =
                     fStack_a48 * auVar134._8_4_ +
                     fStack_a68 * auVar98._8_4_ +
                     fStack_a78 * auVar97._8_4_ + fStack_a58 * auVar106._8_4_;
                auVar346._12_4_ =
                     fStack_a44 * auVar134._12_4_ +
                     fStack_a64 * auVar98._12_4_ +
                     fStack_a74 * auVar97._12_4_ + fStack_a54 * auVar106._12_4_;
                auVar134 = vpermilps_avx(ZEXT416((uint)(fVar208 + -1.0)),0);
                auVar127 = vpermilps_avx(ZEXT416((uint)(fVar225 * -9.0 + 4.0)),0);
                auVar97 = ZEXT416((uint)(fVar225 * 9.0 + -5.0));
                auVar97 = vshufps_avx(auVar97,auVar97,0);
                auVar106 = ZEXT416((uint)(fVar225 * -3.0 + 2.0));
                auVar98 = vshufps_avx(auVar106,auVar106,0);
                auVar106 = vdpps_avx(auVar346,auVar346,0x7f);
                auVar135._0_4_ =
                     local_a50 * auVar98._0_4_ +
                     local_a70 * auVar97._0_4_ +
                     local_a60 * auVar127._0_4_ + local_a80 * auVar134._0_4_;
                auVar135._4_4_ =
                     fStack_a4c * auVar98._4_4_ +
                     fStack_a6c * auVar97._4_4_ +
                     fStack_a5c * auVar127._4_4_ + fStack_a7c * auVar134._4_4_;
                auVar135._8_4_ =
                     fStack_a48 * auVar98._8_4_ +
                     fStack_a68 * auVar97._8_4_ +
                     fStack_a58 * auVar127._8_4_ + fStack_a78 * auVar134._8_4_;
                auVar135._12_4_ =
                     fStack_a44 * auVar98._12_4_ +
                     fStack_a64 * auVar97._12_4_ +
                     fStack_a54 * auVar127._12_4_ + fStack_a74 * auVar134._12_4_;
                auVar97 = vblendps_avx(auVar106,_DAT_01f7aa10,0xe);
                auVar98 = vrsqrtss_avx(auVar97,auVar97);
                fVar208 = auVar98._0_4_;
                fVar126 = auVar106._0_4_;
                auVar98 = vdpps_avx(auVar346,auVar135,0x7f);
                auVar134 = vshufps_avx(auVar106,auVar106,0);
                auVar136._0_4_ = auVar135._0_4_ * auVar134._0_4_;
                auVar136._4_4_ = auVar135._4_4_ * auVar134._4_4_;
                auVar136._8_4_ = auVar135._8_4_ * auVar134._8_4_;
                auVar136._12_4_ = auVar135._12_4_ * auVar134._12_4_;
                auVar98 = vshufps_avx(auVar98,auVar98,0);
                auVar216._0_4_ = auVar346._0_4_ * auVar98._0_4_;
                auVar216._4_4_ = auVar346._4_4_ * auVar98._4_4_;
                auVar216._8_4_ = auVar346._8_4_ * auVar98._8_4_;
                auVar216._12_4_ = auVar346._12_4_ * auVar98._12_4_;
                auVar127 = vsubps_avx(auVar136,auVar216);
                auVar98 = vrcpss_avx(auVar97,auVar97);
                auVar97 = vmaxss_avx(ZEXT416((uint)local_8c0),
                                     ZEXT416((uint)(auVar236._0_4_ * (float)local_740._0_4_)));
                auVar98 = ZEXT416((uint)(auVar98._0_4_ * (2.0 - fVar126 * auVar98._0_4_)));
                auVar98 = vshufps_avx(auVar98,auVar98,0);
                uVar76 = CONCAT44(auVar346._4_4_,auVar346._0_4_);
                auVar282._0_8_ = uVar76 ^ 0x8000000080000000;
                auVar282._8_4_ = -auVar346._8_4_;
                auVar282._12_4_ = -auVar346._12_4_;
                auVar134 = ZEXT416((uint)(fVar208 * 1.5 +
                                         fVar126 * -0.5 * fVar208 * fVar208 * fVar208));
                auVar134 = vshufps_avx(auVar134,auVar134,0);
                auVar196._0_4_ = auVar134._0_4_ * auVar127._0_4_ * auVar98._0_4_;
                auVar196._4_4_ = auVar134._4_4_ * auVar127._4_4_ * auVar98._4_4_;
                auVar196._8_4_ = auVar134._8_4_ * auVar127._8_4_ * auVar98._8_4_;
                auVar196._12_4_ = auVar134._12_4_ * auVar127._12_4_ * auVar98._12_4_;
                auVar256._0_4_ = auVar346._0_4_ * auVar134._0_4_;
                auVar256._4_4_ = auVar346._4_4_ * auVar134._4_4_;
                auVar256._8_4_ = auVar346._8_4_ * auVar134._8_4_;
                auVar256._12_4_ = auVar346._12_4_ * auVar134._12_4_;
                if (fVar126 < 0.0) {
                  auVar376 = ZEXT1664(auVar23);
                  fVar126 = sqrtf(fVar126);
                }
                else {
                  auVar23 = vsqrtss_avx(auVar106,auVar106);
                  fVar126 = auVar23._0_4_;
                }
                auVar23 = vdpps_avx(auVar195,auVar256,0x7f);
                fVar126 = (local_8c0 / fVar126) * (fVar227 + 1.0) +
                          auVar97._0_4_ + fVar227 * local_8c0;
                auVar106 = vdpps_avx(auVar282,auVar256,0x7f);
                auVar98 = vdpps_avx(auVar195,auVar196,0x7f);
                auVar134 = vdpps_avx(_local_890,auVar256,0x7f);
                auVar127 = vdpps_avx(auVar195,auVar282,0x7f);
                fVar208 = auVar106._0_4_ + auVar98._0_4_;
                fVar225 = auVar23._0_4_;
                auVar107._0_4_ = fVar225 * fVar225;
                auVar107._4_4_ = auVar23._4_4_ * auVar23._4_4_;
                auVar107._8_4_ = auVar23._8_4_ * auVar23._8_4_;
                auVar107._12_4_ = auVar23._12_4_ * auVar23._12_4_;
                auVar128 = vsubps_avx(auVar166,auVar107);
                auVar106 = vdpps_avx(auVar195,_local_890,0x7f);
                fVar227 = auVar127._0_4_ - fVar225 * fVar208;
                auVar98 = vrsqrtss_avx(auVar128,auVar128);
                fVar232 = auVar128._0_4_;
                fVar210 = auVar98._0_4_;
                fVar210 = fVar210 * 1.5 + fVar232 * -0.5 * fVar210 * fVar210 * fVar210;
                if (fVar232 < 0.0) {
                  local_8e0._0_4_ = fVar227;
                  local_900._0_4_ = fVar210;
                  auVar376 = ZEXT1664(auVar376._0_16_);
                  fVar232 = sqrtf(fVar232);
                  fVar210 = (float)local_900._0_4_;
                  fVar227 = (float)local_8e0._0_4_;
                }
                else {
                  auVar98 = vsqrtss_avx(auVar128,auVar128);
                  fVar232 = auVar98._0_4_;
                }
                auVar127 = vpermilps_avx(_local_940,0xff);
                auVar128 = vshufps_avx(auVar346,auVar346,0xff);
                fVar227 = fVar227 * fVar210 - auVar128._0_4_;
                fVar210 = (auVar106._0_4_ - fVar225 * auVar134._0_4_) * fVar210;
                auVar217._0_8_ = auVar134._0_8_ ^ 0x8000000080000000;
                auVar217._8_4_ = auVar134._8_4_ ^ 0x80000000;
                auVar217._12_4_ = auVar134._12_4_ ^ 0x80000000;
                auVar238._0_4_ = -fVar227;
                auVar238._4_4_ = 0x80000000;
                auVar238._8_4_ = 0x80000000;
                auVar238._12_4_ = 0x80000000;
                auVar106 = vinsertps_avx(auVar238,ZEXT416((uint)fVar210),0x1c);
                auVar134 = vmovsldup_avx(ZEXT416((uint)(fVar208 * fVar210 - auVar134._0_4_ * fVar227
                                                       )));
                auVar106 = vdivps_avx(auVar106,auVar134);
                auVar98 = vinsertps_avx(ZEXT416((uint)fVar208),auVar217,0x10);
                auVar98 = vdivps_avx(auVar98,auVar134);
                auVar134 = vmovsldup_avx(auVar23);
                auVar137 = ZEXT416((uint)(fVar232 - auVar127._0_4_));
                auVar127 = vmovsldup_avx(auVar137);
                auVar164._0_4_ = auVar134._0_4_ * auVar106._0_4_ + auVar127._0_4_ * auVar98._0_4_;
                auVar164._4_4_ = auVar134._4_4_ * auVar106._4_4_ + auVar127._4_4_ * auVar98._4_4_;
                auVar164._8_4_ = auVar134._8_4_ * auVar106._8_4_ + auVar127._8_4_ * auVar98._8_4_;
                auVar164._12_4_ =
                     auVar134._12_4_ * auVar106._12_4_ + auVar127._12_4_ * auVar98._12_4_;
                auVar236 = vsubps_avx(auVar236,auVar164);
                auVar165._8_4_ = 0x7fffffff;
                auVar165._0_8_ = 0x7fffffff7fffffff;
                auVar165._12_4_ = 0x7fffffff;
                auVar23 = vandps_avx(auVar23,auVar165);
                if (auVar23._0_4_ < fVar126) {
                  auVar197._8_4_ = 0x7fffffff;
                  auVar197._0_8_ = 0x7fffffff7fffffff;
                  auVar197._12_4_ = 0x7fffffff;
                  auVar23 = vandps_avx(auVar137,auVar197);
                  if (auVar23._0_4_ <
                      (float)local_780._0_4_ * 1.9073486e-06 + auVar97._0_4_ + fVar126) {
                    fVar126 = auVar236._0_4_ + (float)local_850._0_4_;
                    if (fVar148 <= fVar126) {
                      fVar208 = *(float *)(ray + k * 4 + 0x80);
                      if (fVar208 < fVar126) {
                        bVar95 = 0;
                        goto LAB_00f9b426;
                      }
                      auVar23 = vmovshdup_avx(auVar236);
                      bVar95 = 0;
                      if ((auVar23._0_4_ < 0.0) || (1.0 < auVar23._0_4_)) goto LAB_00f9b426;
                      auVar166 = vrsqrtss_avx(auVar166,auVar166);
                      fVar210 = auVar166._0_4_;
                      pGVar11 = (context->scene->geometries).items[uVar84].ptr;
                      if ((pGVar11->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                        if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                           (bVar95 = 1, pGVar11->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                          auVar166 = ZEXT416((uint)(fVar210 * 1.5 +
                                                   fVar224 * -0.5 * fVar210 * fVar210 * fVar210));
                          auVar166 = vshufps_avx(auVar166,auVar166,0);
                          local_a00 = auVar195._0_4_;
                          fStack_9fc = auVar195._4_4_;
                          fStack_9f8 = auVar195._8_4_;
                          fStack_9f4 = auVar195._12_4_;
                          auVar167._0_4_ = auVar166._0_4_ * local_a00;
                          auVar167._4_4_ = auVar166._4_4_ * fStack_9fc;
                          auVar167._8_4_ = auVar166._8_4_ * fStack_9f8;
                          auVar167._12_4_ = auVar166._12_4_ * fStack_9f4;
                          auVar108._0_4_ = auVar346._0_4_ + auVar128._0_4_ * auVar167._0_4_;
                          auVar108._4_4_ = auVar346._4_4_ + auVar128._4_4_ * auVar167._4_4_;
                          auVar108._8_4_ = auVar346._8_4_ + auVar128._8_4_ * auVar167._8_4_;
                          auVar108._12_4_ = auVar346._12_4_ + auVar128._12_4_ * auVar167._12_4_;
                          auVar166 = vshufps_avx(auVar167,auVar167,0xc9);
                          auVar23 = vshufps_avx(auVar346,auVar346,0xc9);
                          auVar168._0_4_ = auVar23._0_4_ * auVar167._0_4_;
                          auVar168._4_4_ = auVar23._4_4_ * auVar167._4_4_;
                          auVar168._8_4_ = auVar23._8_4_ * auVar167._8_4_;
                          auVar168._12_4_ = auVar23._12_4_ * auVar167._12_4_;
                          auVar198._0_4_ = auVar346._0_4_ * auVar166._0_4_;
                          auVar198._4_4_ = auVar346._4_4_ * auVar166._4_4_;
                          auVar198._8_4_ = auVar346._8_4_ * auVar166._8_4_;
                          auVar198._12_4_ = auVar346._12_4_ * auVar166._12_4_;
                          auVar195 = vsubps_avx(auVar198,auVar168);
                          auVar166 = vshufps_avx(auVar195,auVar195,0xc9);
                          auVar23 = vshufps_avx(auVar108,auVar108,0xc9);
                          auVar199._0_4_ = auVar23._0_4_ * auVar166._0_4_;
                          auVar199._4_4_ = auVar23._4_4_ * auVar166._4_4_;
                          auVar199._8_4_ = auVar23._8_4_ * auVar166._8_4_;
                          auVar199._12_4_ = auVar23._12_4_ * auVar166._12_4_;
                          auVar166 = vshufps_avx(auVar195,auVar195,0xd2);
                          auVar109._0_4_ = auVar108._0_4_ * auVar166._0_4_;
                          auVar109._4_4_ = auVar108._4_4_ * auVar166._4_4_;
                          auVar109._8_4_ = auVar108._8_4_ * auVar166._8_4_;
                          auVar109._12_4_ = auVar108._12_4_ * auVar166._12_4_;
                          auVar166 = vsubps_avx(auVar199,auVar109);
                          local_6d0 = vshufps_avx(auVar236,auVar236,0x55);
                          local_700 = (RTCHitN  [16])vshufps_avx(auVar166,auVar166,0x55);
                          auStack_6f0 = vshufps_avx(auVar166,auVar166,0xaa);
                          local_6e0 = vshufps_avx(auVar166,auVar166,0);
                          local_6c0 = ZEXT816(0) << 0x20;
                          local_6b0 = local_720._0_8_;
                          uStack_6a8 = local_720._8_8_;
                          local_6a0 = local_710._0_8_;
                          uStack_698 = local_710._8_8_;
                          uVar88 = context->user->instID[0];
                          _local_690 = CONCAT44(uVar88,uVar88);
                          _uStack_688 = CONCAT44(uVar88,uVar88);
                          uVar88 = context->user->instPrimID[0];
                          _uStack_680 = CONCAT44(uVar88,uVar88);
                          _uStack_678 = CONCAT44(uVar88,uVar88);
                          *(float *)(ray + k * 4 + 0x80) = fVar126;
                          local_840 = *(undefined1 (*) [16])
                                       (mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
                          local_970.valid = (int *)local_840;
                          local_970.geometryUserPtr = pGVar11->userPtr;
                          local_970.context = context->user;
                          local_970.hit = local_700;
                          local_970.N = 4;
                          local_970.ray = (RTCRayN *)ray;
                          if (pGVar11->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                            auVar376 = ZEXT1664(auVar376._0_16_);
                            (*pGVar11->occlusionFilterN)(&local_970);
                          }
                          if (local_840 == (undefined1  [16])0x0) {
                            auVar236 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                            auVar236 = auVar236 ^ _DAT_01f7ae20;
                          }
                          else {
                            p_Var15 = context->args->filter;
                            if ((p_Var15 != (RTCFilterFunctionN)0x0) &&
                               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                (((pGVar11->field_8).field_0x2 & 0x40) != 0)))) {
                              auVar376 = ZEXT1664(auVar376._0_16_);
                              (*p_Var15)(&local_970);
                            }
                            auVar166 = vpcmpeqd_avx(local_840,_DAT_01f7aa10);
                            auVar236 = auVar166 ^ _DAT_01f7ae20;
                            auVar169._8_4_ = 0xff800000;
                            auVar169._0_8_ = 0xff800000ff800000;
                            auVar169._12_4_ = 0xff800000;
                            auVar166 = vblendvps_avx(auVar169,*(undefined1 (*) [16])
                                                               (local_970.ray + 0x80),auVar166);
                            *(undefined1 (*) [16])(local_970.ray + 0x80) = auVar166;
                          }
                          auVar138._8_8_ = 0x100000001;
                          auVar138._0_8_ = 0x100000001;
                          bVar95 = (auVar138 & auVar236) != (undefined1  [16])0x0;
                          if (!(bool)bVar95) {
                            *(float *)(ray + k * 4 + 0x80) = fVar208;
                          }
                        }
                        goto LAB_00f9b426;
                      }
                    }
                    bVar95 = 0;
                    goto LAB_00f9b426;
                  }
                }
                bVar94 = uVar87 < 4;
                uVar87 = uVar87 + 1;
              } while (uVar87 != 5);
              bVar94 = false;
              bVar95 = 5;
LAB_00f9b426:
              bVar93 = (bool)(bVar93 | bVar94 & bVar95);
              uVar8 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar117._4_4_ = uVar8;
              auVar117._0_4_ = uVar8;
              auVar117._8_4_ = uVar8;
              auVar117._12_4_ = uVar8;
              auVar117._16_4_ = uVar8;
              auVar117._20_4_ = uVar8;
              auVar117._24_4_ = uVar8;
              auVar117._28_4_ = uVar8;
              auVar112 = vcmpps_avx(_local_7c0,auVar117,2);
              auVar111 = vandps_avx(auVar112,local_880);
              auVar112 = local_880 & auVar112;
              local_880 = auVar111;
            } while ((((((((auVar112 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar112 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar112 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar112 >> 0x7f,0) != '\0') ||
                       (auVar112 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar112 >> 0xbf,0) != '\0') ||
                     (auVar112 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar112[0x1f] < '\0');
          }
          auVar312 = ZEXT3264(local_340);
          auVar111 = vandps_avx(local_5a0,local_580);
          auVar112 = vandps_avx(_local_820,_local_800);
          auVar222._0_4_ = fVar152 + local_380._0_4_;
          auVar222._4_4_ = fVar185 + local_380._4_4_;
          auVar222._8_4_ = fVar206 + local_380._8_4_;
          auVar222._12_4_ = fVar207 + local_380._12_4_;
          auVar222._16_4_ = fVar152 + local_380._16_4_;
          auVar222._20_4_ = fVar185 + local_380._20_4_;
          auVar222._24_4_ = fVar206 + local_380._24_4_;
          auVar222._28_4_ = fVar207 + local_380._28_4_;
          auVar28 = vcmpps_avx(auVar222,auVar117,2);
          auVar111 = vandps_avx(auVar28,auVar111);
          auVar223._0_4_ = local_340._0_4_ + fVar152;
          auVar223._4_4_ = local_340._4_4_ + fVar185;
          auVar223._8_4_ = local_340._8_4_ + fVar206;
          auVar223._12_4_ = local_340._12_4_ + fVar207;
          auVar223._16_4_ = local_340._16_4_ + fVar152;
          auVar223._20_4_ = local_340._20_4_ + fVar185;
          auVar223._24_4_ = local_340._24_4_ + fVar206;
          auVar223._28_4_ = local_340._28_4_ + fVar207;
          auVar28 = vcmpps_avx(auVar223,auVar117,2);
          auVar112 = vandps_avx(auVar28,auVar112);
          auVar112 = vorps_avx(auVar111,auVar112);
          if ((((((((auVar112 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar112 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar112 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar112 >> 0x7f,0) != '\0') ||
                (auVar112 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar112 >> 0xbf,0) != '\0') ||
              (auVar112 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar112[0x1f] < '\0') {
            *(undefined1 (*) [32])(auStack_180 + uVar91 * 0x60) = auVar112;
            auVar111 = vblendvps_avx(local_340,_local_380,auVar111);
            *(undefined1 (*) [32])(auStack_160 + uVar91 * 0x60) = auVar111;
            uVar9 = vmovlps_avx(local_510);
            (&uStack_140)[uVar91 * 0xc] = uVar9;
            aiStack_138[uVar91 * 0x18] = local_bc8 + 1;
            iVar90 = iVar90 + 1;
          }
          goto LAB_00f99d74;
        }
      }
      auVar376 = ZEXT3264(auVar25);
    }
LAB_00f99d74:
    if (iVar90 == 0) break;
    uVar8 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar114._4_4_ = uVar8;
    auVar114._0_4_ = uVar8;
    auVar114._8_4_ = uVar8;
    auVar114._12_4_ = uVar8;
    auVar114._16_4_ = uVar8;
    auVar114._20_4_ = uVar8;
    auVar114._24_4_ = uVar8;
    auVar114._28_4_ = uVar8;
    uVar88 = -iVar90;
    pauVar86 = (undefined1 (*) [32])(auStack_180 + (ulong)(iVar90 - 1) * 0x60);
    while( true ) {
      auVar111 = pauVar86[1];
      auVar141._0_4_ = fVar152 + auVar111._0_4_;
      auVar141._4_4_ = fVar185 + auVar111._4_4_;
      auVar141._8_4_ = fVar206 + auVar111._8_4_;
      auVar141._12_4_ = fVar207 + auVar111._12_4_;
      auVar141._16_4_ = fVar152 + auVar111._16_4_;
      auVar141._20_4_ = fVar185 + auVar111._20_4_;
      auVar141._24_4_ = fVar206 + auVar111._24_4_;
      auVar141._28_4_ = fVar207 + auVar111._28_4_;
      auVar112 = vcmpps_avx(auVar141,auVar114,2);
      _local_700 = vandps_avx(auVar112,*pauVar86);
      auVar112 = *pauVar86 & auVar112;
      if ((((((((auVar112 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar112 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar112 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar112 >> 0x7f,0) != '\0') ||
            (auVar112 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar112 >> 0xbf,0) != '\0') ||
          (auVar112 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar112[0x1f] < '\0') break;
      pauVar86 = pauVar86 + -3;
      uVar88 = uVar88 + 1;
      if (uVar88 == 0) goto LAB_00f9b911;
    }
    auVar115._8_4_ = 0x7f800000;
    auVar115._0_8_ = 0x7f8000007f800000;
    auVar115._12_4_ = 0x7f800000;
    auVar115._16_4_ = 0x7f800000;
    auVar115._20_4_ = 0x7f800000;
    auVar115._24_4_ = 0x7f800000;
    auVar115._28_4_ = 0x7f800000;
    auVar111 = vblendvps_avx(auVar115,auVar111,_local_700);
    auVar112 = vshufps_avx(auVar111,auVar111,0xb1);
    auVar112 = vminps_avx(auVar111,auVar112);
    auVar28 = vshufpd_avx(auVar112,auVar112,5);
    auVar112 = vminps_avx(auVar112,auVar28);
    auVar28 = vperm2f128_avx(auVar112,auVar112,1);
    auVar112 = vminps_avx(auVar112,auVar28);
    auVar112 = vcmpps_avx(auVar111,auVar112,0);
    auVar28 = _local_700 & auVar112;
    auVar111 = _local_700;
    if ((((((((auVar28 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar28 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar28 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar28 >> 0x7f,0) != '\0') ||
          (auVar28 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar28 >> 0xbf,0) != '\0') ||
        (auVar28 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar28[0x1f] < '\0')
    {
      auVar111 = vandps_avx(auVar112,_local_700);
    }
    auVar100._8_8_ = 0;
    auVar100._0_8_ = *(ulong *)pauVar86[2];
    local_bc8 = *(uint *)(pauVar86[2] + 8);
    uVar89 = vmovmskps_avx(auVar111);
    uVar85 = 0;
    if (uVar89 != 0) {
      for (; (uVar89 >> uVar85 & 1) == 0; uVar85 = uVar85 + 1) {
      }
    }
    *(undefined4 *)(local_700 + (ulong)uVar85 * 4) = 0;
    *pauVar86 = _local_700;
    uVar89 = ~uVar88;
    if ((((((((_local_700 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (_local_700 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (_local_700 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(_local_700 >> 0x7f,0) != '\0') ||
          (_local_700 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(_local_700 >> 0xbf,0) != '\0') ||
        (_local_700 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        local_700[0x1f] < '\0') {
      uVar89 = -uVar88;
    }
    uVar91 = (ulong)uVar89;
    auVar236 = vshufps_avx(auVar100,auVar100,0);
    auVar166 = vshufps_avx(auVar100,auVar100,0x55);
    auVar166 = vsubps_avx(auVar166,auVar236);
    local_380._4_4_ = auVar236._4_4_ + auVar166._4_4_ * 0.14285715;
    local_380._0_4_ = auVar236._0_4_ + auVar166._0_4_ * 0.0;
    fStack_378 = auVar236._8_4_ + auVar166._8_4_ * 0.2857143;
    fStack_374 = auVar236._12_4_ + auVar166._12_4_ * 0.42857146;
    fStack_370 = auVar236._0_4_ + auVar166._0_4_ * 0.5714286;
    fStack_36c = auVar236._4_4_ + auVar166._4_4_ * 0.71428573;
    fStack_368 = auVar236._8_4_ + auVar166._8_4_ * 0.8571429;
    fStack_364 = auVar236._12_4_ + auVar166._12_4_;
    local_510._8_8_ = 0;
    local_510._0_8_ = *(ulong *)(local_380 + (ulong)uVar85 * 4);
  } while( true );
LAB_00f9b911:
  if (bVar93 != false) {
    return bVar93;
  }
  uVar8 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar110._4_4_ = uVar8;
  auVar110._0_4_ = uVar8;
  auVar110._8_4_ = uVar8;
  auVar110._12_4_ = uVar8;
  auVar252 = vcmpps_avx(local_520,auVar110,2);
  uVar84 = vmovmskps_avx(auVar252);
  uVar84 = (uint)local_828 - 1 & (uint)local_828 & uVar84;
  if (uVar84 == 0) {
    return false;
  }
  goto LAB_00f98b7b;
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }